

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  bool bVar73;
  long lVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  ulong uVar93;
  uint uVar94;
  ulong uVar95;
  uint uVar96;
  uint uVar97;
  long lVar98;
  ulong uVar99;
  bool bVar100;
  float fVar101;
  float fVar133;
  float fVar135;
  __m128 a;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar102;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar142;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar143;
  float fVar181;
  float fVar182;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar184;
  undefined1 auVar163 [32];
  float fVar183;
  float fVar185;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar226;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [28];
  float fVar224;
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar229;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  float fVar230;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar251;
  float fVar254;
  float fVar257;
  undefined1 auVar240 [28];
  float fVar250;
  float fVar253;
  float fVar256;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar249;
  float fVar252;
  float fVar255;
  undefined1 auVar245 [64];
  float fVar258;
  float fVar259;
  float fVar277;
  float fVar279;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar267 [32];
  float fVar281;
  undefined1 auVar268 [32];
  float fVar278;
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar291 [16];
  float fVar289;
  float fVar290;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar303;
  float fVar305;
  float fVar309;
  float fVar311;
  float fVar313;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar307;
  undefined1 auVar297 [32];
  float fVar304;
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar312;
  float fVar314;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  float fVar315;
  undefined1 auVar316 [16];
  float fVar331;
  float fVar332;
  float fVar336;
  float fVar338;
  float fVar340;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar334;
  undefined1 auVar324 [32];
  float fVar333;
  float fVar335;
  float fVar337;
  float fVar339;
  float fVar341;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [64];
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 auVar345 [16];
  float fVar351;
  float fVar354;
  float fVar360;
  float fVar363;
  float fVar366;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar352;
  float fVar353;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar362;
  float fVar364;
  float fVar365;
  float fVar367;
  float fVar368;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar369;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  float fVar377;
  float fVar378;
  float fVar380;
  float fVar382;
  float fVar384;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  float fVar379;
  float fVar381;
  float fVar383;
  float fVar385;
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar386 [16];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [16];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  float fVar396;
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  float fVar397;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float in_register_0000151c;
  undefined1 auVar398 [32];
  float fVar406;
  undefined1 auVar399 [32];
  float fVar407;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float fVar420;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float in_register_0000159c;
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  float fVar430;
  undefined1 auVar423 [32];
  float fVar431;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  float in_register_000015dc;
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined8 *local_a40;
  undefined8 *local_a38;
  undefined1 (*local_a30) [32];
  Primitive *local_a28;
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [32];
  ulong local_760;
  undefined1 auStack_758 [24];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640 [4];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  RTCHitN local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  uint local_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar395 [64];
  
  PVar7 = prim[1];
  uVar95 = (ulong)(byte)PVar7;
  lVar98 = uVar95 * 5;
  lVar74 = uVar95 * 0x19;
  auVar146 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar206 = *(float *)(prim + lVar74 + 0x12);
  auVar146 = vsubps_avx(auVar146,*(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar144._0_4_ = fVar206 * auVar146._0_4_;
  auVar144._4_4_ = fVar206 * auVar146._4_4_;
  auVar144._8_4_ = fVar206 * auVar146._8_4_;
  auVar144._12_4_ = fVar206 * auVar146._12_4_;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 6)));
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 10)));
  auVar260._0_4_ = fVar206 * auVar17._0_4_;
  auVar260._4_4_ = fVar206 * auVar17._4_4_;
  auVar260._8_4_ = fVar206 * auVar17._8_4_;
  auVar260._12_4_ = fVar206 * auVar17._12_4_;
  auVar114._16_16_ = auVar151;
  auVar114._0_16_ = auVar146;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar98 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar98 + 10)));
  auVar197._16_16_ = auVar17;
  auVar197._0_16_ = auVar146;
  auVar123 = vcvtdq2ps_avx(auVar197);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 10)));
  auVar216._16_16_ = auVar17;
  auVar216._0_16_ = auVar146;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xb + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xb + 10)));
  auVar350 = vcvtdq2ps_avx(auVar216);
  auVar217._16_16_ = auVar17;
  auVar217._0_16_ = auVar146;
  auVar13 = vcvtdq2ps_avx(auVar217);
  uVar93 = (ulong)((uint)(byte)PVar7 * 0xc);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar294._16_16_ = auVar17;
  auVar294._0_16_ = auVar146;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar95 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar294);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar95 + 10)));
  auVar317._16_16_ = auVar17;
  auVar317._0_16_ = auVar146;
  lVar12 = uVar95 * 9;
  uVar93 = (ulong)(uint)((int)lVar12 * 2);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar348 = vcvtdq2ps_avx(auVar317);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar318._16_16_ = auVar17;
  auVar318._0_16_ = auVar146;
  auVar15 = vcvtdq2ps_avx(auVar318);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar95 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar95 + 10)));
  auVar372._16_16_ = auVar17;
  auVar372._0_16_ = auVar146;
  uVar93 = (ulong)(uint)((int)lVar98 << 2);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar16 = vcvtdq2ps_avx(auVar372);
  auVar387._16_16_ = auVar17;
  auVar387._0_16_ = auVar146;
  auVar349 = vcvtdq2ps_avx(auVar387);
  auVar146 = vshufps_avx(auVar260,auVar260,0);
  auVar17 = vshufps_avx(auVar260,auVar260,0x55);
  auVar151 = vshufps_avx(auVar260,auVar260,0xaa);
  fVar206 = auVar151._0_4_;
  fVar224 = auVar151._4_4_;
  fVar225 = auVar151._8_4_;
  fVar226 = auVar151._12_4_;
  fVar227 = auVar17._0_4_;
  fVar228 = auVar17._4_4_;
  fVar229 = auVar17._8_4_;
  fVar230 = auVar17._12_4_;
  fVar246 = auVar146._0_4_;
  fVar247 = auVar146._4_4_;
  fVar248 = auVar146._8_4_;
  fVar249 = auVar146._12_4_;
  auVar398._0_4_ = fVar246 * auVar114._0_4_ + fVar227 * auVar123._0_4_ + fVar206 * auVar350._0_4_;
  auVar398._4_4_ = fVar247 * auVar114._4_4_ + fVar228 * auVar123._4_4_ + fVar224 * auVar350._4_4_;
  auVar398._8_4_ = fVar248 * auVar114._8_4_ + fVar229 * auVar123._8_4_ + fVar225 * auVar350._8_4_;
  auVar398._12_4_ =
       fVar249 * auVar114._12_4_ + fVar230 * auVar123._12_4_ + fVar226 * auVar350._12_4_;
  auVar398._16_4_ =
       fVar246 * auVar114._16_4_ + fVar227 * auVar123._16_4_ + fVar206 * auVar350._16_4_;
  auVar398._20_4_ =
       fVar247 * auVar114._20_4_ + fVar228 * auVar123._20_4_ + fVar224 * auVar350._20_4_;
  auVar398._24_4_ =
       fVar248 * auVar114._24_4_ + fVar229 * auVar123._24_4_ + fVar225 * auVar350._24_4_;
  auVar398._28_4_ = fVar230 + in_register_000015dc + in_register_0000151c;
  auVar391._0_4_ = fVar246 * auVar13._0_4_ + fVar227 * auVar14._0_4_ + auVar348._0_4_ * fVar206;
  auVar391._4_4_ = fVar247 * auVar13._4_4_ + fVar228 * auVar14._4_4_ + auVar348._4_4_ * fVar224;
  auVar391._8_4_ = fVar248 * auVar13._8_4_ + fVar229 * auVar14._8_4_ + auVar348._8_4_ * fVar225;
  auVar391._12_4_ = fVar249 * auVar13._12_4_ + fVar230 * auVar14._12_4_ + auVar348._12_4_ * fVar226;
  auVar391._16_4_ = fVar246 * auVar13._16_4_ + fVar227 * auVar14._16_4_ + auVar348._16_4_ * fVar206;
  auVar391._20_4_ = fVar247 * auVar13._20_4_ + fVar228 * auVar14._20_4_ + auVar348._20_4_ * fVar224;
  auVar391._24_4_ = fVar248 * auVar13._24_4_ + fVar229 * auVar14._24_4_ + auVar348._24_4_ * fVar225;
  auVar391._28_4_ = fVar230 + in_register_000015dc + in_register_0000159c;
  auVar267._0_4_ = fVar246 * auVar15._0_4_ + fVar227 * auVar16._0_4_ + auVar349._0_4_ * fVar206;
  auVar267._4_4_ = fVar247 * auVar15._4_4_ + fVar228 * auVar16._4_4_ + auVar349._4_4_ * fVar224;
  auVar267._8_4_ = fVar248 * auVar15._8_4_ + fVar229 * auVar16._8_4_ + auVar349._8_4_ * fVar225;
  auVar267._12_4_ = fVar249 * auVar15._12_4_ + fVar230 * auVar16._12_4_ + auVar349._12_4_ * fVar226;
  auVar267._16_4_ = fVar246 * auVar15._16_4_ + fVar227 * auVar16._16_4_ + auVar349._16_4_ * fVar206;
  auVar267._20_4_ = fVar247 * auVar15._20_4_ + fVar228 * auVar16._20_4_ + auVar349._20_4_ * fVar224;
  auVar267._24_4_ = fVar248 * auVar15._24_4_ + fVar229 * auVar16._24_4_ + auVar349._24_4_ * fVar225;
  auVar267._28_4_ = fVar249 + fVar230 + fVar226;
  auVar146 = vshufps_avx(auVar144,auVar144,0);
  auVar17 = vshufps_avx(auVar144,auVar144,0x55);
  auVar151 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar224 = auVar151._0_4_;
  fVar225 = auVar151._4_4_;
  fVar226 = auVar151._8_4_;
  fVar227 = auVar151._12_4_;
  fVar247 = auVar17._0_4_;
  fVar248 = auVar17._4_4_;
  fVar249 = auVar17._8_4_;
  fVar252 = auVar17._12_4_;
  fVar228 = auVar146._0_4_;
  fVar229 = auVar146._4_4_;
  fVar230 = auVar146._8_4_;
  fVar246 = auVar146._12_4_;
  fVar206 = auVar114._28_4_;
  auVar295._0_4_ = fVar228 * auVar114._0_4_ + fVar247 * auVar123._0_4_ + fVar224 * auVar350._0_4_;
  auVar295._4_4_ = fVar229 * auVar114._4_4_ + fVar248 * auVar123._4_4_ + fVar225 * auVar350._4_4_;
  auVar295._8_4_ = fVar230 * auVar114._8_4_ + fVar249 * auVar123._8_4_ + fVar226 * auVar350._8_4_;
  auVar295._12_4_ =
       fVar246 * auVar114._12_4_ + fVar252 * auVar123._12_4_ + fVar227 * auVar350._12_4_;
  auVar295._16_4_ =
       fVar228 * auVar114._16_4_ + fVar247 * auVar123._16_4_ + fVar224 * auVar350._16_4_;
  auVar295._20_4_ =
       fVar229 * auVar114._20_4_ + fVar248 * auVar123._20_4_ + fVar225 * auVar350._20_4_;
  auVar295._24_4_ =
       fVar230 * auVar114._24_4_ + fVar249 * auVar123._24_4_ + fVar226 * auVar350._24_4_;
  auVar295._28_4_ = fVar206 + auVar123._28_4_ + auVar350._28_4_;
  auVar159._0_4_ = fVar228 * auVar13._0_4_ + auVar348._0_4_ * fVar224 + fVar247 * auVar14._0_4_;
  auVar159._4_4_ = fVar229 * auVar13._4_4_ + auVar348._4_4_ * fVar225 + fVar248 * auVar14._4_4_;
  auVar159._8_4_ = fVar230 * auVar13._8_4_ + auVar348._8_4_ * fVar226 + fVar249 * auVar14._8_4_;
  auVar159._12_4_ = fVar246 * auVar13._12_4_ + auVar348._12_4_ * fVar227 + fVar252 * auVar14._12_4_;
  auVar159._16_4_ = fVar228 * auVar13._16_4_ + auVar348._16_4_ * fVar224 + fVar247 * auVar14._16_4_;
  auVar159._20_4_ = fVar229 * auVar13._20_4_ + auVar348._20_4_ * fVar225 + fVar248 * auVar14._20_4_;
  auVar159._24_4_ = fVar230 * auVar13._24_4_ + auVar348._24_4_ * fVar226 + fVar249 * auVar14._24_4_;
  auVar159._28_4_ = fVar206 + auVar348._28_4_ + auVar350._28_4_;
  auVar319._8_4_ = 0x7fffffff;
  auVar319._0_8_ = 0x7fffffff7fffffff;
  auVar319._12_4_ = 0x7fffffff;
  auVar319._16_4_ = 0x7fffffff;
  auVar319._20_4_ = 0x7fffffff;
  auVar319._24_4_ = 0x7fffffff;
  auVar319._28_4_ = 0x7fffffff;
  auVar373._8_4_ = 0x219392ef;
  auVar373._0_8_ = 0x219392ef219392ef;
  auVar373._12_4_ = 0x219392ef;
  auVar373._16_4_ = 0x219392ef;
  auVar373._20_4_ = 0x219392ef;
  auVar373._24_4_ = 0x219392ef;
  auVar373._28_4_ = 0x219392ef;
  auVar114 = vandps_avx(auVar398,auVar319);
  auVar114 = vcmpps_avx(auVar114,auVar373,1);
  auVar123 = vblendvps_avx(auVar398,auVar373,auVar114);
  auVar114 = vandps_avx(auVar391,auVar319);
  auVar114 = vcmpps_avx(auVar114,auVar373,1);
  auVar350 = vblendvps_avx(auVar391,auVar373,auVar114);
  auVar114 = vandps_avx(auVar267,auVar319);
  auVar114 = vcmpps_avx(auVar114,auVar373,1);
  auVar114 = vblendvps_avx(auVar267,auVar373,auVar114);
  auVar198._0_4_ = fVar247 * auVar16._0_4_ + auVar349._0_4_ * fVar224 + fVar228 * auVar15._0_4_;
  auVar198._4_4_ = fVar248 * auVar16._4_4_ + auVar349._4_4_ * fVar225 + fVar229 * auVar15._4_4_;
  auVar198._8_4_ = fVar249 * auVar16._8_4_ + auVar349._8_4_ * fVar226 + fVar230 * auVar15._8_4_;
  auVar198._12_4_ = fVar252 * auVar16._12_4_ + auVar349._12_4_ * fVar227 + fVar246 * auVar15._12_4_;
  auVar198._16_4_ = fVar247 * auVar16._16_4_ + auVar349._16_4_ * fVar224 + fVar228 * auVar15._16_4_;
  auVar198._20_4_ = fVar248 * auVar16._20_4_ + auVar349._20_4_ * fVar225 + fVar229 * auVar15._20_4_;
  auVar198._24_4_ = fVar249 * auVar16._24_4_ + auVar349._24_4_ * fVar226 + fVar230 * auVar15._24_4_;
  auVar198._28_4_ = auVar14._28_4_ + fVar227 + fVar206;
  auVar13 = vrcpps_avx(auVar123);
  fVar206 = auVar13._0_4_;
  fVar224 = auVar13._4_4_;
  auVar14._4_4_ = auVar123._4_4_ * fVar224;
  auVar14._0_4_ = auVar123._0_4_ * fVar206;
  fVar225 = auVar13._8_4_;
  auVar14._8_4_ = auVar123._8_4_ * fVar225;
  fVar226 = auVar13._12_4_;
  auVar14._12_4_ = auVar123._12_4_ * fVar226;
  fVar227 = auVar13._16_4_;
  auVar14._16_4_ = auVar123._16_4_ * fVar227;
  fVar228 = auVar13._20_4_;
  auVar14._20_4_ = auVar123._20_4_ * fVar228;
  fVar229 = auVar13._24_4_;
  auVar14._24_4_ = auVar123._24_4_ * fVar229;
  auVar14._28_4_ = auVar123._28_4_;
  auVar346._8_4_ = 0x3f800000;
  auVar346._0_8_ = &DAT_3f8000003f800000;
  auVar346._12_4_ = 0x3f800000;
  auVar346._16_4_ = 0x3f800000;
  auVar346._20_4_ = 0x3f800000;
  auVar346._24_4_ = 0x3f800000;
  auVar346._28_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar346,auVar14);
  auVar123 = vrcpps_avx(auVar350);
  fVar206 = fVar206 + fVar206 * auVar14._0_4_;
  fVar224 = fVar224 + fVar224 * auVar14._4_4_;
  fVar225 = fVar225 + fVar225 * auVar14._8_4_;
  fVar226 = fVar226 + fVar226 * auVar14._12_4_;
  fVar227 = fVar227 + fVar227 * auVar14._16_4_;
  fVar228 = fVar228 + fVar228 * auVar14._20_4_;
  fVar229 = fVar229 + fVar229 * auVar14._24_4_;
  fVar258 = auVar123._0_4_;
  fVar277 = auVar123._4_4_;
  auVar348._4_4_ = fVar277 * auVar350._4_4_;
  auVar348._0_4_ = fVar258 * auVar350._0_4_;
  fVar279 = auVar123._8_4_;
  auVar348._8_4_ = fVar279 * auVar350._8_4_;
  fVar281 = auVar123._12_4_;
  auVar348._12_4_ = fVar281 * auVar350._12_4_;
  fVar283 = auVar123._16_4_;
  auVar348._16_4_ = fVar283 * auVar350._16_4_;
  fVar285 = auVar123._20_4_;
  auVar348._20_4_ = fVar285 * auVar350._20_4_;
  fVar287 = auVar123._24_4_;
  auVar348._24_4_ = fVar287 * auVar350._24_4_;
  auVar348._28_4_ = auVar13._28_4_;
  auVar123 = vsubps_avx(auVar346,auVar348);
  fVar258 = fVar258 + fVar258 * auVar123._0_4_;
  fVar277 = fVar277 + fVar277 * auVar123._4_4_;
  fVar279 = fVar279 + fVar279 * auVar123._8_4_;
  fVar281 = fVar281 + fVar281 * auVar123._12_4_;
  fVar283 = fVar283 + fVar283 * auVar123._16_4_;
  fVar285 = fVar285 + fVar285 * auVar123._20_4_;
  fVar287 = fVar287 + fVar287 * auVar123._24_4_;
  auVar123 = vrcpps_avx(auVar114);
  fVar230 = auVar123._0_4_;
  fVar246 = auVar123._4_4_;
  auVar15._4_4_ = fVar246 * auVar114._4_4_;
  auVar15._0_4_ = fVar230 * auVar114._0_4_;
  fVar247 = auVar123._8_4_;
  auVar15._8_4_ = fVar247 * auVar114._8_4_;
  fVar248 = auVar123._12_4_;
  auVar15._12_4_ = fVar248 * auVar114._12_4_;
  fVar249 = auVar123._16_4_;
  auVar15._16_4_ = fVar249 * auVar114._16_4_;
  fVar252 = auVar123._20_4_;
  auVar15._20_4_ = fVar252 * auVar114._20_4_;
  fVar255 = auVar123._24_4_;
  auVar15._24_4_ = fVar255 * auVar114._24_4_;
  auVar15._28_4_ = auVar350._28_4_;
  auVar114 = vsubps_avx(auVar346,auVar15);
  fVar230 = fVar230 + fVar230 * auVar114._0_4_;
  fVar246 = fVar246 + fVar246 * auVar114._4_4_;
  fVar247 = fVar247 + fVar247 * auVar114._8_4_;
  fVar248 = fVar248 + fVar248 * auVar114._12_4_;
  fVar249 = fVar249 + fVar249 * auVar114._16_4_;
  fVar252 = fVar252 + fVar252 * auVar114._20_4_;
  fVar255 = fVar255 + fVar255 * auVar114._24_4_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar95 * 7 + 6);
  auVar146 = vpmovsxwd_avx(auVar146);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar95 * 7 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar115._16_16_ = auVar17;
  auVar115._0_16_ = auVar146;
  auVar114 = vcvtdq2ps_avx(auVar115);
  auVar114 = vsubps_avx(auVar114,auVar295);
  auVar103._0_4_ = fVar206 * auVar114._0_4_;
  auVar103._4_4_ = fVar224 * auVar114._4_4_;
  auVar103._8_4_ = fVar225 * auVar114._8_4_;
  auVar103._12_4_ = fVar226 * auVar114._12_4_;
  auVar350._16_4_ = fVar227 * auVar114._16_4_;
  auVar350._0_16_ = auVar103;
  auVar350._20_4_ = fVar228 * auVar114._20_4_;
  auVar350._24_4_ = fVar229 * auVar114._24_4_;
  auVar350._28_4_ = auVar114._28_4_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + lVar12 + 6);
  auVar146 = vpmovsxwd_avx(auVar151);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + lVar12 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar3);
  auVar320._16_16_ = auVar17;
  auVar320._0_16_ = auVar146;
  auVar114 = vcvtdq2ps_avx(auVar320);
  auVar114 = vsubps_avx(auVar114,auVar295);
  auVar207._0_4_ = fVar206 * auVar114._0_4_;
  auVar207._4_4_ = fVar224 * auVar114._4_4_;
  auVar207._8_4_ = fVar225 * auVar114._8_4_;
  auVar207._12_4_ = fVar226 * auVar114._12_4_;
  auVar16._16_4_ = fVar227 * auVar114._16_4_;
  auVar16._0_16_ = auVar207;
  auVar16._20_4_ = fVar228 * auVar114._20_4_;
  auVar16._24_4_ = fVar229 * auVar114._24_4_;
  auVar16._28_4_ = auVar13._28_4_ + auVar14._28_4_;
  lVar98 = (ulong)(byte)PVar7 * 0x10;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar146 = vpmovsxwd_avx(auVar316);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar4);
  lVar98 = lVar98 + uVar95 * -2;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar151 = vpmovsxwd_avx(auVar106);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar3 = vpmovsxwd_avx(auVar190);
  auVar296._16_16_ = auVar3;
  auVar296._0_16_ = auVar151;
  auVar114 = vcvtdq2ps_avx(auVar296);
  auVar114 = vsubps_avx(auVar114,auVar159);
  auVar291._0_4_ = fVar258 * auVar114._0_4_;
  auVar291._4_4_ = fVar277 * auVar114._4_4_;
  auVar291._8_4_ = fVar279 * auVar114._8_4_;
  auVar291._12_4_ = fVar281 * auVar114._12_4_;
  auVar13._16_4_ = fVar283 * auVar114._16_4_;
  auVar13._0_16_ = auVar291;
  auVar13._20_4_ = fVar285 * auVar114._20_4_;
  auVar13._24_4_ = fVar287 * auVar114._24_4_;
  auVar13._28_4_ = auVar114._28_4_;
  auVar321._16_16_ = auVar17;
  auVar321._0_16_ = auVar146;
  auVar114 = vcvtdq2ps_avx(auVar321);
  auVar114 = vsubps_avx(auVar114,auVar159);
  auVar145._0_4_ = fVar258 * auVar114._0_4_;
  auVar145._4_4_ = fVar277 * auVar114._4_4_;
  auVar145._8_4_ = fVar279 * auVar114._8_4_;
  auVar145._12_4_ = fVar281 * auVar114._12_4_;
  auVar349._16_4_ = fVar283 * auVar114._16_4_;
  auVar349._0_16_ = auVar145;
  auVar349._20_4_ = fVar285 * auVar114._20_4_;
  auVar349._24_4_ = fVar287 * auVar114._24_4_;
  auVar349._28_4_ = auVar114._28_4_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar93 + uVar95 + 6);
  auVar146 = vpmovsxwd_avx(auVar209);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar93 + uVar95 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar5);
  auVar268._16_16_ = auVar17;
  auVar268._0_16_ = auVar146;
  auVar114 = vcvtdq2ps_avx(auVar268);
  auVar114 = vsubps_avx(auVar114,auVar198);
  auVar261._0_4_ = fVar230 * auVar114._0_4_;
  auVar261._4_4_ = fVar246 * auVar114._4_4_;
  auVar261._8_4_ = fVar247 * auVar114._8_4_;
  auVar261._12_4_ = fVar248 * auVar114._12_4_;
  auVar20._16_4_ = fVar249 * auVar114._16_4_;
  auVar20._0_16_ = auVar261;
  auVar20._20_4_ = fVar252 * auVar114._20_4_;
  auVar20._24_4_ = fVar255 * auVar114._24_4_;
  auVar20._28_4_ = auVar114._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar95 * 0x17 + 6);
  auVar146 = vpmovsxwd_avx(auVar6);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar95 * 0x17 + 0xe);
  auVar17 = vpmovsxwd_avx(auVar150);
  auVar322._16_16_ = auVar17;
  auVar322._0_16_ = auVar146;
  auVar114 = vcvtdq2ps_avx(auVar322);
  auVar114 = vsubps_avx(auVar114,auVar198);
  auVar189._0_4_ = fVar230 * auVar114._0_4_;
  auVar189._4_4_ = fVar246 * auVar114._4_4_;
  auVar189._8_4_ = fVar247 * auVar114._8_4_;
  auVar189._12_4_ = fVar248 * auVar114._12_4_;
  auVar21._16_4_ = fVar249 * auVar114._16_4_;
  auVar21._0_16_ = auVar189;
  auVar21._20_4_ = fVar252 * auVar114._20_4_;
  auVar21._24_4_ = fVar255 * auVar114._24_4_;
  auVar21._28_4_ = auVar114._28_4_;
  auVar146 = vpminsd_avx(auVar350._16_16_,auVar16._16_16_);
  auVar17 = vpminsd_avx(auVar103,auVar207);
  auVar347._16_16_ = auVar146;
  auVar347._0_16_ = auVar17;
  auVar146 = vpminsd_avx(auVar13._16_16_,auVar349._16_16_);
  auVar17 = vpminsd_avx(auVar291,auVar145);
  auVar392._16_16_ = auVar146;
  auVar392._0_16_ = auVar17;
  auVar114 = vmaxps_avx(auVar347,auVar392);
  auVar146 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar17 = vpminsd_avx(auVar261,auVar189);
  auVar408._16_16_ = auVar146;
  auVar408._0_16_ = auVar17;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar421._4_4_ = uVar1;
  auVar421._0_4_ = uVar1;
  auVar421._8_4_ = uVar1;
  auVar421._12_4_ = uVar1;
  auVar421._16_4_ = uVar1;
  auVar421._20_4_ = uVar1;
  auVar421._24_4_ = uVar1;
  auVar421._28_4_ = uVar1;
  auVar123 = vmaxps_avx(auVar408,auVar421);
  auVar114 = vmaxps_avx(auVar114,auVar123);
  local_3e0._4_4_ = auVar114._4_4_ * 0.99999964;
  local_3e0._0_4_ = auVar114._0_4_ * 0.99999964;
  local_3e0._8_4_ = auVar114._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar114._12_4_ * 0.99999964;
  local_3e0._16_4_ = auVar114._16_4_ * 0.99999964;
  local_3e0._20_4_ = auVar114._20_4_ * 0.99999964;
  local_3e0._24_4_ = auVar114._24_4_ * 0.99999964;
  local_3e0._28_4_ = auVar114._28_4_;
  auVar146 = vpmaxsd_avx(auVar350._16_16_,auVar16._16_16_);
  auVar17 = vpmaxsd_avx(auVar103,auVar207);
  auVar116._16_16_ = auVar146;
  auVar116._0_16_ = auVar17;
  auVar146 = vpmaxsd_avx(auVar13._16_16_,auVar349._16_16_);
  auVar17 = vpmaxsd_avx(auVar291,auVar145);
  auVar160._16_16_ = auVar146;
  auVar160._0_16_ = auVar17;
  auVar114 = vminps_avx(auVar116,auVar160);
  auVar146 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar17 = vpmaxsd_avx(auVar261,auVar189);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar218._4_4_ = uVar1;
  auVar218._0_4_ = uVar1;
  auVar218._8_4_ = uVar1;
  auVar218._12_4_ = uVar1;
  auVar218._16_4_ = uVar1;
  auVar218._20_4_ = uVar1;
  auVar218._24_4_ = uVar1;
  auVar218._28_4_ = uVar1;
  auVar161._16_16_ = auVar146;
  auVar161._0_16_ = auVar17;
  auVar123 = vminps_avx(auVar161,auVar218);
  auVar114 = vminps_avx(auVar114,auVar123);
  auVar123._4_4_ = auVar114._4_4_ * 1.0000004;
  auVar123._0_4_ = auVar114._0_4_ * 1.0000004;
  auVar123._8_4_ = auVar114._8_4_ * 1.0000004;
  auVar123._12_4_ = auVar114._12_4_ * 1.0000004;
  auVar123._16_4_ = auVar114._16_4_ * 1.0000004;
  auVar123._20_4_ = auVar114._20_4_ * 1.0000004;
  auVar123._24_4_ = auVar114._24_4_ * 1.0000004;
  auVar123._28_4_ = auVar114._28_4_;
  auVar114 = vcmpps_avx(local_3e0,auVar123,2);
  auVar146 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar162._16_16_ = auVar146;
  auVar162._0_16_ = auVar146;
  auVar123 = vcvtdq2ps_avx(auVar162);
  auVar123 = vcmpps_avx(_DAT_02020f40,auVar123,1);
  auVar114 = vandps_avx(auVar114,auVar123);
  uVar94 = vmovmskps_avx(auVar114);
  if (uVar94 == 0) {
    return;
  }
  uVar94 = uVar94 & 0xff;
  local_910 = prim + lVar74 + 0x16;
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  local_4a0 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_a30 = (undefined1 (*) [32])&local_540;
  uVar96 = 1 << ((byte)k & 0x1f);
  local_a38 = (undefined8 *)(mm_lookupmask_ps + ((uVar96 & 0xf) << 4));
  local_a40 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar96 >> 4) * 0x10);
  local_a28 = prim;
LAB_010c4330:
  local_908 = (ulong)uVar94;
  lVar98 = 0;
  if (local_908 != 0) {
    for (; (uVar94 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
    }
  }
  local_908 = local_908 - 1 & local_908;
  uVar94 = *(uint *)(local_a28 + lVar98 * 4 + 6);
  lVar98 = lVar98 * 0x40;
  lVar12 = 0;
  if (local_908 != 0) {
    for (; (local_908 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  uVar96 = *(uint *)(local_a28 + 2);
  auVar146 = *(undefined1 (*) [16])(local_910 + lVar98);
  if (((local_908 != 0) && (uVar95 = local_908 - 1 & local_908, uVar95 != 0)) &&
     (lVar12 = 0, uVar95 != 0)) {
    for (; (uVar95 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  auVar17 = *(undefined1 (*) [16])(local_910 + lVar98 + 0x10);
  auVar151 = *(undefined1 (*) [16])(local_910 + lVar98 + 0x20);
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar4 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar206 = *(float *)(ray + k * 4 + 0x80);
  auVar370._4_4_ = fVar206;
  auVar370._0_4_ = fVar206;
  auVar370._8_4_ = fVar206;
  auVar370._12_4_ = fVar206;
  fStack_830 = fVar206;
  _local_840 = auVar370;
  fStack_82c = fVar206;
  fStack_828 = fVar206;
  fStack_824 = fVar206;
  auVar3 = *(undefined1 (*) [16])(local_910 + lVar98 + 0x30);
  fVar224 = *(float *)(ray + k * 4 + 0xa0);
  auVar386._4_4_ = fVar224;
  auVar386._0_4_ = fVar224;
  auVar386._8_4_ = fVar224;
  auVar386._12_4_ = fVar224;
  fStack_850 = fVar224;
  _local_860 = auVar386;
  fStack_84c = fVar224;
  fStack_848 = fVar224;
  fStack_844 = fVar224;
  auVar316 = vunpcklps_avx(auVar370,auVar386);
  fVar225 = *(float *)(ray + k * 4 + 0xc0);
  auVar390._4_4_ = fVar225;
  auVar390._0_4_ = fVar225;
  auVar390._8_4_ = fVar225;
  auVar390._12_4_ = fVar225;
  fStack_870 = fVar225;
  _local_880 = auVar390;
  fStack_86c = fVar225;
  fStack_868 = fVar225;
  fStack_864 = fVar225;
  auVar395 = ZEXT3264(_local_880);
  _local_9b0 = vinsertps_avx(auVar316,auVar390,0x28);
  auVar104._0_4_ = (auVar146._0_4_ + auVar17._0_4_ + auVar151._0_4_ + auVar3._0_4_) * 0.25;
  auVar104._4_4_ = (auVar146._4_4_ + auVar17._4_4_ + auVar151._4_4_ + auVar3._4_4_) * 0.25;
  auVar104._8_4_ = (auVar146._8_4_ + auVar17._8_4_ + auVar151._8_4_ + auVar3._8_4_) * 0.25;
  auVar104._12_4_ = (auVar146._12_4_ + auVar17._12_4_ + auVar151._12_4_ + auVar3._12_4_) * 0.25;
  auVar316 = vsubps_avx(auVar104,auVar4);
  auVar316 = vdpps_avx(auVar316,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar106 = vrcpss_avx(local_9c0,local_9c0);
  fVar226 = auVar316._0_4_ * auVar106._0_4_ * (2.0 - local_9c0._0_4_ * auVar106._0_4_);
  auVar106 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
  auVar231._0_4_ = auVar4._0_4_ + local_9b0._0_4_ * auVar106._0_4_;
  auVar231._4_4_ = auVar4._4_4_ + local_9b0._4_4_ * auVar106._4_4_;
  auVar231._8_4_ = auVar4._8_4_ + local_9b0._8_4_ * auVar106._8_4_;
  auVar231._12_4_ = auVar4._12_4_ + local_9b0._12_4_ * auVar106._12_4_;
  auVar316 = vblendps_avx(auVar231,_DAT_01feba10,8);
  _local_ae0 = vsubps_avx(auVar146,auVar316);
  _local_af0 = vsubps_avx(auVar151,auVar316);
  auVar223 = ZEXT1664(_local_af0);
  _local_b00 = vsubps_avx(auVar17,auVar316);
  _local_b10 = vsubps_avx(auVar3,auVar316);
  auVar146 = vshufps_avx(_local_ae0,_local_ae0,0);
  register0x00001250 = auVar146;
  _local_1a0 = auVar146;
  auVar146 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001250 = auVar146;
  _local_1c0 = auVar146;
  auVar146 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001250 = auVar146;
  _local_1e0 = auVar146;
  auVar146 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar146;
  _local_200 = auVar146;
  auVar146 = vshufps_avx(_local_b00,_local_b00,0);
  register0x00001290 = auVar146;
  _local_220 = auVar146;
  auVar146 = vshufps_avx(_local_b00,_local_b00,0x55);
  register0x00001290 = auVar146;
  _local_240 = auVar146;
  auVar146 = vshufps_avx(_local_b00,_local_b00,0xaa);
  register0x00001290 = auVar146;
  _local_260 = auVar146;
  auVar146 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar146;
  _local_280 = auVar146;
  auVar146 = vshufps_avx(_local_af0,_local_af0,0);
  register0x00001290 = auVar146;
  _local_2a0 = auVar146;
  auVar146 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001290 = auVar146;
  _local_2c0 = auVar146;
  auVar146 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar146;
  _local_2e0 = auVar146;
  auVar146 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar146;
  _local_300 = auVar146;
  auVar146 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar146;
  _local_320 = auVar146;
  auVar146 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar146;
  _local_340 = auVar146;
  auVar146 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar146;
  _local_360 = auVar146;
  auVar146 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar146;
  _local_380 = auVar146;
  auVar146 = ZEXT416((uint)(fVar206 * fVar206 + fVar224 * fVar224 + fVar225 * fVar225));
  auVar146 = vshufps_avx(auVar146,auVar146,0);
  local_3a0._16_16_ = auVar146;
  local_3a0._0_16_ = auVar146;
  fVar206 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)fVar226);
  auVar146 = vshufps_avx(ZEXT416((uint)(fVar206 - fVar226)),ZEXT416((uint)(fVar206 - fVar226)),0);
  local_3c0._16_16_ = auVar146;
  local_3c0._0_16_ = auVar146;
  auVar146 = vshufps_avx(ZEXT416(uVar96),ZEXT416(uVar96),0);
  local_4e0._16_16_ = auVar146;
  local_4e0._0_16_ = auVar146;
  auVar146 = vshufps_avx(ZEXT416(uVar94),ZEXT416(uVar94),0);
  local_500._16_16_ = auVar146;
  local_500._0_16_ = auVar146;
  register0x00001390 = auVar106;
  _local_a00 = auVar106;
  auVar302 = ZEXT3264(_local_a00);
  uVar95 = 1;
  uVar93 = 0;
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_3a0,auVar118);
  auVar146 = vsqrtss_avx(local_9c0,local_9c0);
  auVar17 = vsqrtss_avx(local_9c0,local_9c0);
  auVar330 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar316 = auVar330._0_16_;
    auVar151 = vmovshdup_avx(auVar316);
    fVar224 = auVar151._0_4_ - auVar330._0_4_;
    auVar151 = vshufps_avx(auVar316,auVar316,0);
    local_9e0._16_16_ = auVar151;
    local_9e0._0_16_ = auVar151;
    auVar3 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
    local_960._16_16_ = auVar3;
    local_960._0_16_ = auVar3;
    fVar143 = auVar3._0_4_;
    fVar181 = auVar3._4_4_;
    fVar182 = auVar3._8_4_;
    fVar184 = auVar3._12_4_;
    fVar101 = auVar151._0_4_;
    auVar163._0_4_ = fVar101 + fVar143 * 0.0;
    fVar133 = auVar151._4_4_;
    auVar163._4_4_ = fVar133 + fVar181 * 0.14285715;
    fVar135 = auVar151._8_4_;
    auVar163._8_4_ = fVar135 + fVar182 * 0.2857143;
    fVar137 = auVar151._12_4_;
    auVar163._12_4_ = fVar137 + fVar184 * 0.42857146;
    auVar163._16_4_ = fVar101 + fVar143 * 0.5714286;
    auVar163._20_4_ = fVar133 + fVar181 * 0.71428573;
    auVar163._24_4_ = fVar135 + fVar182 * 0.8571429;
    auVar163._28_4_ = fVar137 + fVar184;
    auVar114 = vsubps_avx(auVar245._0_32_,auVar163);
    fVar225 = auVar114._0_4_;
    fVar226 = auVar114._4_4_;
    fVar227 = auVar114._8_4_;
    fVar228 = auVar114._12_4_;
    fVar229 = auVar114._16_4_;
    fVar230 = auVar114._20_4_;
    fVar246 = auVar114._24_4_;
    fVar279 = auVar223._28_4_;
    fVar289 = (float)local_2a0._0_4_ * auVar163._0_4_ + (float)local_220._0_4_ * fVar225;
    fVar303 = (float)local_2a0._4_4_ * auVar163._4_4_ + (float)local_220._4_4_ * fVar226;
    fVar305 = fStack_298 * auVar163._8_4_ + fStack_218 * fVar227;
    fVar307 = fStack_294 * auVar163._12_4_ + fStack_214 * fVar228;
    fVar309 = fStack_290 * auVar163._16_4_ + fStack_210 * fVar229;
    fVar311 = fStack_28c * auVar163._20_4_ + fStack_20c * fVar230;
    fVar313 = fStack_288 * auVar163._24_4_ + fStack_208 * fVar246;
    fVar247 = (float)local_2c0._0_4_ * auVar163._0_4_ + (float)local_240._0_4_ * fVar225;
    fVar248 = (float)local_2c0._4_4_ * auVar163._4_4_ + (float)local_240._4_4_ * fVar226;
    fVar249 = fStack_2b8 * auVar163._8_4_ + fStack_238 * fVar227;
    fVar252 = fStack_2b4 * auVar163._12_4_ + fStack_234 * fVar228;
    fVar255 = fStack_2b0 * auVar163._16_4_ + fStack_230 * fVar229;
    fVar258 = fStack_2ac * auVar163._20_4_ + fStack_22c * fVar230;
    fVar277 = fStack_2a8 * auVar163._24_4_ + fStack_228 * fVar246;
    fVar281 = (float)local_2e0._0_4_ * auVar163._0_4_ + (float)local_260._0_4_ * fVar225;
    fVar283 = (float)local_2e0._4_4_ * auVar163._4_4_ + (float)local_260._4_4_ * fVar226;
    fVar285 = fStack_2d8 * auVar163._8_4_ + fStack_258 * fVar227;
    fVar287 = fStack_2d4 * auVar163._12_4_ + fStack_254 * fVar228;
    fVar250 = fStack_2d0 * auVar163._16_4_ + fStack_250 * fVar229;
    fVar253 = fStack_2cc * auVar163._20_4_ + fStack_24c * fVar230;
    fVar256 = fStack_2c8 * auVar163._24_4_ + fStack_248 * fVar246;
    fVar259 = (float)local_300._0_4_ * auVar163._0_4_ + (float)local_280._0_4_ * fVar225;
    fVar278 = (float)local_300._4_4_ * auVar163._4_4_ + (float)local_280._4_4_ * fVar226;
    fVar280 = fStack_2f8 * auVar163._8_4_ + fStack_278 * fVar227;
    fVar282 = fStack_2f4 * auVar163._12_4_ + fStack_274 * fVar228;
    fVar284 = fStack_2f0 * auVar163._16_4_ + fStack_270 * fVar229;
    fVar286 = fStack_2ec * auVar163._20_4_ + fStack_26c * fVar230;
    fVar288 = fStack_2e8 * auVar163._24_4_ + fStack_268 * fVar246;
    fVar396 = auVar395._28_4_;
    fVar406 = fStack_204 + fVar396;
    auVar374._0_4_ =
         ((float)local_220._0_4_ * auVar163._0_4_ + fVar225 * (float)local_1a0._0_4_) * fVar225 +
         auVar163._0_4_ * fVar289;
    auVar374._4_4_ =
         ((float)local_220._4_4_ * auVar163._4_4_ + fVar226 * (float)local_1a0._4_4_) * fVar226 +
         auVar163._4_4_ * fVar303;
    auVar374._8_4_ =
         (fStack_218 * auVar163._8_4_ + fVar227 * fStack_198) * fVar227 + auVar163._8_4_ * fVar305;
    auVar374._12_4_ =
         (fStack_214 * auVar163._12_4_ + fVar228 * fStack_194) * fVar228 + auVar163._12_4_ * fVar307
    ;
    auVar374._16_4_ =
         (fStack_210 * auVar163._16_4_ + fVar229 * fStack_190) * fVar229 + auVar163._16_4_ * fVar309
    ;
    auVar374._20_4_ =
         (fStack_20c * auVar163._20_4_ + fVar230 * fStack_18c) * fVar230 + auVar163._20_4_ * fVar311
    ;
    auVar374._24_4_ =
         (fStack_208 * auVar163._24_4_ + fVar246 * fStack_188) * fVar246 + auVar163._24_4_ * fVar313
    ;
    auVar374._28_4_ = fStack_2e4 + fVar396;
    auVar388._0_4_ =
         fVar225 * ((float)local_240._0_4_ * auVar163._0_4_ + fVar225 * (float)local_1c0._0_4_) +
         auVar163._0_4_ * fVar247;
    auVar388._4_4_ =
         fVar226 * ((float)local_240._4_4_ * auVar163._4_4_ + fVar226 * (float)local_1c0._4_4_) +
         auVar163._4_4_ * fVar248;
    auVar388._8_4_ =
         fVar227 * (fStack_238 * auVar163._8_4_ + fVar227 * fStack_1b8) + auVar163._8_4_ * fVar249;
    auVar388._12_4_ =
         fVar228 * (fStack_234 * auVar163._12_4_ + fVar228 * fStack_1b4) + auVar163._12_4_ * fVar252
    ;
    auVar388._16_4_ =
         fVar229 * (fStack_230 * auVar163._16_4_ + fVar229 * fStack_1b0) + auVar163._16_4_ * fVar255
    ;
    auVar388._20_4_ =
         fVar230 * (fStack_22c * auVar163._20_4_ + fVar230 * fStack_1ac) + auVar163._20_4_ * fVar258
    ;
    auVar388._24_4_ =
         fVar246 * (fStack_228 * auVar163._24_4_ + fVar246 * fStack_1a8) + auVar163._24_4_ * fVar277
    ;
    auVar388._28_4_ = fVar279 + auVar330._28_4_ + fVar396;
    auVar393._0_4_ =
         fVar225 * ((float)local_260._0_4_ * auVar163._0_4_ + fVar225 * (float)local_1e0._0_4_) +
         auVar163._0_4_ * fVar281;
    auVar393._4_4_ =
         fVar226 * ((float)local_260._4_4_ * auVar163._4_4_ + fVar226 * (float)local_1e0._4_4_) +
         auVar163._4_4_ * fVar283;
    auVar393._8_4_ =
         fVar227 * (fStack_258 * auVar163._8_4_ + fVar227 * fStack_1d8) + auVar163._8_4_ * fVar285;
    auVar393._12_4_ =
         fVar228 * (fStack_254 * auVar163._12_4_ + fVar228 * fStack_1d4) + auVar163._12_4_ * fVar287
    ;
    auVar393._16_4_ =
         fVar229 * (fStack_250 * auVar163._16_4_ + fVar229 * fStack_1d0) + auVar163._16_4_ * fVar250
    ;
    auVar393._20_4_ =
         fVar230 * (fStack_24c * auVar163._20_4_ + fVar230 * fStack_1cc) + auVar163._20_4_ * fVar253
    ;
    auVar393._24_4_ =
         fVar246 * (fStack_248 * auVar163._24_4_ + fVar246 * fStack_1c8) + auVar163._24_4_ * fVar256
    ;
    auVar393._28_4_ = fStack_2c4 + fVar396;
    auVar323._0_4_ =
         auVar163._0_4_ * fVar259 +
         fVar225 * ((float)local_280._0_4_ * auVar163._0_4_ + fVar225 * (float)local_200._0_4_);
    auVar323._4_4_ =
         auVar163._4_4_ * fVar278 +
         fVar226 * ((float)local_280._4_4_ * auVar163._4_4_ + fVar226 * (float)local_200._4_4_);
    auVar323._8_4_ =
         auVar163._8_4_ * fVar280 + fVar227 * (fStack_278 * auVar163._8_4_ + fVar227 * fStack_1f8);
    auVar323._12_4_ =
         auVar163._12_4_ * fVar282 + fVar228 * (fStack_274 * auVar163._12_4_ + fVar228 * fStack_1f4)
    ;
    auVar323._16_4_ =
         auVar163._16_4_ * fVar284 + fVar229 * (fStack_270 * auVar163._16_4_ + fVar229 * fStack_1f0)
    ;
    auVar323._20_4_ =
         auVar163._20_4_ * fVar286 + fVar230 * (fStack_26c * auVar163._20_4_ + fVar230 * fStack_1ec)
    ;
    auVar323._24_4_ =
         auVar163._24_4_ * fVar288 + fVar246 * (fStack_268 * auVar163._24_4_ + fVar246 * fStack_1e8)
    ;
    auVar323._28_4_ = fStack_2c4 + fStack_2a4;
    auVar422._0_4_ =
         (auVar163._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar225) *
         auVar163._0_4_ + fVar225 * fVar289;
    auVar422._4_4_ =
         (auVar163._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar226) *
         auVar163._4_4_ + fVar226 * fVar303;
    auVar422._8_4_ =
         (auVar163._8_4_ * fStack_318 + fStack_298 * fVar227) * auVar163._8_4_ + fVar227 * fVar305;
    auVar422._12_4_ =
         (auVar163._12_4_ * fStack_314 + fStack_294 * fVar228) * auVar163._12_4_ + fVar228 * fVar307
    ;
    auVar422._16_4_ =
         (auVar163._16_4_ * fStack_310 + fStack_290 * fVar229) * auVar163._16_4_ + fVar229 * fVar309
    ;
    auVar422._20_4_ =
         (auVar163._20_4_ * fStack_30c + fStack_28c * fVar230) * auVar163._20_4_ + fVar230 * fVar311
    ;
    auVar422._24_4_ =
         (auVar163._24_4_ * fStack_308 + fStack_288 * fVar246) * auVar163._24_4_ + fVar246 * fVar313
    ;
    auVar422._28_4_ = fStack_2c4 + fVar279 + auVar302._28_4_;
    auVar219._0_4_ =
         (auVar163._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar225) *
         auVar163._0_4_ + fVar225 * fVar247;
    auVar219._4_4_ =
         (auVar163._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar226) *
         auVar163._4_4_ + fVar226 * fVar248;
    auVar219._8_4_ =
         (auVar163._8_4_ * fStack_338 + fStack_2b8 * fVar227) * auVar163._8_4_ + fVar227 * fVar249;
    auVar219._12_4_ =
         (auVar163._12_4_ * fStack_334 + fStack_2b4 * fVar228) * auVar163._12_4_ + fVar228 * fVar252
    ;
    auVar219._16_4_ =
         (auVar163._16_4_ * fStack_330 + fStack_2b0 * fVar229) * auVar163._16_4_ + fVar229 * fVar255
    ;
    auVar219._20_4_ =
         (auVar163._20_4_ * fStack_32c + fStack_2ac * fVar230) * auVar163._20_4_ + fVar230 * fVar258
    ;
    auVar219._24_4_ =
         (auVar163._24_4_ * fStack_328 + fStack_2a8 * fVar246) * auVar163._24_4_ + fVar246 * fVar277
    ;
    auVar219._28_4_ = fStack_2c4 + auVar245._28_4_ + fVar279;
    auVar241._0_4_ =
         auVar163._0_4_ *
         (auVar163._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar225) +
         fVar225 * fVar281;
    auVar241._4_4_ =
         auVar163._4_4_ *
         (auVar163._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar226) +
         fVar226 * fVar283;
    auVar241._8_4_ =
         auVar163._8_4_ * (auVar163._8_4_ * fStack_358 + fStack_2d8 * fVar227) + fVar227 * fVar285;
    auVar241._12_4_ =
         auVar163._12_4_ * (auVar163._12_4_ * fStack_354 + fStack_2d4 * fVar228) + fVar228 * fVar287
    ;
    auVar241._16_4_ =
         auVar163._16_4_ * (auVar163._16_4_ * fStack_350 + fStack_2d0 * fVar229) + fVar229 * fVar250
    ;
    auVar241._20_4_ =
         auVar163._20_4_ * (auVar163._20_4_ * fStack_34c + fStack_2cc * fVar230) + fVar230 * fVar253
    ;
    auVar241._24_4_ =
         auVar163._24_4_ * (auVar163._24_4_ * fStack_348 + fStack_2c8 * fVar246) + fVar246 * fVar256
    ;
    auVar241._28_4_ = fVar406 + auVar245._28_4_ + 1.0;
    auVar269._0_4_ =
         (auVar163._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar225) *
         auVar163._0_4_ + fVar225 * fVar259;
    auVar269._4_4_ =
         (auVar163._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar226) *
         auVar163._4_4_ + fVar226 * fVar278;
    auVar269._8_4_ =
         (auVar163._8_4_ * fStack_378 + fStack_2f8 * fVar227) * auVar163._8_4_ + fVar227 * fVar280;
    auVar269._12_4_ =
         (auVar163._12_4_ * fStack_374 + fStack_2f4 * fVar228) * auVar163._12_4_ + fVar228 * fVar282
    ;
    auVar269._16_4_ =
         (auVar163._16_4_ * fStack_370 + fStack_2f0 * fVar229) * auVar163._16_4_ + fVar229 * fVar284
    ;
    auVar269._20_4_ =
         (auVar163._20_4_ * fStack_36c + fStack_2ec * fVar230) * auVar163._20_4_ + fVar230 * fVar286
    ;
    auVar269._24_4_ =
         (auVar163._24_4_ * fStack_368 + fStack_2e8 * fVar246) * auVar163._24_4_ + fVar246 * fVar288
    ;
    auVar269._28_4_ = fVar396 + fStack_224 + fVar396 + 1.0;
    fVar102 = auVar374._0_4_ * fVar225 + auVar422._0_4_ * auVar163._0_4_;
    fVar134 = auVar374._4_4_ * fVar226 + auVar422._4_4_ * auVar163._4_4_;
    fVar136 = auVar374._8_4_ * fVar227 + auVar422._8_4_ * auVar163._8_4_;
    fVar138 = auVar374._12_4_ * fVar228 + auVar422._12_4_ * auVar163._12_4_;
    fVar139 = auVar374._16_4_ * fVar229 + auVar422._16_4_ * auVar163._16_4_;
    fVar140 = auVar374._20_4_ * fVar230 + auVar422._20_4_ * auVar163._20_4_;
    fVar141 = auVar374._24_4_ * fVar246 + auVar422._24_4_ * auVar163._24_4_;
    fVar142 = fVar396 + fStack_224 + fStack_2c4;
    auVar409._0_4_ = auVar388._0_4_ * fVar225 + auVar163._0_4_ * auVar219._0_4_;
    auVar409._4_4_ = auVar388._4_4_ * fVar226 + auVar163._4_4_ * auVar219._4_4_;
    auVar409._8_4_ = auVar388._8_4_ * fVar227 + auVar163._8_4_ * auVar219._8_4_;
    auVar409._12_4_ = auVar388._12_4_ * fVar228 + auVar163._12_4_ * auVar219._12_4_;
    auVar409._16_4_ = auVar388._16_4_ * fVar229 + auVar163._16_4_ * auVar219._16_4_;
    auVar409._20_4_ = auVar388._20_4_ * fVar230 + auVar163._20_4_ * auVar219._20_4_;
    auVar409._24_4_ = auVar388._24_4_ * fVar246 + auVar163._24_4_ * auVar219._24_4_;
    auVar409._28_4_ = fStack_2c4 + fVar406;
    auVar432._0_4_ = auVar393._0_4_ * fVar225 + auVar163._0_4_ * auVar241._0_4_;
    auVar432._4_4_ = auVar393._4_4_ * fVar226 + auVar163._4_4_ * auVar241._4_4_;
    auVar432._8_4_ = auVar393._8_4_ * fVar227 + auVar163._8_4_ * auVar241._8_4_;
    auVar432._12_4_ = auVar393._12_4_ * fVar228 + auVar163._12_4_ * auVar241._12_4_;
    auVar432._16_4_ = auVar393._16_4_ * fVar229 + auVar163._16_4_ * auVar241._16_4_;
    auVar432._20_4_ = auVar393._20_4_ * fVar230 + auVar163._20_4_ * auVar241._20_4_;
    auVar432._24_4_ = auVar393._24_4_ * fVar246 + auVar163._24_4_ * auVar241._24_4_;
    auVar432._28_4_ = fVar406 + fStack_2c4;
    local_7c0._0_4_ = fVar225 * auVar323._0_4_ + auVar163._0_4_ * auVar269._0_4_;
    local_7c0._4_4_ = fVar226 * auVar323._4_4_ + auVar163._4_4_ * auVar269._4_4_;
    local_7c0._8_4_ = fVar227 * auVar323._8_4_ + auVar163._8_4_ * auVar269._8_4_;
    local_7c0._12_4_ = fVar228 * auVar323._12_4_ + auVar163._12_4_ * auVar269._12_4_;
    local_7c0._16_4_ = fVar229 * auVar323._16_4_ + auVar163._16_4_ * auVar269._16_4_;
    local_7c0._20_4_ = fVar230 * auVar323._20_4_ + auVar163._20_4_ * auVar269._20_4_;
    local_7c0._24_4_ = fVar246 * auVar323._24_4_ + auVar163._24_4_ * auVar269._24_4_;
    local_7c0._28_4_ = auVar114._28_4_ + auVar163._28_4_;
    auVar350 = vsubps_avx(auVar422,auVar374);
    auVar114 = vsubps_avx(auVar219,auVar388);
    auVar123 = vsubps_avx(auVar241,auVar393);
    auVar13 = vsubps_avx(auVar269,auVar323);
    auVar151 = vshufps_avx(ZEXT416((uint)(fVar224 * 0.04761905)),
                           ZEXT416((uint)(fVar224 * 0.04761905)),0);
    fVar283 = auVar151._0_4_;
    fVar315 = fVar283 * auVar350._0_4_ * 3.0;
    fVar285 = auVar151._4_4_;
    fVar331 = fVar285 * auVar350._4_4_ * 3.0;
    auVar22._4_4_ = fVar331;
    auVar22._0_4_ = fVar315;
    fVar259 = auVar151._8_4_;
    fVar332 = fVar259 * auVar350._8_4_ * 3.0;
    auVar22._8_4_ = fVar332;
    fVar255 = auVar151._12_4_;
    fVar334 = fVar255 * auVar350._12_4_ * 3.0;
    auVar22._12_4_ = fVar334;
    fVar336 = fVar283 * auVar350._16_4_ * 3.0;
    auVar22._16_4_ = fVar336;
    fVar338 = fVar285 * auVar350._20_4_ * 3.0;
    auVar22._20_4_ = fVar338;
    fVar340 = fVar259 * auVar350._24_4_ * 3.0;
    auVar22._24_4_ = fVar340;
    auVar22._28_4_ = auVar323._28_4_;
    fVar342 = fVar283 * auVar114._0_4_ * 3.0;
    fVar351 = fVar285 * auVar114._4_4_ * 3.0;
    local_980._4_4_ = fVar351;
    local_980._0_4_ = fVar342;
    fVar354 = fVar259 * auVar114._8_4_ * 3.0;
    local_980._8_4_ = fVar354;
    fVar357 = fVar255 * auVar114._12_4_ * 3.0;
    local_980._12_4_ = fVar357;
    fVar360 = fVar283 * auVar114._16_4_ * 3.0;
    local_980._16_4_ = fVar360;
    fVar363 = fVar285 * auVar114._20_4_ * 3.0;
    local_980._20_4_ = fVar363;
    fVar366 = fVar259 * auVar114._24_4_ * 3.0;
    local_980._24_4_ = fVar366;
    local_980._28_4_ = fStack_2c4;
    fVar397 = fVar283 * auVar123._0_4_ * 3.0;
    fVar400 = fVar285 * auVar123._4_4_ * 3.0;
    auVar23._4_4_ = fVar400;
    auVar23._0_4_ = fVar397;
    fVar401 = fVar259 * auVar123._8_4_ * 3.0;
    auVar23._8_4_ = fVar401;
    fVar402 = fVar255 * auVar123._12_4_ * 3.0;
    auVar23._12_4_ = fVar402;
    fVar403 = fVar283 * auVar123._16_4_ * 3.0;
    auVar23._16_4_ = fVar403;
    fVar404 = fVar285 * auVar123._20_4_ * 3.0;
    auVar23._20_4_ = fVar404;
    fVar405 = fVar259 * auVar123._24_4_ * 3.0;
    auVar23._24_4_ = fVar405;
    auVar23._28_4_ = fVar406;
    fVar229 = fVar283 * auVar13._0_4_ * 3.0;
    fVar230 = fVar285 * auVar13._4_4_ * 3.0;
    auVar24._4_4_ = fVar230;
    auVar24._0_4_ = fVar229;
    fVar252 = fVar259 * auVar13._8_4_ * 3.0;
    auVar24._8_4_ = fVar252;
    fVar255 = fVar255 * auVar13._12_4_ * 3.0;
    auVar24._12_4_ = fVar255;
    fVar283 = fVar283 * auVar13._16_4_ * 3.0;
    auVar24._16_4_ = fVar283;
    fVar285 = fVar285 * auVar13._20_4_ * 3.0;
    auVar24._20_4_ = fVar285;
    fVar259 = fVar259 * auVar13._24_4_ * 3.0;
    auVar24._24_4_ = fVar259;
    auVar24._28_4_ = auVar350._28_4_;
    auVar114 = vperm2f128_avx(auVar409,auVar409,1);
    auVar114 = vshufps_avx(auVar114,auVar409,0x30);
    local_aa0 = vshufps_avx(auVar409,auVar114,0x29);
    auVar114 = vperm2f128_avx(auVar432,auVar432,1);
    auVar114 = vshufps_avx(auVar114,auVar432,0x30);
    auVar13 = vshufps_avx(auVar432,auVar114,0x29);
    auVar123 = vsubps_avx(local_7c0,auVar24);
    auVar114 = vperm2f128_avx(auVar123,auVar123,1);
    auVar114 = vshufps_avx(auVar114,auVar123,0x30);
    local_7e0 = vshufps_avx(auVar123,auVar114,0x29);
    auVar14 = vsubps_avx(local_aa0,auVar409);
    auVar348 = vsubps_avx(auVar13,auVar432);
    fVar225 = auVar14._0_4_;
    fVar246 = auVar14._4_4_;
    auVar25._4_4_ = fVar400 * fVar246;
    auVar25._0_4_ = fVar397 * fVar225;
    fVar258 = auVar14._8_4_;
    auVar25._8_4_ = fVar401 * fVar258;
    fVar287 = auVar14._12_4_;
    auVar25._12_4_ = fVar402 * fVar287;
    fVar280 = auVar14._16_4_;
    auVar25._16_4_ = fVar403 * fVar280;
    fVar303 = auVar14._20_4_;
    auVar25._20_4_ = fVar404 * fVar303;
    fVar396 = auVar14._24_4_;
    auVar25._24_4_ = fVar405 * fVar396;
    auVar25._28_4_ = auVar123._28_4_;
    fVar226 = auVar348._0_4_;
    fVar247 = auVar348._4_4_;
    auVar26._4_4_ = fVar351 * fVar247;
    auVar26._0_4_ = fVar342 * fVar226;
    fVar277 = auVar348._8_4_;
    auVar26._8_4_ = fVar354 * fVar277;
    fVar250 = auVar348._12_4_;
    auVar26._12_4_ = fVar357 * fVar250;
    fVar282 = auVar348._16_4_;
    auVar26._16_4_ = fVar360 * fVar282;
    fVar305 = auVar348._20_4_;
    auVar26._20_4_ = fVar363 * fVar305;
    fVar18 = auVar348._24_4_;
    auVar26._24_4_ = fVar366 * fVar18;
    auVar26._28_4_ = auVar114._28_4_;
    auVar348 = vsubps_avx(auVar26,auVar25);
    auVar81._4_4_ = fVar134;
    auVar81._0_4_ = fVar102;
    auVar81._8_4_ = fVar136;
    auVar81._12_4_ = fVar138;
    auVar81._16_4_ = fVar139;
    auVar81._20_4_ = fVar140;
    auVar81._24_4_ = fVar141;
    auVar81._28_4_ = fVar142;
    auVar114 = vperm2f128_avx(auVar81,auVar81,1);
    auVar114 = vshufps_avx(auVar114,auVar81,0x30);
    auVar14 = vshufps_avx(auVar81,auVar114,0x29);
    auVar15 = vsubps_avx(auVar14,auVar81);
    auVar27._4_4_ = fVar247 * fVar331;
    auVar27._0_4_ = fVar226 * fVar315;
    auVar27._8_4_ = fVar277 * fVar332;
    auVar27._12_4_ = fVar250 * fVar334;
    auVar27._16_4_ = fVar282 * fVar336;
    auVar27._20_4_ = fVar305 * fVar338;
    auVar27._24_4_ = fVar18 * fVar340;
    auVar27._28_4_ = auVar14._28_4_;
    fVar227 = auVar15._0_4_;
    fVar248 = auVar15._4_4_;
    auVar28._4_4_ = fVar400 * fVar248;
    auVar28._0_4_ = fVar397 * fVar227;
    fVar279 = auVar15._8_4_;
    auVar28._8_4_ = fVar401 * fVar279;
    fVar253 = auVar15._12_4_;
    auVar28._12_4_ = fVar402 * fVar253;
    fVar284 = auVar15._16_4_;
    auVar28._16_4_ = fVar403 * fVar284;
    fVar307 = auVar15._20_4_;
    auVar28._20_4_ = fVar404 * fVar307;
    fVar19 = auVar15._24_4_;
    auVar28._24_4_ = fVar405 * fVar19;
    auVar28._28_4_ = fVar142;
    auVar16 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ = fVar351 * fVar248;
    auVar29._0_4_ = fVar342 * fVar227;
    auVar29._8_4_ = fVar354 * fVar279;
    auVar29._12_4_ = fVar357 * fVar253;
    auVar29._16_4_ = fVar360 * fVar284;
    auVar29._20_4_ = fVar363 * fVar307;
    auVar29._24_4_ = fVar366 * fVar19;
    auVar29._28_4_ = fVar142;
    auVar30._4_4_ = fVar331 * fVar246;
    auVar30._0_4_ = fVar315 * fVar225;
    auVar30._8_4_ = fVar332 * fVar258;
    auVar30._12_4_ = fVar334 * fVar287;
    auVar30._16_4_ = fVar336 * fVar280;
    auVar30._20_4_ = fVar338 * fVar303;
    auVar30._24_4_ = fVar340 * fVar396;
    auVar30._28_4_ = auVar388._28_4_;
    auVar349 = vsubps_avx(auVar30,auVar29);
    fVar224 = auVar349._28_4_;
    fVar278 = auVar16._28_4_ + fVar224;
    auVar220._0_4_ = fVar227 * fVar227 + fVar225 * fVar225 + fVar226 * fVar226;
    auVar220._4_4_ = fVar248 * fVar248 + fVar246 * fVar246 + fVar247 * fVar247;
    auVar220._8_4_ = fVar279 * fVar279 + fVar258 * fVar258 + fVar277 * fVar277;
    auVar220._12_4_ = fVar253 * fVar253 + fVar287 * fVar287 + fVar250 * fVar250;
    auVar220._16_4_ = fVar284 * fVar284 + fVar280 * fVar280 + fVar282 * fVar282;
    auVar220._20_4_ = fVar307 * fVar307 + fVar303 * fVar303 + fVar305 * fVar305;
    auVar220._24_4_ = fVar19 * fVar19 + fVar396 * fVar396 + fVar18 * fVar18;
    auVar220._28_4_ = fVar224 + fVar224 + fVar278;
    auVar114 = vrcpps_avx(auVar220);
    fVar288 = auVar114._0_4_;
    fVar289 = auVar114._4_4_;
    auVar31._4_4_ = fVar289 * auVar220._4_4_;
    auVar31._0_4_ = fVar288 * auVar220._0_4_;
    fVar311 = auVar114._8_4_;
    auVar31._8_4_ = fVar311 * auVar220._8_4_;
    fVar313 = auVar114._12_4_;
    auVar31._12_4_ = fVar313 * auVar220._12_4_;
    fVar251 = auVar114._16_4_;
    auVar31._16_4_ = fVar251 * auVar220._16_4_;
    fVar254 = auVar114._20_4_;
    auVar31._20_4_ = fVar254 * auVar220._20_4_;
    fVar257 = auVar114._24_4_;
    auVar31._24_4_ = fVar257 * auVar220._24_4_;
    auVar31._28_4_ = auVar388._28_4_;
    auVar410._8_4_ = 0x3f800000;
    auVar410._0_8_ = &DAT_3f8000003f800000;
    auVar410._12_4_ = 0x3f800000;
    auVar410._16_4_ = 0x3f800000;
    auVar410._20_4_ = 0x3f800000;
    auVar410._24_4_ = 0x3f800000;
    auVar410._28_4_ = 0x3f800000;
    auVar20 = vsubps_avx(auVar410,auVar31);
    fVar288 = auVar20._0_4_ * fVar288 + fVar288;
    fVar289 = auVar20._4_4_ * fVar289 + fVar289;
    fVar311 = auVar20._8_4_ * fVar311 + fVar311;
    fVar313 = auVar20._12_4_ * fVar313 + fVar313;
    fVar251 = auVar20._16_4_ * fVar251 + fVar251;
    fVar254 = auVar20._20_4_ * fVar254 + fVar254;
    fVar257 = auVar20._24_4_ * fVar257 + fVar257;
    auVar123 = vperm2f128_avx(local_980,local_980,1);
    auVar123 = vshufps_avx(auVar123,local_980,0x30);
    local_a80 = vshufps_avx(local_980,auVar123,0x29);
    auVar123 = vperm2f128_avx(auVar23,auVar23,1);
    auVar123 = vshufps_avx(auVar123,auVar23,0x30);
    local_a20 = vshufps_avx(auVar23,auVar123,0x29);
    fVar407 = local_a20._0_4_;
    fVar414 = local_a20._4_4_;
    auVar32._4_4_ = fVar414 * fVar246;
    auVar32._0_4_ = fVar407 * fVar225;
    fVar415 = local_a20._8_4_;
    auVar32._8_4_ = fVar415 * fVar258;
    fVar416 = local_a20._12_4_;
    auVar32._12_4_ = fVar416 * fVar287;
    fVar417 = local_a20._16_4_;
    auVar32._16_4_ = fVar417 * fVar280;
    fVar418 = local_a20._20_4_;
    auVar32._20_4_ = fVar418 * fVar303;
    fVar419 = local_a20._24_4_;
    auVar32._24_4_ = fVar419 * fVar396;
    auVar32._28_4_ = auVar123._28_4_;
    fVar343 = local_a80._0_4_;
    fVar352 = local_a80._4_4_;
    auVar33._4_4_ = fVar352 * fVar247;
    auVar33._0_4_ = fVar343 * fVar226;
    fVar355 = local_a80._8_4_;
    auVar33._8_4_ = fVar355 * fVar277;
    fVar358 = local_a80._12_4_;
    auVar33._12_4_ = fVar358 * fVar250;
    fVar361 = local_a80._16_4_;
    auVar33._16_4_ = fVar361 * fVar282;
    fVar364 = local_a80._20_4_;
    auVar33._20_4_ = fVar364 * fVar305;
    fVar367 = local_a80._24_4_;
    auVar33._24_4_ = fVar367 * fVar18;
    auVar33._28_4_ = fVar406;
    auVar21 = vsubps_avx(auVar33,auVar32);
    auVar123 = vperm2f128_avx(auVar22,auVar22,1);
    auVar123 = vshufps_avx(auVar123,auVar22,0x30);
    local_940 = vshufps_avx(auVar22,auVar123,0x29);
    fVar228 = local_940._0_4_;
    fVar249 = local_940._4_4_;
    auVar34._4_4_ = fVar247 * fVar249;
    auVar34._0_4_ = fVar226 * fVar228;
    fVar281 = local_940._8_4_;
    auVar34._8_4_ = fVar277 * fVar281;
    fVar256 = local_940._12_4_;
    auVar34._12_4_ = fVar250 * fVar256;
    fVar286 = local_940._16_4_;
    auVar34._16_4_ = fVar282 * fVar286;
    fVar309 = local_940._20_4_;
    auVar34._20_4_ = fVar305 * fVar309;
    fVar406 = local_940._24_4_;
    auVar34._24_4_ = fVar18 * fVar406;
    auVar34._28_4_ = auVar123._28_4_;
    auVar35._4_4_ = fVar414 * fVar248;
    auVar35._0_4_ = fVar407 * fVar227;
    auVar35._8_4_ = fVar415 * fVar279;
    auVar35._12_4_ = fVar416 * fVar253;
    auVar35._16_4_ = fVar417 * fVar284;
    auVar35._20_4_ = fVar418 * fVar307;
    uVar11 = local_a20._28_4_;
    auVar35._24_4_ = fVar419 * fVar19;
    auVar35._28_4_ = uVar11;
    auVar115 = vsubps_avx(auVar35,auVar34);
    auVar36._4_4_ = fVar352 * fVar248;
    auVar36._0_4_ = fVar343 * fVar227;
    auVar36._8_4_ = fVar355 * fVar279;
    auVar36._12_4_ = fVar358 * fVar253;
    auVar36._16_4_ = fVar361 * fVar284;
    auVar36._20_4_ = fVar364 * fVar307;
    auVar36._24_4_ = fVar367 * fVar19;
    auVar36._28_4_ = uVar11;
    auVar37._4_4_ = fVar249 * fVar246;
    auVar37._0_4_ = fVar228 * fVar225;
    auVar37._8_4_ = fVar281 * fVar258;
    auVar37._12_4_ = fVar256 * fVar287;
    auVar37._16_4_ = fVar286 * fVar280;
    auVar37._20_4_ = fVar309 * fVar303;
    auVar37._24_4_ = fVar406 * fVar396;
    auVar37._28_4_ = auVar422._28_4_;
    auVar123 = vsubps_avx(auVar37,auVar36);
    fVar224 = auVar123._28_4_;
    auVar38._4_4_ =
         (auVar348._4_4_ * auVar348._4_4_ +
         auVar16._4_4_ * auVar16._4_4_ + auVar349._4_4_ * auVar349._4_4_) * fVar289;
    auVar38._0_4_ =
         (auVar348._0_4_ * auVar348._0_4_ +
         auVar16._0_4_ * auVar16._0_4_ + auVar349._0_4_ * auVar349._0_4_) * fVar288;
    auVar38._8_4_ =
         (auVar348._8_4_ * auVar348._8_4_ +
         auVar16._8_4_ * auVar16._8_4_ + auVar349._8_4_ * auVar349._8_4_) * fVar311;
    auVar38._12_4_ =
         (auVar348._12_4_ * auVar348._12_4_ +
         auVar16._12_4_ * auVar16._12_4_ + auVar349._12_4_ * auVar349._12_4_) * fVar313;
    auVar38._16_4_ =
         (auVar348._16_4_ * auVar348._16_4_ +
         auVar16._16_4_ * auVar16._16_4_ + auVar349._16_4_ * auVar349._16_4_) * fVar251;
    auVar38._20_4_ =
         (auVar348._20_4_ * auVar348._20_4_ +
         auVar16._20_4_ * auVar16._20_4_ + auVar349._20_4_ * auVar349._20_4_) * fVar254;
    auVar38._24_4_ =
         (auVar348._24_4_ * auVar348._24_4_ +
         auVar16._24_4_ * auVar16._24_4_ + auVar349._24_4_ * auVar349._24_4_) * fVar257;
    auVar38._28_4_ = auVar348._28_4_ + fVar278;
    auVar39._4_4_ =
         (auVar21._4_4_ * auVar21._4_4_ +
         auVar115._4_4_ * auVar115._4_4_ + auVar123._4_4_ * auVar123._4_4_) * fVar289;
    auVar39._0_4_ =
         (auVar21._0_4_ * auVar21._0_4_ +
         auVar115._0_4_ * auVar115._0_4_ + auVar123._0_4_ * auVar123._0_4_) * fVar288;
    auVar39._8_4_ =
         (auVar21._8_4_ * auVar21._8_4_ +
         auVar115._8_4_ * auVar115._8_4_ + auVar123._8_4_ * auVar123._8_4_) * fVar311;
    auVar39._12_4_ =
         (auVar21._12_4_ * auVar21._12_4_ +
         auVar115._12_4_ * auVar115._12_4_ + auVar123._12_4_ * auVar123._12_4_) * fVar313;
    auVar39._16_4_ =
         (auVar21._16_4_ * auVar21._16_4_ +
         auVar115._16_4_ * auVar115._16_4_ + auVar123._16_4_ * auVar123._16_4_) * fVar251;
    auVar39._20_4_ =
         (auVar21._20_4_ * auVar21._20_4_ +
         auVar115._20_4_ * auVar115._20_4_ + auVar123._20_4_ * auVar123._20_4_) * fVar254;
    auVar39._24_4_ =
         (auVar21._24_4_ * auVar21._24_4_ +
         auVar115._24_4_ * auVar115._24_4_ + auVar123._24_4_ * auVar123._24_4_) * fVar257;
    auVar39._28_4_ = auVar20._28_4_ + auVar114._28_4_;
    auVar114 = vmaxps_avx(auVar38,auVar39);
    auVar123 = vperm2f128_avx(local_7c0,local_7c0,1);
    auVar123 = vshufps_avx(auVar123,local_7c0,0x30);
    local_800 = vshufps_avx(local_7c0,auVar123,0x29);
    local_820._0_4_ = (float)local_7c0._0_4_ + fVar229;
    local_820._4_4_ = local_7c0._4_4_ + fVar230;
    local_820._8_4_ = local_7c0._8_4_ + fVar252;
    local_820._12_4_ = local_7c0._12_4_ + fVar255;
    local_820._16_4_ = local_7c0._16_4_ + fVar283;
    local_820._20_4_ = local_7c0._20_4_ + fVar285;
    local_820._24_4_ = local_7c0._24_4_ + fVar259;
    local_820._28_4_ = local_7c0._28_4_ + auVar350._28_4_;
    auVar123 = vmaxps_avx(local_7c0,local_820);
    auVar350 = vmaxps_avx(local_7e0,local_800);
    auVar123 = vmaxps_avx(auVar123,auVar350);
    auVar350 = vrsqrtps_avx(auVar220);
    fVar229 = auVar350._0_4_;
    fVar230 = auVar350._4_4_;
    fVar252 = auVar350._8_4_;
    fVar255 = auVar350._12_4_;
    fVar283 = auVar350._16_4_;
    fVar285 = auVar350._20_4_;
    fVar259 = auVar350._24_4_;
    fVar344 = fVar229 * 1.5 + fVar229 * fVar229 * fVar229 * auVar220._0_4_ * -0.5;
    fVar353 = fVar230 * 1.5 + fVar230 * fVar230 * fVar230 * auVar220._4_4_ * -0.5;
    fVar356 = fVar252 * 1.5 + fVar252 * fVar252 * fVar252 * auVar220._8_4_ * -0.5;
    fVar359 = fVar255 * 1.5 + fVar255 * fVar255 * fVar255 * auVar220._12_4_ * -0.5;
    fVar362 = fVar283 * 1.5 + fVar283 * fVar283 * fVar283 * auVar220._16_4_ * -0.5;
    fVar365 = fVar285 * 1.5 + fVar285 * fVar285 * fVar285 * auVar220._20_4_ * -0.5;
    fVar368 = fVar259 * 1.5 + fVar259 * fVar259 * fVar259 * auVar220._24_4_ * -0.5;
    auVar348 = vsubps_avx(ZEXT432(0) << 0x20,auVar409);
    auVar350 = vsubps_avx(ZEXT432(0) << 0x20,auVar432);
    fVar431 = auVar350._0_4_;
    fVar434 = auVar350._4_4_;
    fVar435 = auVar350._8_4_;
    fVar436 = auVar350._12_4_;
    fVar437 = auVar350._16_4_;
    fVar438 = auVar350._20_4_;
    fVar439 = auVar350._24_4_;
    fVar229 = auVar348._0_4_;
    fVar252 = auVar348._4_4_;
    fVar283 = auVar348._8_4_;
    fVar259 = auVar348._12_4_;
    fVar288 = auVar348._16_4_;
    fVar311 = auVar348._20_4_;
    fVar251 = auVar348._24_4_;
    auVar82._4_4_ = fVar134;
    auVar82._0_4_ = fVar102;
    auVar82._8_4_ = fVar136;
    auVar82._12_4_ = fVar138;
    auVar82._16_4_ = fVar139;
    auVar82._20_4_ = fVar140;
    auVar82._24_4_ = fVar141;
    auVar82._28_4_ = fVar142;
    auVar16 = vsubps_avx(ZEXT832(0) << 0x20,auVar82);
    fVar230 = auVar16._0_4_;
    fVar255 = auVar16._4_4_;
    fVar285 = auVar16._8_4_;
    fVar278 = auVar16._12_4_;
    fVar289 = auVar16._16_4_;
    fVar313 = auVar16._20_4_;
    fVar254 = auVar16._24_4_;
    auVar399._0_4_ =
         (float)local_840._0_4_ * fVar230 +
         (float)local_860._0_4_ * fVar229 + fVar431 * (float)local_880._0_4_;
    auVar399._4_4_ =
         (float)local_840._4_4_ * fVar255 +
         (float)local_860._4_4_ * fVar252 + fVar434 * (float)local_880._4_4_;
    auVar399._8_4_ = fStack_838 * fVar285 + fStack_858 * fVar283 + fVar435 * fStack_878;
    auVar399._12_4_ = fStack_834 * fVar278 + fStack_854 * fVar259 + fVar436 * fStack_874;
    auVar399._16_4_ = fStack_830 * fVar289 + fStack_850 * fVar288 + fVar437 * fStack_870;
    auVar399._20_4_ = fStack_82c * fVar313 + fStack_84c * fVar311 + fVar438 * fStack_86c;
    auVar399._24_4_ = fStack_828 * fVar254 + fStack_848 * fVar251 + fVar439 * fStack_868;
    auVar399._28_4_ = fVar224 + auVar115._28_4_ + fVar224 + 0.0;
    auVar411._0_4_ = fVar230 * fVar230 + fVar229 * fVar229 + fVar431 * fVar431;
    auVar411._4_4_ = fVar255 * fVar255 + fVar252 * fVar252 + fVar434 * fVar434;
    auVar411._8_4_ = fVar285 * fVar285 + fVar283 * fVar283 + fVar435 * fVar435;
    auVar411._12_4_ = fVar278 * fVar278 + fVar259 * fVar259 + fVar436 * fVar436;
    auVar411._16_4_ = fVar289 * fVar289 + fVar288 * fVar288 + fVar437 * fVar437;
    auVar411._20_4_ = fVar313 * fVar313 + fVar311 * fVar311 + fVar438 * fVar438;
    auVar411._24_4_ = fVar254 * fVar254 + fVar251 * fVar251 + fVar439 * fVar439;
    auVar411._28_4_ = auVar422._28_4_ + auVar422._28_4_ + fVar224;
    fVar369 = (float)local_840._0_4_ * fVar227 * fVar344 +
              fVar344 * fVar225 * (float)local_860._0_4_ +
              fVar226 * fVar344 * (float)local_880._0_4_;
    fVar377 = (float)local_840._4_4_ * fVar248 * fVar353 +
              fVar353 * fVar246 * (float)local_860._4_4_ +
              fVar247 * fVar353 * (float)local_880._4_4_;
    fVar378 = fStack_838 * fVar279 * fVar356 +
              fVar356 * fVar258 * fStack_858 + fVar277 * fVar356 * fStack_878;
    fVar379 = fStack_834 * fVar253 * fVar359 +
              fVar359 * fVar287 * fStack_854 + fVar250 * fVar359 * fStack_874;
    fVar380 = fStack_830 * fVar284 * fVar362 +
              fVar362 * fVar280 * fStack_850 + fVar282 * fVar362 * fStack_870;
    fVar382 = fStack_82c * fVar307 * fVar365 +
              fVar365 * fVar303 * fStack_84c + fVar305 * fVar365 * fStack_86c;
    fVar384 = fStack_828 * fVar19 * fVar368 +
              fVar368 * fVar396 * fStack_848 + fVar18 * fVar368 * fStack_868;
    fVar224 = fStack_824 + fStack_844 + fStack_864;
    fVar420 = fVar230 * fVar227 * fVar344 +
              fVar344 * fVar225 * fVar229 + fVar431 * fVar226 * fVar344;
    fVar424 = fVar255 * fVar248 * fVar353 +
              fVar353 * fVar246 * fVar252 + fVar434 * fVar247 * fVar353;
    fVar425 = fVar285 * fVar279 * fVar356 +
              fVar356 * fVar258 * fVar283 + fVar435 * fVar277 * fVar356;
    fVar426 = fVar278 * fVar253 * fVar359 +
              fVar359 * fVar287 * fVar259 + fVar436 * fVar250 * fVar359;
    fVar427 = fVar289 * fVar284 * fVar362 +
              fVar362 * fVar280 * fVar288 + fVar437 * fVar282 * fVar362;
    fVar428 = fVar313 * fVar307 * fVar365 +
              fVar365 * fVar303 * fVar311 + fVar438 * fVar305 * fVar365;
    fVar429 = fVar254 * fVar19 * fVar368 + fVar368 * fVar396 * fVar251 + fVar439 * fVar18 * fVar368;
    fVar430 = fStack_844 + fVar224;
    auVar40._4_4_ = fVar377 * fVar424;
    auVar40._0_4_ = fVar369 * fVar420;
    auVar40._8_4_ = fVar378 * fVar425;
    auVar40._12_4_ = fVar379 * fVar426;
    auVar40._16_4_ = fVar380 * fVar427;
    auVar40._20_4_ = fVar382 * fVar428;
    auVar40._24_4_ = fVar384 * fVar429;
    auVar40._28_4_ = fVar224;
    auVar349 = vsubps_avx(auVar399,auVar40);
    auVar41._4_4_ = fVar424 * fVar424;
    auVar41._0_4_ = fVar420 * fVar420;
    auVar41._8_4_ = fVar425 * fVar425;
    auVar41._12_4_ = fVar426 * fVar426;
    auVar41._16_4_ = fVar427 * fVar427;
    auVar41._20_4_ = fVar428 * fVar428;
    auVar41._24_4_ = fVar429 * fVar429;
    auVar41._28_4_ = fStack_844;
    auVar20 = vsubps_avx(auVar411,auVar41);
    auVar350 = vsqrtps_avx(auVar114);
    fVar224 = (auVar350._0_4_ + auVar123._0_4_) * 1.0000002;
    fVar257 = (auVar350._4_4_ + auVar123._4_4_) * 1.0000002;
    fVar183 = (auVar350._8_4_ + auVar123._8_4_) * 1.0000002;
    fVar185 = (auVar350._12_4_ + auVar123._12_4_) * 1.0000002;
    fVar186 = (auVar350._16_4_ + auVar123._16_4_) * 1.0000002;
    fVar187 = (auVar350._20_4_ + auVar123._20_4_) * 1.0000002;
    fVar188 = (auVar350._24_4_ + auVar123._24_4_) * 1.0000002;
    auVar42._4_4_ = fVar257 * fVar257;
    auVar42._0_4_ = fVar224 * fVar224;
    auVar42._8_4_ = fVar183 * fVar183;
    auVar42._12_4_ = fVar185 * fVar185;
    auVar42._16_4_ = fVar186 * fVar186;
    auVar42._20_4_ = fVar187 * fVar187;
    auVar42._24_4_ = fVar188 * fVar188;
    auVar42._28_4_ = auVar350._28_4_ + auVar123._28_4_;
    fVar257 = auVar349._0_4_ + auVar349._0_4_;
    fVar183 = auVar349._4_4_ + auVar349._4_4_;
    local_400._0_8_ = CONCAT44(fVar183,fVar257);
    local_400._8_4_ = auVar349._8_4_ + auVar349._8_4_;
    local_400._12_4_ = auVar349._12_4_ + auVar349._12_4_;
    local_400._16_4_ = auVar349._16_4_ + auVar349._16_4_;
    local_400._20_4_ = auVar349._20_4_ + auVar349._20_4_;
    local_400._24_4_ = auVar349._24_4_ + auVar349._24_4_;
    fVar224 = auVar349._28_4_;
    local_400._28_4_ = fVar224 + fVar224;
    auVar123 = vsubps_avx(auVar20,auVar42);
    auVar43._4_4_ = fVar377 * fVar377;
    auVar43._0_4_ = fVar369 * fVar369;
    auVar43._8_4_ = fVar378 * fVar378;
    auVar43._12_4_ = fVar379 * fVar379;
    auVar43._16_4_ = fVar380 * fVar380;
    auVar43._20_4_ = fVar382 * fVar382;
    auVar43._24_4_ = fVar384 * fVar384;
    auVar43._28_4_ = auVar15._28_4_;
    auVar395 = ZEXT3264(auVar43);
    auVar15 = vsubps_avx(local_3a0,auVar43);
    auVar44._4_4_ = fVar183 * fVar183;
    auVar44._0_4_ = fVar257 * fVar257;
    auVar44._8_4_ = local_400._8_4_ * local_400._8_4_;
    auVar44._12_4_ = local_400._12_4_ * local_400._12_4_;
    auVar44._16_4_ = local_400._16_4_ * local_400._16_4_;
    auVar44._20_4_ = local_400._20_4_ * local_400._20_4_;
    auVar44._24_4_ = local_400._24_4_ * local_400._24_4_;
    auVar44._28_4_ = fVar224;
    fVar185 = auVar15._0_4_;
    fVar186 = auVar15._4_4_;
    fVar187 = auVar15._8_4_;
    fVar188 = auVar15._12_4_;
    fVar381 = auVar15._16_4_;
    fVar383 = auVar15._20_4_;
    fVar385 = auVar15._24_4_;
    auVar45._4_4_ = fVar186 * 4.0 * auVar123._4_4_;
    auVar45._0_4_ = fVar185 * 4.0 * auVar123._0_4_;
    auVar45._8_4_ = fVar187 * 4.0 * auVar123._8_4_;
    auVar45._12_4_ = fVar188 * 4.0 * auVar123._12_4_;
    auVar45._16_4_ = fVar381 * 4.0 * auVar123._16_4_;
    auVar45._20_4_ = fVar383 * 4.0 * auVar123._20_4_;
    auVar45._24_4_ = fVar385 * 4.0 * auVar123._24_4_;
    auVar45._28_4_ = 0x40800000;
    auVar349 = vsubps_avx(auVar44,auVar45);
    auVar114 = vcmpps_avx(auVar349,ZEXT832(0) << 0x20,5);
    fVar224 = auVar15._28_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      auVar119._8_4_ = 0x7f800000;
      auVar119._0_8_ = 0x7f8000007f800000;
      auVar119._12_4_ = 0x7f800000;
      auVar119._16_4_ = 0x7f800000;
      auVar119._20_4_ = 0x7f800000;
      auVar119._24_4_ = 0x7f800000;
      auVar119._28_4_ = 0x7f800000;
      auVar423._8_4_ = 0xff800000;
      auVar423._0_8_ = 0xff800000ff800000;
      auVar423._12_4_ = 0xff800000;
      auVar423._16_4_ = 0xff800000;
      auVar423._20_4_ = 0xff800000;
      auVar423._24_4_ = 0xff800000;
      auVar423._28_4_ = 0xff800000;
    }
    else {
      auVar116 = vsqrtps_avx(auVar349);
      auVar297._0_4_ = fVar185 + fVar185;
      auVar297._4_4_ = fVar186 + fVar186;
      auVar297._8_4_ = fVar187 + fVar187;
      auVar297._12_4_ = fVar188 + fVar188;
      auVar297._16_4_ = fVar381 + fVar381;
      auVar297._20_4_ = fVar383 + fVar383;
      auVar297._24_4_ = fVar385 + fVar385;
      auVar297._28_4_ = fVar224 + fVar224;
      auVar115 = vrcpps_avx(auVar297);
      auVar21 = vcmpps_avx(auVar349,ZEXT832(0) << 0x20,5);
      fVar290 = auVar115._0_4_;
      fVar304 = auVar115._4_4_;
      auVar46._4_4_ = auVar297._4_4_ * fVar304;
      auVar46._0_4_ = auVar297._0_4_ * fVar290;
      fVar306 = auVar115._8_4_;
      auVar46._8_4_ = auVar297._8_4_ * fVar306;
      fVar308 = auVar115._12_4_;
      auVar46._12_4_ = auVar297._12_4_ * fVar308;
      fVar310 = auVar115._16_4_;
      auVar46._16_4_ = auVar297._16_4_ * fVar310;
      fVar312 = auVar115._20_4_;
      auVar46._20_4_ = auVar297._20_4_ * fVar312;
      fVar314 = auVar115._24_4_;
      auVar46._24_4_ = auVar297._24_4_ * fVar314;
      auVar46._28_4_ = auVar297._28_4_;
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = &DAT_3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar120._16_4_ = 0x3f800000;
      auVar120._20_4_ = 0x3f800000;
      auVar120._24_4_ = 0x3f800000;
      auVar120._28_4_ = 0x3f800000;
      auVar349 = vsubps_avx(auVar120,auVar46);
      fVar290 = fVar290 + fVar290 * auVar349._0_4_;
      fVar304 = fVar304 + fVar304 * auVar349._4_4_;
      fVar306 = fVar306 + fVar306 * auVar349._8_4_;
      fVar308 = fVar308 + fVar308 * auVar349._12_4_;
      fVar310 = fVar310 + fVar310 * auVar349._16_4_;
      fVar312 = fVar312 + fVar312 * auVar349._20_4_;
      fVar314 = fVar314 + fVar314 * auVar349._24_4_;
      auVar324._0_8_ = CONCAT44(fVar183,fVar257) ^ 0x8000000080000000;
      auVar324._8_4_ = -local_400._8_4_;
      auVar324._12_4_ = -local_400._12_4_;
      auVar324._16_4_ = -local_400._16_4_;
      auVar324._20_4_ = -local_400._20_4_;
      auVar324._24_4_ = -local_400._24_4_;
      auVar324._28_4_ = -local_400._28_4_;
      auVar159 = vsubps_avx(auVar324,auVar116);
      fVar257 = auVar159._0_4_ * fVar290;
      fVar183 = auVar159._4_4_ * fVar304;
      auVar47._4_4_ = fVar183;
      auVar47._0_4_ = fVar257;
      fVar333 = auVar159._8_4_ * fVar306;
      auVar47._8_4_ = fVar333;
      fVar335 = auVar159._12_4_ * fVar308;
      auVar47._12_4_ = fVar335;
      fVar337 = auVar159._16_4_ * fVar310;
      auVar47._16_4_ = fVar337;
      fVar339 = auVar159._20_4_ * fVar312;
      auVar47._20_4_ = fVar339;
      fVar341 = auVar159._24_4_ * fVar314;
      auVar47._24_4_ = fVar341;
      auVar47._28_4_ = auVar159._28_4_;
      auVar116 = vsubps_avx(auVar116,local_400);
      fVar290 = auVar116._0_4_ * fVar290;
      fVar304 = auVar116._4_4_ * fVar304;
      auVar48._4_4_ = fVar304;
      auVar48._0_4_ = fVar290;
      fVar306 = auVar116._8_4_ * fVar306;
      auVar48._8_4_ = fVar306;
      fVar308 = auVar116._12_4_ * fVar308;
      auVar48._12_4_ = fVar308;
      fVar310 = auVar116._16_4_ * fVar310;
      auVar48._16_4_ = fVar310;
      fVar312 = auVar116._20_4_ * fVar312;
      auVar48._20_4_ = fVar312;
      fVar314 = auVar116._24_4_ * fVar314;
      auVar48._24_4_ = fVar314;
      auVar48._28_4_ = auVar116._28_4_;
      fStack_624 = fVar430 + auVar115._28_4_ + auVar349._28_4_;
      local_640[0] = fVar344 * (fVar420 + fVar369 * fVar257);
      local_640[1] = fVar353 * (fVar424 + fVar377 * fVar183);
      local_640[2] = fVar356 * (fVar425 + fVar378 * fVar333);
      local_640[3] = fVar359 * (fVar426 + fVar379 * fVar335);
      fStack_630 = fVar362 * (fVar427 + fVar380 * fVar337);
      fStack_62c = fVar365 * (fVar428 + fVar382 * fVar339);
      fStack_628 = fVar368 * (fVar429 + fVar384 * fVar341);
      local_660[0] = fVar344 * (fVar420 + fVar369 * fVar290);
      local_660[1] = fVar353 * (fVar424 + fVar377 * fVar304);
      local_660[2] = fVar356 * (fVar425 + fVar378 * fVar306);
      local_660[3] = fVar359 * (fVar426 + fVar379 * fVar308);
      fStack_650 = fVar362 * (fVar427 + fVar380 * fVar310);
      fStack_64c = fVar365 * (fVar428 + fVar382 * fVar312);
      fStack_648 = fVar368 * (fVar429 + fVar384 * fVar314);
      fStack_644 = fVar430 + fStack_624;
      auVar298._8_4_ = 0x7f800000;
      auVar298._0_8_ = 0x7f8000007f800000;
      auVar298._12_4_ = 0x7f800000;
      auVar298._16_4_ = 0x7f800000;
      auVar298._20_4_ = 0x7f800000;
      auVar298._24_4_ = 0x7f800000;
      auVar298._28_4_ = 0x7f800000;
      auVar119 = vblendvps_avx(auVar298,auVar47,auVar21);
      auVar325._8_4_ = 0x7fffffff;
      auVar325._0_8_ = 0x7fffffff7fffffff;
      auVar325._12_4_ = 0x7fffffff;
      auVar325._16_4_ = 0x7fffffff;
      auVar325._20_4_ = 0x7fffffff;
      auVar325._24_4_ = 0x7fffffff;
      auVar325._28_4_ = 0x7fffffff;
      auVar349 = vandps_avx(auVar43,auVar325);
      auVar349 = vmaxps_avx(local_4c0,auVar349);
      auVar49._4_4_ = auVar349._4_4_ * 1.9073486e-06;
      auVar49._0_4_ = auVar349._0_4_ * 1.9073486e-06;
      auVar49._8_4_ = auVar349._8_4_ * 1.9073486e-06;
      auVar49._12_4_ = auVar349._12_4_ * 1.9073486e-06;
      auVar49._16_4_ = auVar349._16_4_ * 1.9073486e-06;
      auVar49._20_4_ = auVar349._20_4_ * 1.9073486e-06;
      auVar49._24_4_ = auVar349._24_4_ * 1.9073486e-06;
      auVar49._28_4_ = auVar349._28_4_;
      auVar349 = vandps_avx(auVar15,auVar325);
      auVar349 = vcmpps_avx(auVar349,auVar49,1);
      auVar299._8_4_ = 0xff800000;
      auVar299._0_8_ = 0xff800000ff800000;
      auVar299._12_4_ = 0xff800000;
      auVar299._16_4_ = 0xff800000;
      auVar299._20_4_ = 0xff800000;
      auVar299._24_4_ = 0xff800000;
      auVar299._28_4_ = 0xff800000;
      auVar423 = vblendvps_avx(auVar299,auVar48,auVar21);
      auVar115 = auVar21 & auVar349;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0x7f,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0xbf,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar115[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar349,auVar21);
        auVar151 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar349 = vcmpps_avx(auVar123,ZEXT832(0) << 0x20,2);
        auVar413._8_4_ = 0xff800000;
        auVar413._0_8_ = 0xff800000ff800000;
        auVar413._12_4_ = 0xff800000;
        auVar413._16_4_ = 0xff800000;
        auVar413._20_4_ = 0xff800000;
        auVar413._24_4_ = 0xff800000;
        auVar413._28_4_ = 0xff800000;
        auVar389._8_4_ = 0x7f800000;
        auVar389._0_8_ = 0x7f8000007f800000;
        auVar389._12_4_ = 0x7f800000;
        auVar389._16_4_ = 0x7f800000;
        auVar389._20_4_ = 0x7f800000;
        auVar389._24_4_ = 0x7f800000;
        auVar389._28_4_ = 0x7f800000;
        auVar123 = vblendvps_avx(auVar389,auVar413,auVar349);
        auVar3 = vpmovsxwd_avx(auVar151);
        auVar151 = vpunpckhwd_avx(auVar151,auVar151);
        auVar276._16_16_ = auVar151;
        auVar276._0_16_ = auVar3;
        auVar119 = vblendvps_avx(auVar119,auVar123,auVar276);
        auVar123 = vblendvps_avx(auVar413,auVar389,auVar349);
        auVar423 = vblendvps_avx(auVar423,auVar123,auVar276);
        auVar123 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar204._0_4_ = auVar114._0_4_ ^ auVar123._0_4_;
        auVar204._4_4_ = auVar114._4_4_ ^ auVar123._4_4_;
        auVar204._8_4_ = auVar114._8_4_ ^ auVar123._8_4_;
        auVar204._12_4_ = auVar114._12_4_ ^ auVar123._12_4_;
        auVar204._16_4_ = auVar114._16_4_ ^ auVar123._16_4_;
        auVar204._20_4_ = auVar114._20_4_ ^ auVar123._20_4_;
        auVar204._24_4_ = auVar114._24_4_ ^ auVar123._24_4_;
        auVar204._28_4_ = auVar114._28_4_ ^ auVar123._28_4_;
        auVar114 = vorps_avx(auVar349,auVar204);
        auVar114 = vandps_avx(auVar21,auVar114);
      }
    }
    auVar123 = local_4a0 & auVar114;
    auVar302 = ZEXT3264(_local_a00);
    if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar123 >> 0x7f,0) == '\0') &&
          (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar123 >> 0xbf,0) == '\0') &&
        (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar123[0x1f])
    {
      auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      auVar151 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_920._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_920._0_4_
                                           )),0);
      auVar164._16_16_ = auVar151;
      auVar164._0_16_ = auVar151;
      auVar21 = vminps_avx(auVar164,auVar423);
      auVar121._0_4_ =
           (float)local_840._0_4_ * fVar315 +
           (float)local_860._0_4_ * fVar342 + (float)local_880._0_4_ * fVar397;
      auVar121._4_4_ =
           (float)local_840._4_4_ * fVar331 +
           (float)local_860._4_4_ * fVar351 + (float)local_880._4_4_ * fVar400;
      auVar121._8_4_ = fStack_838 * fVar332 + fStack_858 * fVar354 + fStack_878 * fVar401;
      auVar121._12_4_ = fStack_834 * fVar334 + fStack_854 * fVar357 + fStack_874 * fVar402;
      auVar121._16_4_ = fStack_830 * fVar336 + fStack_850 * fVar360 + fStack_870 * fVar403;
      auVar121._20_4_ = fStack_82c * fVar338 + fStack_84c * fVar363 + fStack_86c * fVar404;
      auVar121._24_4_ = fStack_828 * fVar340 + fStack_848 * fVar366 + fStack_868 * fVar405;
      auVar121._28_4_ = auVar323._28_4_ + auVar16._28_4_ + 1.0;
      auVar123 = vrcpps_avx(auVar121);
      fVar257 = auVar123._0_4_;
      fVar183 = auVar123._4_4_;
      auVar50._4_4_ = auVar121._4_4_ * fVar183;
      auVar50._0_4_ = auVar121._0_4_ * fVar257;
      fVar290 = auVar123._8_4_;
      auVar50._8_4_ = auVar121._8_4_ * fVar290;
      fVar304 = auVar123._12_4_;
      auVar50._12_4_ = auVar121._12_4_ * fVar304;
      fVar306 = auVar123._16_4_;
      auVar50._16_4_ = auVar121._16_4_ * fVar306;
      fVar308 = auVar123._20_4_;
      auVar50._20_4_ = auVar121._20_4_ * fVar308;
      fVar310 = auVar123._24_4_;
      auVar50._24_4_ = auVar121._24_4_ * fVar310;
      auVar50._28_4_ = 0x3f800000;
      auVar244._8_4_ = 0x3f800000;
      auVar244._0_8_ = &DAT_3f8000003f800000;
      auVar244._12_4_ = 0x3f800000;
      auVar244._16_4_ = 0x3f800000;
      auVar244._20_4_ = 0x3f800000;
      auVar244._24_4_ = 0x3f800000;
      auVar244._28_4_ = 0x3f800000;
      auVar115 = vsubps_avx(auVar244,auVar50);
      auVar326._8_4_ = 0x7fffffff;
      auVar326._0_8_ = 0x7fffffff7fffffff;
      auVar326._12_4_ = 0x7fffffff;
      auVar326._16_4_ = 0x7fffffff;
      auVar326._20_4_ = 0x7fffffff;
      auVar326._24_4_ = 0x7fffffff;
      auVar326._28_4_ = 0x7fffffff;
      auVar123 = vandps_avx(auVar121,auVar326);
      auVar375._8_4_ = 0x219392ef;
      auVar375._0_8_ = 0x219392ef219392ef;
      auVar375._12_4_ = 0x219392ef;
      auVar375._16_4_ = 0x219392ef;
      auVar375._20_4_ = 0x219392ef;
      auVar375._24_4_ = 0x219392ef;
      auVar375._28_4_ = 0x219392ef;
      auVar349 = vcmpps_avx(auVar123,auVar375,1);
      auVar51._4_4_ =
           (fVar183 + fVar183 * auVar115._4_4_) *
           -(fVar255 * fVar331 + fVar252 * fVar351 + fVar434 * fVar400);
      auVar51._0_4_ =
           (fVar257 + fVar257 * auVar115._0_4_) *
           -(fVar230 * fVar315 + fVar229 * fVar342 + fVar431 * fVar397);
      auVar51._8_4_ =
           (fVar290 + fVar290 * auVar115._8_4_) *
           -(fVar285 * fVar332 + fVar283 * fVar354 + fVar435 * fVar401);
      auVar51._12_4_ =
           (fVar304 + fVar304 * auVar115._12_4_) *
           -(fVar278 * fVar334 + fVar259 * fVar357 + fVar436 * fVar402);
      auVar51._16_4_ =
           (fVar306 + fVar306 * auVar115._16_4_) *
           -(fVar289 * fVar336 + fVar288 * fVar360 + fVar437 * fVar403);
      auVar51._20_4_ =
           (fVar308 + fVar308 * auVar115._20_4_) *
           -(fVar313 * fVar338 + fVar311 * fVar363 + fVar438 * fVar404);
      auVar51._24_4_ =
           (fVar310 + fVar310 * auVar115._24_4_) *
           -(fVar254 * fVar340 + fVar251 * fVar366 + fVar439 * fVar405);
      auVar51._28_4_ = -(auVar16._28_4_ + auVar348._28_4_ + 1.0);
      auVar348 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar123 = vcmpps_avx(auVar121,auVar348,1);
      auVar123 = vorps_avx(auVar349,auVar123);
      auVar394._8_4_ = 0xff800000;
      auVar394._0_8_ = 0xff800000ff800000;
      auVar394._12_4_ = 0xff800000;
      auVar394._16_4_ = 0xff800000;
      auVar394._20_4_ = 0xff800000;
      auVar394._24_4_ = 0xff800000;
      auVar394._28_4_ = 0xff800000;
      auVar395 = ZEXT3264(auVar394);
      auVar123 = vblendvps_avx(auVar51,auVar394,auVar123);
      auVar348 = vcmpps_avx(auVar121,auVar348,6);
      auVar348 = vorps_avx(auVar349,auVar348);
      auVar412._8_4_ = 0x7f800000;
      auVar412._0_8_ = 0x7f8000007f800000;
      auVar412._12_4_ = 0x7f800000;
      auVar412._16_4_ = 0x7f800000;
      auVar412._20_4_ = 0x7f800000;
      auVar412._24_4_ = 0x7f800000;
      auVar412._28_4_ = 0x7f800000;
      auVar348 = vblendvps_avx(auVar51,auVar412,auVar348);
      auVar16 = vmaxps_avx(local_3c0,auVar119);
      auVar16 = vmaxps_avx(auVar16,auVar123);
      auVar348 = vminps_avx(auVar21,auVar348);
      auVar349 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar123 = vsubps_avx(auVar349,local_aa0);
      auVar13 = vsubps_avx(auVar349,auVar13);
      auVar52._4_4_ = auVar13._4_4_ * -fVar414;
      auVar52._0_4_ = auVar13._0_4_ * -fVar407;
      auVar52._8_4_ = auVar13._8_4_ * -fVar415;
      auVar52._12_4_ = auVar13._12_4_ * -fVar416;
      auVar52._16_4_ = auVar13._16_4_ * -fVar417;
      auVar52._20_4_ = auVar13._20_4_ * -fVar418;
      auVar52._24_4_ = auVar13._24_4_ * -fVar419;
      auVar52._28_4_ = auVar13._28_4_;
      auVar53._4_4_ = fVar352 * auVar123._4_4_;
      auVar53._0_4_ = fVar343 * auVar123._0_4_;
      auVar53._8_4_ = fVar355 * auVar123._8_4_;
      auVar53._12_4_ = fVar358 * auVar123._12_4_;
      auVar53._16_4_ = fVar361 * auVar123._16_4_;
      auVar53._20_4_ = fVar364 * auVar123._20_4_;
      auVar53._24_4_ = fVar367 * auVar123._24_4_;
      auVar53._28_4_ = auVar123._28_4_;
      auVar123 = vsubps_avx(auVar52,auVar53);
      auVar13 = vsubps_avx(auVar349,auVar14);
      auVar54._4_4_ = fVar249 * auVar13._4_4_;
      auVar54._0_4_ = fVar228 * auVar13._0_4_;
      auVar54._8_4_ = fVar281 * auVar13._8_4_;
      auVar54._12_4_ = fVar256 * auVar13._12_4_;
      auVar54._16_4_ = fVar286 * auVar13._16_4_;
      auVar54._20_4_ = fVar309 * auVar13._20_4_;
      uVar1 = auVar13._28_4_;
      auVar54._24_4_ = fVar406 * auVar13._24_4_;
      auVar54._28_4_ = uVar1;
      auVar349 = vsubps_avx(auVar123,auVar54);
      auVar55._4_4_ = (float)local_880._4_4_ * -fVar414;
      auVar55._0_4_ = (float)local_880._0_4_ * -fVar407;
      auVar55._8_4_ = fStack_878 * -fVar415;
      auVar55._12_4_ = fStack_874 * -fVar416;
      auVar55._16_4_ = fStack_870 * -fVar417;
      auVar55._20_4_ = fStack_86c * -fVar418;
      auVar55._24_4_ = fStack_868 * -fVar419;
      auVar55._28_4_ = uVar11 ^ 0x80000000;
      auVar56._4_4_ = (float)local_860._4_4_ * fVar352;
      auVar56._0_4_ = (float)local_860._0_4_ * fVar343;
      auVar56._8_4_ = fStack_858 * fVar355;
      auVar56._12_4_ = fStack_854 * fVar358;
      auVar56._16_4_ = fStack_850 * fVar361;
      auVar56._20_4_ = fStack_84c * fVar364;
      auVar56._24_4_ = fStack_848 * fVar367;
      auVar56._28_4_ = uVar1;
      auVar123 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fVar249 * (float)local_840._4_4_;
      auVar57._0_4_ = fVar228 * (float)local_840._0_4_;
      auVar57._8_4_ = fVar281 * fStack_838;
      auVar57._12_4_ = fVar256 * fStack_834;
      auVar57._16_4_ = fVar286 * fStack_830;
      auVar57._20_4_ = fVar309 * fStack_82c;
      auVar57._24_4_ = fVar406 * fStack_828;
      auVar57._28_4_ = uVar1;
      auVar21 = vsubps_avx(auVar123,auVar57);
      auVar123 = vrcpps_avx(auVar21);
      fVar228 = auVar123._0_4_;
      fVar229 = auVar123._4_4_;
      auVar58._4_4_ = auVar21._4_4_ * fVar229;
      auVar58._0_4_ = auVar21._0_4_ * fVar228;
      fVar230 = auVar123._8_4_;
      auVar58._8_4_ = auVar21._8_4_ * fVar230;
      fVar249 = auVar123._12_4_;
      auVar58._12_4_ = auVar21._12_4_ * fVar249;
      fVar252 = auVar123._16_4_;
      auVar58._16_4_ = auVar21._16_4_ * fVar252;
      fVar255 = auVar123._20_4_;
      auVar58._20_4_ = auVar21._20_4_ * fVar255;
      fVar281 = auVar123._24_4_;
      auVar58._24_4_ = auVar21._24_4_ * fVar281;
      auVar58._28_4_ = fStack_824;
      auVar115 = vsubps_avx(auVar244,auVar58);
      auVar123 = vandps_avx(auVar21,auVar326);
      auVar327._8_4_ = 0x219392ef;
      auVar327._0_8_ = 0x219392ef219392ef;
      auVar327._12_4_ = 0x219392ef;
      auVar327._16_4_ = 0x219392ef;
      auVar327._20_4_ = 0x219392ef;
      auVar327._24_4_ = 0x219392ef;
      auVar327._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar123,auVar327,1);
      auVar59._4_4_ = (fVar229 + fVar229 * auVar115._4_4_) * -auVar349._4_4_;
      auVar59._0_4_ = (fVar228 + fVar228 * auVar115._0_4_) * -auVar349._0_4_;
      auVar59._8_4_ = (fVar230 + fVar230 * auVar115._8_4_) * -auVar349._8_4_;
      auVar59._12_4_ = (fVar249 + fVar249 * auVar115._12_4_) * -auVar349._12_4_;
      auVar59._16_4_ = (fVar252 + fVar252 * auVar115._16_4_) * -auVar349._16_4_;
      auVar59._20_4_ = (fVar255 + fVar255 * auVar115._20_4_) * -auVar349._20_4_;
      auVar59._24_4_ = (fVar281 + fVar281 * auVar115._24_4_) * -auVar349._24_4_;
      auVar59._28_4_ = auVar349._28_4_ ^ 0x80000000;
      auVar123 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,1);
      auVar123 = vorps_avx(auVar13,auVar123);
      auVar123 = vblendvps_avx(auVar59,auVar394,auVar123);
      local_780 = vmaxps_avx(auVar16,auVar123);
      auVar123 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,6);
      auVar123 = vorps_avx(auVar13,auVar123);
      auVar123 = vblendvps_avx(auVar59,auVar412,auVar123);
      auVar114 = vandps_avx(auVar114,local_4a0);
      local_420 = vminps_avx(auVar348,auVar123);
      auVar123 = vcmpps_avx(local_780,local_420,2);
      auVar13 = auVar114 & auVar123;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0x7f,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0xbf,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f])
      {
        auVar302 = ZEXT3264(_local_a00);
LAB_010c5017:
        auVar245 = ZEXT3264(auVar244);
      }
      else {
        auVar13 = vminps_avx(local_7c0,local_820);
        auVar348 = vminps_avx(local_7e0,local_800);
        auVar13 = vminps_avx(auVar13,auVar348);
        auVar350 = vsubps_avx(auVar13,auVar350);
        auVar114 = vandps_avx(auVar123,auVar114);
        auVar92._4_4_ = local_640[1];
        auVar92._0_4_ = local_640[0];
        auVar92._8_4_ = local_640[2];
        auVar92._12_4_ = local_640[3];
        auVar92._16_4_ = fStack_630;
        auVar92._20_4_ = fStack_62c;
        auVar92._24_4_ = fStack_628;
        auVar92._28_4_ = fStack_624;
        auVar123 = vminps_avx(auVar92,auVar244);
        auVar123 = vmaxps_avx(auVar123,ZEXT832(0) << 0x20);
        local_640[0] = fVar101 + fVar143 * (auVar123._0_4_ + 0.0) * 0.125;
        local_640[1] = fVar133 + fVar181 * (auVar123._4_4_ + 1.0) * 0.125;
        local_640[2] = fVar135 + fVar182 * (auVar123._8_4_ + 2.0) * 0.125;
        local_640[3] = fVar137 + fVar184 * (auVar123._12_4_ + 3.0) * 0.125;
        fStack_630 = fVar101 + fVar143 * (auVar123._16_4_ + 4.0) * 0.125;
        fStack_62c = fVar133 + fVar181 * (auVar123._20_4_ + 5.0) * 0.125;
        fStack_628 = fVar135 + fVar182 * (auVar123._24_4_ + 6.0) * 0.125;
        fStack_624 = fVar137 + auVar123._28_4_ + 7.0;
        auVar91._4_4_ = local_660[1];
        auVar91._0_4_ = local_660[0];
        auVar91._8_4_ = local_660[2];
        auVar91._12_4_ = local_660[3];
        auVar91._16_4_ = fStack_650;
        auVar91._20_4_ = fStack_64c;
        auVar91._24_4_ = fStack_648;
        auVar91._28_4_ = fStack_644;
        auVar123 = vminps_avx(auVar91,auVar244);
        auVar123 = vmaxps_avx(auVar123,ZEXT832(0) << 0x20);
        local_660[0] = fVar101 + fVar143 * (auVar123._0_4_ + 0.0) * 0.125;
        local_660[1] = fVar133 + fVar181 * (auVar123._4_4_ + 1.0) * 0.125;
        local_660[2] = fVar135 + fVar182 * (auVar123._8_4_ + 2.0) * 0.125;
        local_660[3] = fVar137 + fVar184 * (auVar123._12_4_ + 3.0) * 0.125;
        fStack_650 = fVar101 + fVar143 * (auVar123._16_4_ + 4.0) * 0.125;
        fStack_64c = fVar133 + fVar181 * (auVar123._20_4_ + 5.0) * 0.125;
        fStack_648 = fVar135 + fVar182 * (auVar123._24_4_ + 6.0) * 0.125;
        fStack_644 = fVar137 + auVar123._28_4_ + 7.0;
        auVar60._4_4_ = auVar350._4_4_ * 0.99999976;
        auVar60._0_4_ = auVar350._0_4_ * 0.99999976;
        auVar60._8_4_ = auVar350._8_4_ * 0.99999976;
        auVar60._12_4_ = auVar350._12_4_ * 0.99999976;
        auVar60._16_4_ = auVar350._16_4_ * 0.99999976;
        auVar60._20_4_ = auVar350._20_4_ * 0.99999976;
        auVar60._24_4_ = auVar350._24_4_ * 0.99999976;
        auVar60._28_4_ = 0x3f7ffffc;
        auVar123 = vmaxps_avx(ZEXT832(0) << 0x20,auVar60);
        auVar61._4_4_ = auVar123._4_4_ * auVar123._4_4_;
        auVar61._0_4_ = auVar123._0_4_ * auVar123._0_4_;
        auVar61._8_4_ = auVar123._8_4_ * auVar123._8_4_;
        auVar61._12_4_ = auVar123._12_4_ * auVar123._12_4_;
        auVar61._16_4_ = auVar123._16_4_ * auVar123._16_4_;
        auVar61._20_4_ = auVar123._20_4_ * auVar123._20_4_;
        auVar61._24_4_ = auVar123._24_4_ * auVar123._24_4_;
        auVar61._28_4_ = auVar123._28_4_;
        local_a60 = vsubps_avx(auVar20,auVar61);
        auVar62._4_4_ = local_a60._4_4_ * fVar186 * 4.0;
        auVar62._0_4_ = local_a60._0_4_ * fVar185 * 4.0;
        auVar62._8_4_ = local_a60._8_4_ * fVar187 * 4.0;
        auVar62._12_4_ = local_a60._12_4_ * fVar188 * 4.0;
        auVar62._16_4_ = local_a60._16_4_ * fVar381 * 4.0;
        auVar62._20_4_ = local_a60._20_4_ * fVar383 * 4.0;
        auVar62._24_4_ = local_a60._24_4_ * fVar385 * 4.0;
        auVar62._28_4_ = auVar123._28_4_;
        auVar350 = vsubps_avx(auVar44,auVar62);
        auVar123 = vcmpps_avx(auVar350,ZEXT832(0) << 0x20,5);
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0x7f,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0xbf,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar123[0x1f]) {
          _local_900 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_8c0 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar215 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar240 = ZEXT828(0) << 0x20;
          auVar395 = ZEXT864(0) << 0x20;
          auVar165._8_4_ = 0x7f800000;
          auVar165._0_8_ = 0x7f8000007f800000;
          auVar165._12_4_ = 0x7f800000;
          auVar165._16_4_ = 0x7f800000;
          auVar165._20_4_ = 0x7f800000;
          auVar165._24_4_ = 0x7f800000;
          auVar165._28_4_ = 0x7f800000;
          auVar270._8_4_ = 0xff800000;
          auVar270._0_8_ = 0xff800000ff800000;
          auVar270._12_4_ = 0xff800000;
          auVar270._16_4_ = 0xff800000;
          auVar270._20_4_ = 0xff800000;
          auVar270._24_4_ = 0xff800000;
          auVar270._28_4_ = 0xff800000;
          local_a60 = auVar14;
          _local_8e0 = _local_900;
        }
        else {
          auVar14 = vsqrtps_avx(auVar350);
          auVar166._0_4_ = fVar185 + fVar185;
          auVar166._4_4_ = fVar186 + fVar186;
          auVar166._8_4_ = fVar187 + fVar187;
          auVar166._12_4_ = fVar188 + fVar188;
          auVar166._16_4_ = fVar381 + fVar381;
          auVar166._20_4_ = fVar383 + fVar383;
          auVar166._24_4_ = fVar385 + fVar385;
          auVar166._28_4_ = fVar224 + fVar224;
          auVar13 = vrcpps_avx(auVar166);
          fVar224 = auVar13._0_4_;
          fVar228 = auVar13._4_4_;
          auVar63._4_4_ = auVar166._4_4_ * fVar228;
          auVar63._0_4_ = auVar166._0_4_ * fVar224;
          fVar229 = auVar13._8_4_;
          auVar63._8_4_ = auVar166._8_4_ * fVar229;
          fVar230 = auVar13._12_4_;
          auVar63._12_4_ = auVar166._12_4_ * fVar230;
          fVar249 = auVar13._16_4_;
          auVar63._16_4_ = auVar166._16_4_ * fVar249;
          fVar252 = auVar13._20_4_;
          auVar63._20_4_ = auVar166._20_4_ * fVar252;
          fVar255 = auVar13._24_4_;
          auVar63._24_4_ = auVar166._24_4_ * fVar255;
          auVar63._28_4_ = auVar166._28_4_;
          auVar348 = vsubps_avx(auVar244,auVar63);
          fVar224 = fVar224 + fVar224 * auVar348._0_4_;
          fVar228 = fVar228 + fVar228 * auVar348._4_4_;
          fVar229 = fVar229 + fVar229 * auVar348._8_4_;
          fVar230 = fVar230 + fVar230 * auVar348._12_4_;
          fVar249 = fVar249 + fVar249 * auVar348._16_4_;
          fVar252 = fVar252 + fVar252 * auVar348._20_4_;
          fVar255 = fVar255 + fVar255 * auVar348._24_4_;
          fVar288 = auVar13._28_4_ + auVar348._28_4_;
          auVar167._0_8_ = local_400._0_8_ ^ 0x8000000080000000;
          auVar167._8_4_ = -local_400._8_4_;
          auVar167._12_4_ = -local_400._12_4_;
          auVar167._16_4_ = -local_400._16_4_;
          auVar167._20_4_ = -local_400._20_4_;
          auVar167._24_4_ = -local_400._24_4_;
          auVar167._28_4_ = -local_400._28_4_;
          auVar13 = vsubps_avx(auVar167,auVar14);
          fVar281 = auVar13._0_4_ * fVar224;
          fVar283 = auVar13._4_4_ * fVar228;
          auVar64._4_4_ = fVar283;
          auVar64._0_4_ = fVar281;
          fVar285 = auVar13._8_4_ * fVar229;
          auVar64._8_4_ = fVar285;
          fVar256 = auVar13._12_4_ * fVar230;
          auVar64._12_4_ = fVar256;
          fVar259 = auVar13._16_4_ * fVar249;
          auVar64._16_4_ = fVar259;
          fVar278 = auVar13._20_4_ * fVar252;
          auVar64._20_4_ = fVar278;
          fVar286 = auVar13._24_4_ * fVar255;
          auVar64._24_4_ = fVar286;
          auVar64._28_4_ = auVar13._28_4_;
          auVar13 = vsubps_avx(auVar14,local_400);
          fVar224 = auVar13._0_4_ * fVar224;
          fVar228 = auVar13._4_4_ * fVar228;
          auVar65._4_4_ = fVar228;
          auVar65._0_4_ = fVar224;
          fVar229 = auVar13._8_4_ * fVar229;
          auVar65._8_4_ = fVar229;
          fVar230 = auVar13._12_4_ * fVar230;
          auVar65._12_4_ = fVar230;
          fVar249 = auVar13._16_4_ * fVar249;
          auVar65._16_4_ = fVar249;
          fVar252 = auVar13._20_4_ * fVar252;
          auVar65._20_4_ = fVar252;
          fVar255 = auVar13._24_4_ * fVar255;
          auVar65._24_4_ = fVar255;
          auVar65._28_4_ = 0x7f800000;
          fVar289 = (fVar369 * fVar281 + fVar420) * fVar344;
          fVar309 = (fVar377 * fVar283 + fVar424) * fVar353;
          fVar311 = (fVar378 * fVar285 + fVar425) * fVar356;
          fVar313 = (fVar379 * fVar256 + fVar426) * fVar359;
          fVar406 = (fVar380 * fVar259 + fVar427) * fVar362;
          fVar251 = (fVar382 * fVar278 + fVar428) * fVar365;
          fVar254 = (fVar384 * fVar286 + fVar429) * fVar368;
          auVar221._0_4_ = fVar102 + fVar227 * fVar289;
          auVar221._4_4_ = fVar134 + fVar248 * fVar309;
          auVar221._8_4_ = fVar136 + fVar279 * fVar311;
          auVar221._12_4_ = fVar138 + fVar253 * fVar313;
          auVar221._16_4_ = fVar139 + fVar284 * fVar406;
          auVar221._20_4_ = fVar140 + fVar307 * fVar251;
          auVar221._24_4_ = fVar141 + fVar19 * fVar254;
          auVar221._28_4_ = fVar142 + auVar13._28_4_ + fVar430;
          auVar66._4_4_ = (float)local_840._4_4_ * fVar283;
          auVar66._0_4_ = (float)local_840._0_4_ * fVar281;
          auVar66._8_4_ = fStack_838 * fVar285;
          auVar66._12_4_ = fStack_834 * fVar256;
          auVar66._16_4_ = fStack_830 * fVar259;
          auVar66._20_4_ = fStack_82c * fVar278;
          auVar66._24_4_ = fStack_828 * fVar286;
          auVar66._28_4_ = fVar288;
          local_aa0 = vsubps_avx(auVar66,auVar221);
          auVar242._0_4_ = auVar409._0_4_ + fVar225 * fVar289;
          auVar242._4_4_ = auVar409._4_4_ + fVar246 * fVar309;
          auVar242._8_4_ = auVar409._8_4_ + fVar258 * fVar311;
          auVar242._12_4_ = auVar409._12_4_ + fVar287 * fVar313;
          auVar242._16_4_ = auVar409._16_4_ + fVar280 * fVar406;
          auVar242._20_4_ = auVar409._20_4_ + fVar303 * fVar251;
          auVar242._24_4_ = auVar409._24_4_ + fVar396 * fVar254;
          auVar242._28_4_ = auVar409._28_4_ + fVar288;
          auVar67._4_4_ = (float)local_860._4_4_ * fVar283;
          auVar67._0_4_ = (float)local_860._0_4_ * fVar281;
          auVar67._8_4_ = fStack_858 * fVar285;
          auVar67._12_4_ = fStack_854 * fVar256;
          auVar67._16_4_ = fStack_850 * fVar259;
          auVar67._20_4_ = fStack_84c * fVar278;
          auVar67._24_4_ = fStack_848 * fVar286;
          auVar67._28_4_ = fStack_9e4;
          auVar14 = vsubps_avx(auVar67,auVar242);
          auVar271._0_4_ = auVar432._0_4_ + fVar226 * fVar289;
          auVar271._4_4_ = auVar432._4_4_ + fVar247 * fVar309;
          auVar271._8_4_ = auVar432._8_4_ + fVar277 * fVar311;
          auVar271._12_4_ = auVar432._12_4_ + fVar250 * fVar313;
          auVar271._16_4_ = auVar432._16_4_ + fVar282 * fVar406;
          auVar271._20_4_ = auVar432._20_4_ + fVar305 * fVar251;
          auVar271._24_4_ = auVar432._24_4_ + fVar18 * fVar254;
          auVar271._28_4_ = auVar432._28_4_ + 0.0;
          auVar68._4_4_ = (float)local_880._4_4_ * fVar283;
          auVar68._0_4_ = (float)local_880._0_4_ * fVar281;
          auVar68._8_4_ = fStack_878 * fVar285;
          auVar68._12_4_ = fStack_874 * fVar256;
          auVar68._16_4_ = fStack_870 * fVar259;
          auVar68._20_4_ = fStack_86c * fVar278;
          auVar68._24_4_ = fStack_868 * fVar286;
          auVar68._28_4_ = fStack_9e4;
          auVar348 = vsubps_avx(auVar68,auVar271);
          fVar344 = (fVar369 * fVar224 + fVar420) * fVar344;
          fVar353 = (fVar377 * fVar228 + fVar424) * fVar353;
          fVar356 = (fVar378 * fVar229 + fVar425) * fVar356;
          fVar359 = (fVar379 * fVar230 + fVar426) * fVar359;
          fVar362 = (fVar380 * fVar249 + fVar427) * fVar362;
          fVar365 = (fVar382 * fVar252 + fVar428) * fVar365;
          fVar368 = (fVar384 * fVar255 + fVar429) * fVar368;
          auVar300._0_4_ = fVar102 + fVar227 * fVar344;
          auVar300._4_4_ = fVar134 + fVar248 * fVar353;
          auVar300._8_4_ = fVar136 + fVar279 * fVar356;
          auVar300._12_4_ = fVar138 + fVar253 * fVar359;
          auVar300._16_4_ = fVar139 + fVar284 * fVar362;
          auVar300._20_4_ = fVar140 + fVar307 * fVar365;
          auVar300._24_4_ = fVar141 + fVar19 * fVar368;
          auVar300._28_4_ = fVar142 + fStack_9e4;
          auVar69._4_4_ = fVar228 * (float)local_840._4_4_;
          auVar69._0_4_ = fVar224 * (float)local_840._0_4_;
          auVar69._8_4_ = fVar229 * fStack_838;
          auVar69._12_4_ = fVar230 * fStack_834;
          auVar69._16_4_ = fVar249 * fStack_830;
          auVar69._20_4_ = fVar252 * fStack_82c;
          auVar69._24_4_ = fVar255 * fStack_828;
          auVar69._28_4_ = fStack_824;
          _local_8e0 = vsubps_avx(auVar69,auVar300);
          auVar301._0_4_ = auVar409._0_4_ + fVar225 * fVar344;
          auVar301._4_4_ = auVar409._4_4_ + fVar246 * fVar353;
          auVar301._8_4_ = auVar409._8_4_ + fVar258 * fVar356;
          auVar301._12_4_ = auVar409._12_4_ + fVar287 * fVar359;
          auVar301._16_4_ = auVar409._16_4_ + fVar280 * fVar362;
          auVar301._20_4_ = auVar409._20_4_ + fVar303 * fVar365;
          auVar301._24_4_ = auVar409._24_4_ + fVar396 * fVar368;
          auVar301._28_4_ = auVar409._28_4_ + local_8e0._28_4_;
          auVar70._4_4_ = (float)local_860._4_4_ * fVar228;
          auVar70._0_4_ = (float)local_860._0_4_ * fVar224;
          auVar70._8_4_ = fStack_858 * fVar229;
          auVar70._12_4_ = fStack_854 * fVar230;
          auVar70._16_4_ = fStack_850 * fVar249;
          auVar70._20_4_ = fStack_84c * fVar252;
          auVar70._24_4_ = fStack_848 * fVar255;
          auVar70._28_4_ = fStack_824;
          _local_900 = vsubps_avx(auVar70,auVar301);
          auVar272._0_4_ = auVar432._0_4_ + fVar226 * fVar344;
          auVar272._4_4_ = auVar432._4_4_ + fVar247 * fVar353;
          auVar272._8_4_ = auVar432._8_4_ + fVar277 * fVar356;
          auVar272._12_4_ = auVar432._12_4_ + fVar250 * fVar359;
          auVar272._16_4_ = auVar432._16_4_ + fVar282 * fVar362;
          auVar272._20_4_ = auVar432._20_4_ + fVar305 * fVar365;
          auVar272._24_4_ = auVar432._24_4_ + fVar18 * fVar368;
          auVar272._28_4_ = auVar432._28_4_ + auVar348._28_4_ + fVar430;
          auVar71._4_4_ = (float)local_880._4_4_ * fVar228;
          auVar71._0_4_ = (float)local_880._0_4_ * fVar224;
          auVar71._8_4_ = fStack_878 * fVar229;
          auVar71._12_4_ = fStack_874 * fVar230;
          auVar71._16_4_ = fStack_870 * fVar249;
          auVar71._20_4_ = fStack_86c * fVar252;
          auVar71._24_4_ = fStack_868 * fVar255;
          auVar71._28_4_ = local_900._28_4_;
          _local_8c0 = vsubps_avx(auVar71,auVar272);
          auVar13 = vcmpps_avx(auVar350,_DAT_02020f00,5);
          auVar273._8_4_ = 0x7f800000;
          auVar273._0_8_ = 0x7f8000007f800000;
          auVar273._12_4_ = 0x7f800000;
          auVar273._16_4_ = 0x7f800000;
          auVar273._20_4_ = 0x7f800000;
          auVar273._24_4_ = 0x7f800000;
          auVar273._28_4_ = 0x7f800000;
          auVar165 = vblendvps_avx(auVar273,auVar64,auVar13);
          auVar328._8_4_ = 0x7fffffff;
          auVar328._0_8_ = 0x7fffffff7fffffff;
          auVar328._12_4_ = 0x7fffffff;
          auVar328._16_4_ = 0x7fffffff;
          auVar328._20_4_ = 0x7fffffff;
          auVar328._24_4_ = 0x7fffffff;
          auVar328._28_4_ = 0x7fffffff;
          auVar350 = vandps_avx(auVar328,auVar43);
          auVar350 = vmaxps_avx(local_4c0,auVar350);
          auVar72._4_4_ = auVar350._4_4_ * 1.9073486e-06;
          auVar72._0_4_ = auVar350._0_4_ * 1.9073486e-06;
          auVar72._8_4_ = auVar350._8_4_ * 1.9073486e-06;
          auVar72._12_4_ = auVar350._12_4_ * 1.9073486e-06;
          auVar72._16_4_ = auVar350._16_4_ * 1.9073486e-06;
          auVar72._20_4_ = auVar350._20_4_ * 1.9073486e-06;
          auVar72._24_4_ = auVar350._24_4_ * 1.9073486e-06;
          auVar72._28_4_ = auVar350._28_4_;
          auVar350 = vandps_avx(auVar328,auVar15);
          auVar350 = vcmpps_avx(auVar350,auVar72,1);
          auVar274._8_4_ = 0xff800000;
          auVar274._0_8_ = 0xff800000ff800000;
          auVar274._12_4_ = 0xff800000;
          auVar274._16_4_ = 0xff800000;
          auVar274._20_4_ = 0xff800000;
          auVar274._24_4_ = 0xff800000;
          auVar274._28_4_ = 0xff800000;
          auVar270 = vblendvps_avx(auVar274,auVar65,auVar13);
          auVar16 = auVar13 & auVar350;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar123 = vandps_avx(auVar350,auVar13);
            auVar151 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
            auVar16 = vcmpps_avx(local_a60,ZEXT832(0) << 0x20,2);
            auVar376._8_4_ = 0xff800000;
            auVar376._0_8_ = 0xff800000ff800000;
            auVar376._12_4_ = 0xff800000;
            auVar376._16_4_ = 0xff800000;
            auVar376._20_4_ = 0xff800000;
            auVar376._24_4_ = 0xff800000;
            auVar376._28_4_ = 0xff800000;
            auVar433._8_4_ = 0x7f800000;
            auVar433._0_8_ = 0x7f8000007f800000;
            auVar433._12_4_ = 0x7f800000;
            auVar433._16_4_ = 0x7f800000;
            auVar433._20_4_ = 0x7f800000;
            auVar433._24_4_ = 0x7f800000;
            auVar433._28_4_ = 0x7f800000;
            auVar350 = vblendvps_avx(auVar433,auVar376,auVar16);
            auVar3 = vpmovsxwd_avx(auVar151);
            auVar151 = vpunpckhwd_avx(auVar151,auVar151);
            auVar329._16_16_ = auVar151;
            auVar329._0_16_ = auVar3;
            auVar165 = vblendvps_avx(auVar165,auVar350,auVar329);
            auVar350 = vblendvps_avx(auVar376,auVar433,auVar16);
            auVar270 = vblendvps_avx(auVar270,auVar350,auVar329);
            auVar350 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar205._0_4_ = auVar123._0_4_ ^ auVar350._0_4_;
            auVar205._4_4_ = auVar123._4_4_ ^ auVar350._4_4_;
            auVar205._8_4_ = auVar123._8_4_ ^ auVar350._8_4_;
            auVar205._12_4_ = auVar123._12_4_ ^ auVar350._12_4_;
            auVar205._16_4_ = auVar123._16_4_ ^ auVar350._16_4_;
            auVar205._20_4_ = auVar123._20_4_ ^ auVar350._20_4_;
            auVar205._24_4_ = auVar123._24_4_ ^ auVar350._24_4_;
            auVar205._28_4_ = auVar123._28_4_ ^ auVar350._28_4_;
            auVar123 = vorps_avx(auVar16,auVar205);
            auVar123 = vandps_avx(auVar13,auVar123);
          }
          auVar215 = local_aa0._0_28_;
          auVar240 = auVar14._0_28_;
          auVar395 = ZEXT3264(auVar348);
          local_980 = auVar114;
        }
        auVar302 = ZEXT3264(_local_a00);
        _local_480 = local_780;
        local_460 = vminps_avx(local_420,auVar165);
        _local_440 = vmaxps_avx(local_780,auVar270);
        auVar350 = vcmpps_avx(local_780,local_460,2);
        local_680 = vandps_avx(auVar114,auVar350);
        auVar350 = vcmpps_avx(_local_440,local_420,2);
        local_740 = vandps_avx(auVar114,auVar350);
        auVar114 = vorps_avx(local_740,local_680);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          local_9a0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_700._0_4_ = auVar123._0_4_ ^ local_9a0._0_4_;
          local_700._4_4_ = auVar123._4_4_ ^ local_9a0._4_4_;
          local_700._8_4_ = auVar123._8_4_ ^ local_9a0._8_4_;
          local_700._12_4_ = auVar123._12_4_ ^ local_9a0._12_4_;
          local_700._16_4_ = auVar123._16_4_ ^ local_9a0._16_4_;
          local_700._20_4_ = auVar123._20_4_ ^ local_9a0._20_4_;
          local_700._24_4_ = auVar123._24_4_ ^ local_9a0._24_4_;
          local_700._28_4_ = (uint)auVar123._28_4_ ^ (uint)local_9a0._28_4_;
          auVar124._0_4_ =
               auVar215._0_4_ * (float)local_840._0_4_ +
               auVar240._0_4_ * (float)local_860._0_4_ + auVar395._0_4_ * (float)local_880._0_4_;
          auVar124._4_4_ =
               auVar215._4_4_ * (float)local_840._4_4_ +
               auVar240._4_4_ * (float)local_860._4_4_ + auVar395._4_4_ * (float)local_880._4_4_;
          auVar124._8_4_ =
               auVar215._8_4_ * fStack_838 +
               auVar240._8_4_ * fStack_858 + auVar395._8_4_ * fStack_878;
          auVar124._12_4_ =
               auVar215._12_4_ * fStack_834 +
               auVar240._12_4_ * fStack_854 + auVar395._12_4_ * fStack_874;
          auVar124._16_4_ =
               auVar215._16_4_ * fStack_830 +
               auVar240._16_4_ * fStack_850 + auVar395._16_4_ * fStack_870;
          auVar124._20_4_ =
               auVar215._20_4_ * fStack_82c +
               auVar240._20_4_ * fStack_84c + auVar395._20_4_ * fStack_86c;
          auVar124._24_4_ =
               auVar215._24_4_ * fStack_828 +
               auVar240._24_4_ * fStack_848 + auVar395._24_4_ * fStack_868;
          auVar124._28_4_ = local_9a0._28_4_ + local_680._28_4_ + auVar123._28_4_;
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar168._16_4_ = 0x7fffffff;
          auVar168._20_4_ = 0x7fffffff;
          auVar168._24_4_ = 0x7fffffff;
          auVar168._28_4_ = 0x7fffffff;
          auVar114 = vandps_avx(auVar124,auVar168);
          auVar169._8_4_ = 0x3e99999a;
          auVar169._0_8_ = 0x3e99999a3e99999a;
          auVar169._12_4_ = 0x3e99999a;
          auVar169._16_4_ = 0x3e99999a;
          auVar169._20_4_ = 0x3e99999a;
          auVar169._24_4_ = 0x3e99999a;
          auVar169._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar169,1);
          auVar114 = vorps_avx(auVar114,local_700);
          auVar170._8_4_ = 3;
          auVar170._0_8_ = 0x300000003;
          auVar170._12_4_ = 3;
          auVar170._16_4_ = 3;
          auVar170._20_4_ = 3;
          auVar170._24_4_ = 3;
          auVar170._28_4_ = 3;
          auVar200._8_4_ = 2;
          auVar200._0_8_ = 0x200000002;
          auVar200._12_4_ = 2;
          auVar200._16_4_ = 2;
          auVar200._20_4_ = 2;
          auVar200._24_4_ = 2;
          auVar200._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar200,auVar170,auVar114);
          local_6e0 = ZEXT432((uint)uVar95);
          local_7a0 = vpshufd_avx(ZEXT416((uint)uVar95),0);
          auVar151 = vpcmpgtd_avx(auVar114._16_16_,local_7a0);
          auStack_790 = auVar15._16_16_;
          auVar3 = vpcmpgtd_avx(auVar114._0_16_,local_7a0);
          auVar171._16_16_ = auVar151;
          auVar171._0_16_ = auVar3;
          local_6a0 = vblendps_avx(ZEXT1632(auVar3),auVar171,0xf0);
          auVar114 = vandnps_avx(local_6a0,local_680);
          auVar123 = local_680 & ~local_6a0;
          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auStack_758 = auVar20._8_24_;
          local_760 = uVar95;
          auVar350 = _local_440;
          local_720 = auVar114;
          local_6c0 = local_740;
          if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar123 >> 0x7f,0) != '\0') ||
                (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar123 >> 0xbf,0) != '\0') ||
              (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar123[0x1f] < '\0') {
            local_8a0._4_4_ = local_780._4_4_ + (float)local_a00._4_4_;
            local_8a0._0_4_ = local_780._0_4_ + (float)local_a00._0_4_;
            fStack_898 = local_780._8_4_ + fStack_9f8;
            fStack_894 = local_780._12_4_ + fStack_9f4;
            fStack_890 = local_780._16_4_ + fStack_9f0;
            fStack_88c = local_780._20_4_ + fStack_9ec;
            fStack_888 = local_780._24_4_ + fStack_9e8;
            fStack_884 = local_780._28_4_ + fStack_9e4;
            local_a20 = _local_440;
            do {
              auVar232 = auVar223._0_16_;
              auVar172._8_4_ = 0x7f800000;
              auVar172._0_8_ = 0x7f8000007f800000;
              auVar172._12_4_ = 0x7f800000;
              auVar172._16_4_ = 0x7f800000;
              auVar172._20_4_ = 0x7f800000;
              auVar172._24_4_ = 0x7f800000;
              auVar172._28_4_ = 0x7f800000;
              auVar123 = vblendvps_avx(auVar172,local_780,auVar114);
              auVar350 = vshufps_avx(auVar123,auVar123,0xb1);
              auVar350 = vminps_avx(auVar123,auVar350);
              auVar13 = vshufpd_avx(auVar350,auVar350,5);
              auVar350 = vminps_avx(auVar350,auVar13);
              auVar13 = vperm2f128_avx(auVar350,auVar350,1);
              auVar350 = vminps_avx(auVar350,auVar13);
              auVar350 = vcmpps_avx(auVar123,auVar350,0);
              auVar13 = auVar114 & auVar350;
              auVar123 = auVar114;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar123 = vandps_avx(auVar350,auVar114);
              }
              uVar97 = vmovmskps_avx(auVar123);
              uVar11 = 0;
              if (uVar97 != 0) {
                for (; (uVar97 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar95 = (ulong)uVar11;
              local_720 = auVar114;
              *(undefined4 *)(local_720 + uVar95 * 4) = 0;
              fVar224 = local_640[uVar95];
              uVar11 = *(uint *)(local_480 + uVar95 * 4);
              fVar225 = auVar146._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar225 = sqrtf((float)local_9c0._0_4_);
                auVar232._8_4_ = 0x7fffffff;
                auVar232._0_8_ = 0x7fffffff7fffffff;
                auVar232._12_4_ = 0x7fffffff;
              }
              auVar395 = ZEXT464(uVar11);
              auVar3 = vminps_avx(_local_ae0,_local_b00);
              auVar151 = vmaxps_avx(_local_ae0,_local_b00);
              auVar4 = vminps_avx(_local_af0,_local_b10);
              auVar106 = vminps_avx(auVar3,auVar4);
              auVar3 = vmaxps_avx(_local_af0,_local_b10);
              auVar4 = vmaxps_avx(auVar151,auVar3);
              auVar151 = vandps_avx(auVar106,auVar232);
              auVar3 = vandps_avx(auVar4,auVar232);
              auVar151 = vmaxps_avx(auVar151,auVar3);
              auVar3 = vmovshdup_avx(auVar151);
              auVar3 = vmaxss_avx(auVar3,auVar151);
              auVar151 = vshufpd_avx(auVar151,auVar151,1);
              auVar151 = vmaxss_avx(auVar151,auVar3);
              local_aa0._0_4_ = auVar151._0_4_ * 1.9073486e-06;
              local_940._0_4_ = fVar225 * 1.9073486e-06;
              local_820._0_16_ = vshufps_avx(auVar4,auVar4,0xff);
              lVar98 = 4;
              do {
                fVar229 = 1.0 - fVar224;
                auVar151 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                fVar225 = auVar151._0_4_;
                fVar226 = auVar151._4_4_;
                fVar227 = auVar151._8_4_;
                fVar228 = auVar151._12_4_;
                auVar151 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                fVar230 = auVar151._0_4_;
                fVar246 = auVar151._4_4_;
                fVar247 = auVar151._8_4_;
                fVar248 = auVar151._12_4_;
                fVar249 = (float)local_af0._0_4_ * fVar225 + (float)local_b00._0_4_ * fVar230;
                fVar252 = (float)local_af0._4_4_ * fVar226 + (float)local_b00._4_4_ * fVar246;
                fVar255 = fStack_ae8 * fVar227 + fStack_af8 * fVar247;
                fVar258 = fStack_ae4 * fVar228 + fStack_af4 * fVar248;
                auVar262._0_4_ =
                     fVar230 * ((float)local_b00._0_4_ * fVar225 + fVar230 * (float)local_ae0._0_4_)
                     + fVar225 * fVar249;
                auVar262._4_4_ =
                     fVar246 * ((float)local_b00._4_4_ * fVar226 + fVar246 * (float)local_ae0._4_4_)
                     + fVar226 * fVar252;
                auVar262._8_4_ =
                     fVar247 * (fStack_af8 * fVar227 + fVar247 * fStack_ad8) + fVar227 * fVar255;
                auVar262._12_4_ =
                     fVar248 * (fStack_af4 * fVar228 + fVar248 * fStack_ad4) + fVar228 * fVar258;
                auVar208._0_4_ =
                     fVar230 * fVar249 +
                     fVar225 * (fVar225 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar230)
                ;
                auVar208._4_4_ =
                     fVar246 * fVar252 +
                     fVar226 * (fVar226 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar246)
                ;
                auVar208._8_4_ =
                     fVar247 * fVar255 + fVar227 * (fVar227 * fStack_b08 + fStack_ae8 * fVar247);
                auVar208._12_4_ =
                     fVar248 * fVar258 + fVar228 * (fVar228 * fStack_b04 + fStack_ae4 * fVar248);
                auVar151 = vshufps_avx(auVar395._0_16_,auVar395._0_16_,0);
                auVar147._0_4_ = auVar151._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar147._4_4_ = auVar151._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar147._8_4_ = auVar151._8_4_ * fStack_9a8 + 0.0;
                auVar147._12_4_ = auVar151._12_4_ * fStack_9a4 + 0.0;
                auVar105._0_4_ = fVar230 * auVar262._0_4_ + fVar225 * auVar208._0_4_;
                auVar105._4_4_ = fVar246 * auVar262._4_4_ + fVar226 * auVar208._4_4_;
                auVar105._8_4_ = fVar247 * auVar262._8_4_ + fVar227 * auVar208._8_4_;
                auVar105._12_4_ = fVar248 * auVar262._12_4_ + fVar228 * auVar208._12_4_;
                local_980._0_16_ = auVar105;
                auVar3 = vsubps_avx(auVar147,auVar105);
                auVar151 = vdpps_avx(auVar3,auVar3,0x7f);
                fVar225 = auVar151._0_4_;
                if (fVar225 < 0.0) {
                  local_a60._0_16_ = auVar208;
                  fVar226 = sqrtf(fVar225);
                  auVar208 = local_a60._0_16_;
                }
                else {
                  auVar4 = vsqrtss_avx(auVar151,auVar151);
                  fVar226 = auVar4._0_4_;
                }
                auVar4 = vsubps_avx(auVar208,auVar262);
                auVar292._0_4_ = auVar4._0_4_ * 3.0;
                auVar292._4_4_ = auVar4._4_4_ * 3.0;
                auVar292._8_4_ = auVar4._8_4_ * 3.0;
                auVar292._12_4_ = auVar4._12_4_ * 3.0;
                auVar4 = vshufps_avx(ZEXT416((uint)(fVar224 * 6.0)),ZEXT416((uint)(fVar224 * 6.0)),0
                                    );
                auVar106 = ZEXT416((uint)((fVar229 - (fVar224 + fVar224)) * 6.0));
                auVar190 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = ZEXT416((uint)((fVar224 - (fVar229 + fVar229)) * 6.0));
                auVar209 = vshufps_avx(auVar106,auVar106,0);
                auVar5 = vshufps_avx(ZEXT416((uint)(fVar229 * 6.0)),ZEXT416((uint)(fVar229 * 6.0)),0
                                    );
                auVar106 = vdpps_avx(auVar292,auVar292,0x7f);
                auVar148._0_4_ =
                     auVar5._0_4_ * (float)local_ae0._0_4_ +
                     auVar209._0_4_ * (float)local_b00._0_4_ +
                     auVar4._0_4_ * (float)local_b10._0_4_ + auVar190._0_4_ * (float)local_af0._0_4_
                ;
                auVar148._4_4_ =
                     auVar5._4_4_ * (float)local_ae0._4_4_ +
                     auVar209._4_4_ * (float)local_b00._4_4_ +
                     auVar4._4_4_ * (float)local_b10._4_4_ + auVar190._4_4_ * (float)local_af0._4_4_
                ;
                auVar148._8_4_ =
                     auVar5._8_4_ * fStack_ad8 +
                     auVar209._8_4_ * fStack_af8 +
                     auVar4._8_4_ * fStack_b08 + auVar190._8_4_ * fStack_ae8;
                auVar148._12_4_ =
                     auVar5._12_4_ * fStack_ad4 +
                     auVar209._12_4_ * fStack_af4 +
                     auVar4._12_4_ * fStack_b04 + auVar190._12_4_ * fStack_ae4;
                auVar4 = vblendps_avx(auVar106,_DAT_01feba10,0xe);
                auVar190 = vrsqrtss_avx(auVar4,auVar4);
                fVar228 = auVar190._0_4_;
                fVar227 = auVar106._0_4_;
                auVar190 = vdpps_avx(auVar292,auVar148,0x7f);
                auVar209 = vshufps_avx(auVar106,auVar106,0);
                auVar149._0_4_ = auVar148._0_4_ * auVar209._0_4_;
                auVar149._4_4_ = auVar148._4_4_ * auVar209._4_4_;
                auVar149._8_4_ = auVar148._8_4_ * auVar209._8_4_;
                auVar149._12_4_ = auVar148._12_4_ * auVar209._12_4_;
                auVar190 = vshufps_avx(auVar190,auVar190,0);
                auVar233._0_4_ = auVar292._0_4_ * auVar190._0_4_;
                auVar233._4_4_ = auVar292._4_4_ * auVar190._4_4_;
                auVar233._8_4_ = auVar292._8_4_ * auVar190._8_4_;
                auVar233._12_4_ = auVar292._12_4_ * auVar190._12_4_;
                auVar5 = vsubps_avx(auVar149,auVar233);
                auVar190 = vrcpss_avx(auVar4,auVar4);
                auVar4 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                    ZEXT416((uint)(auVar395._0_4_ * (float)local_940._0_4_)));
                auVar190 = ZEXT416((uint)(auVar190._0_4_ * (2.0 - fVar227 * auVar190._0_4_)));
                auVar190 = vshufps_avx(auVar190,auVar190,0);
                uVar95 = CONCAT44(auVar292._4_4_,auVar292._0_4_);
                local_a80._0_8_ = uVar95 ^ 0x8000000080000000;
                local_a80._8_4_ = -auVar292._8_4_;
                local_a80._12_4_ = -auVar292._12_4_;
                auVar209 = ZEXT416((uint)(fVar228 * 1.5 +
                                         fVar227 * -0.5 * fVar228 * fVar228 * fVar228));
                auVar209 = vshufps_avx(auVar209,auVar209,0);
                auVar210._0_4_ = auVar209._0_4_ * auVar5._0_4_ * auVar190._0_4_;
                auVar210._4_4_ = auVar209._4_4_ * auVar5._4_4_ * auVar190._4_4_;
                auVar210._8_4_ = auVar209._8_4_ * auVar5._8_4_ * auVar190._8_4_;
                auVar210._12_4_ = auVar209._12_4_ * auVar5._12_4_ * auVar190._12_4_;
                auVar371._0_4_ = auVar292._0_4_ * auVar209._0_4_;
                auVar371._4_4_ = auVar292._4_4_ * auVar209._4_4_;
                auVar371._8_4_ = auVar292._8_4_ * auVar209._8_4_;
                auVar371._12_4_ = auVar292._12_4_ * auVar209._12_4_;
                if (fVar227 < 0.0) {
                  local_a60._0_4_ = fVar226;
                  local_9e0._0_16_ = auVar371;
                  local_960._0_16_ = auVar210;
                  fVar227 = sqrtf(fVar227);
                  auVar210 = local_960._0_16_;
                  auVar371 = local_9e0._0_16_;
                  fVar226 = (float)local_a60._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar227 = auVar106._0_4_;
                }
                auVar106 = vdpps_avx(auVar3,auVar371,0x7f);
                local_a60._0_4_ =
                     ((float)local_aa0._0_4_ / fVar227) * (fVar226 + 1.0) +
                     auVar4._0_4_ + fVar226 * (float)local_aa0._0_4_;
                auVar190 = vdpps_avx(local_a80._0_16_,auVar371,0x7f);
                auVar209 = vdpps_avx(auVar3,auVar210,0x7f);
                auVar5 = vdpps_avx(_local_9b0,auVar371,0x7f);
                auVar6 = vdpps_avx(auVar3,local_a80._0_16_,0x7f);
                fVar226 = auVar190._0_4_ + auVar209._0_4_;
                fVar227 = auVar106._0_4_;
                auVar107._0_4_ = fVar227 * fVar227;
                auVar107._4_4_ = auVar106._4_4_ * auVar106._4_4_;
                auVar107._8_4_ = auVar106._8_4_ * auVar106._8_4_;
                auVar107._12_4_ = auVar106._12_4_ * auVar106._12_4_;
                auVar209 = vsubps_avx(auVar151,auVar107);
                local_a80._0_16_ = ZEXT416((uint)fVar226);
                auVar190 = vdpps_avx(auVar3,_local_9b0,0x7f);
                fVar228 = auVar6._0_4_ - fVar227 * fVar226;
                fVar227 = auVar190._0_4_ - fVar227 * auVar5._0_4_;
                auVar190 = vrsqrtss_avx(auVar209,auVar209);
                fVar229 = auVar209._0_4_;
                fVar226 = auVar190._0_4_;
                fVar226 = fVar226 * 1.5 + fVar229 * -0.5 * fVar226 * fVar226 * fVar226;
                if (fVar229 < 0.0) {
                  local_9e0._0_16_ = auVar106;
                  local_960._0_16_ = auVar5;
                  local_7c0._0_4_ = fVar228;
                  local_7e0._0_4_ = fVar227;
                  local_800._0_4_ = fVar226;
                  fVar229 = sqrtf(fVar229);
                  fVar226 = (float)local_800._0_4_;
                  fVar228 = (float)local_7c0._0_4_;
                  fVar227 = (float)local_7e0._0_4_;
                  auVar5 = local_960._0_16_;
                  auVar106 = local_9e0._0_16_;
                }
                else {
                  auVar190 = vsqrtss_avx(auVar209,auVar209);
                  fVar229 = auVar190._0_4_;
                }
                auVar209 = vpermilps_avx(local_980._0_16_,0xff);
                auVar6 = vshufps_avx(auVar292,auVar292,0xff);
                fVar228 = fVar228 * fVar226 - auVar6._0_4_;
                auVar234._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                auVar234._8_4_ = auVar5._8_4_ ^ 0x80000000;
                auVar234._12_4_ = auVar5._12_4_ ^ 0x80000000;
                auVar263._0_4_ = -fVar228;
                auVar263._4_4_ = 0x80000000;
                auVar263._8_4_ = 0x80000000;
                auVar263._12_4_ = 0x80000000;
                auVar190 = vinsertps_avx(ZEXT416((uint)(fVar227 * fVar226)),auVar234,0x10);
                auVar5 = vmovsldup_avx(ZEXT416((uint)(local_a80._0_4_ * fVar227 * fVar226 -
                                                     auVar5._0_4_ * fVar228)));
                auVar190 = vdivps_avx(auVar190,auVar5);
                auVar150 = ZEXT416((uint)(fVar229 - auVar209._0_4_));
                auVar209 = vinsertps_avx(auVar106,auVar150,0x10);
                auVar211._0_4_ = auVar209._0_4_ * auVar190._0_4_;
                auVar211._4_4_ = auVar209._4_4_ * auVar190._4_4_;
                auVar211._8_4_ = auVar209._8_4_ * auVar190._8_4_;
                auVar211._12_4_ = auVar209._12_4_ * auVar190._12_4_;
                auVar190 = vinsertps_avx(auVar263,local_a80._0_16_,0x1c);
                auVar190 = vdivps_avx(auVar190,auVar5);
                auVar191._0_4_ = auVar209._0_4_ * auVar190._0_4_;
                auVar191._4_4_ = auVar209._4_4_ * auVar190._4_4_;
                auVar191._8_4_ = auVar209._8_4_ * auVar190._8_4_;
                auVar191._12_4_ = auVar209._12_4_ * auVar190._12_4_;
                auVar190 = vhaddps_avx(auVar211,auVar211);
                auVar209 = vhaddps_avx(auVar191,auVar191);
                fVar224 = fVar224 - auVar190._0_4_;
                fVar226 = auVar395._0_4_ - auVar209._0_4_;
                auVar395 = ZEXT464((uint)fVar226);
                auVar235._8_4_ = 0x7fffffff;
                auVar235._0_8_ = 0x7fffffff7fffffff;
                auVar235._12_4_ = 0x7fffffff;
                auVar223 = ZEXT1664(auVar235);
                auVar106 = vandps_avx(auVar106,auVar235);
                if ((float)local_a60._0_4_ <= auVar106._0_4_) {
LAB_010c5df4:
                  bVar73 = false;
                }
                else {
                  auVar106 = vandps_avx(auVar150,auVar235);
                  if ((float)local_820._0_4_ * 1.9073486e-06 + auVar4._0_4_ + (float)local_a60._0_4_
                      <= auVar106._0_4_) goto LAB_010c5df4;
                  fVar226 = fVar226 + (float)local_920._0_4_;
                  auVar395 = ZEXT464((uint)fVar226);
                  bVar73 = true;
                  if (((fVar206 <= fVar226) &&
                      (fVar227 = *(float *)(ray + k * 4 + 0x100), fVar226 <= fVar227)) &&
                     ((0.0 <= fVar224 && (fVar224 <= 1.0)))) {
                    auVar151 = vrsqrtss_avx(auVar151,auVar151);
                    fVar228 = auVar151._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar96].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar151 = ZEXT416((uint)(fVar228 * 1.5 +
                                               fVar225 * -0.5 * fVar228 * fVar228 * fVar228));
                      auVar151 = vshufps_avx(auVar151,auVar151,0);
                      local_b80 = auVar3._0_4_;
                      fStack_b7c = auVar3._4_4_;
                      fStack_b78 = auVar3._8_4_;
                      fStack_b74 = auVar3._12_4_;
                      auVar152._0_4_ = auVar151._0_4_ * local_b80;
                      auVar152._4_4_ = auVar151._4_4_ * fStack_b7c;
                      auVar152._8_4_ = auVar151._8_4_ * fStack_b78;
                      auVar152._12_4_ = auVar151._12_4_ * fStack_b74;
                      auVar108._0_4_ = auVar292._0_4_ + auVar6._0_4_ * auVar152._0_4_;
                      auVar108._4_4_ = auVar292._4_4_ + auVar6._4_4_ * auVar152._4_4_;
                      auVar108._8_4_ = auVar292._8_4_ + auVar6._8_4_ * auVar152._8_4_;
                      auVar108._12_4_ = auVar292._12_4_ + auVar6._12_4_ * auVar152._12_4_;
                      auVar151 = vshufps_avx(auVar152,auVar152,0xc9);
                      auVar3 = vshufps_avx(auVar292,auVar292,0xc9);
                      auVar153._0_4_ = auVar3._0_4_ * auVar152._0_4_;
                      auVar153._4_4_ = auVar3._4_4_ * auVar152._4_4_;
                      auVar153._8_4_ = auVar3._8_4_ * auVar152._8_4_;
                      auVar153._12_4_ = auVar3._12_4_ * auVar152._12_4_;
                      auVar192._0_4_ = auVar292._0_4_ * auVar151._0_4_;
                      auVar192._4_4_ = auVar292._4_4_ * auVar151._4_4_;
                      auVar192._8_4_ = auVar292._8_4_ * auVar151._8_4_;
                      auVar192._12_4_ = auVar292._12_4_ * auVar151._12_4_;
                      auVar4 = vsubps_avx(auVar192,auVar153);
                      auVar151 = vshufps_avx(auVar4,auVar4,0xc9);
                      auVar3 = vshufps_avx(auVar108,auVar108,0xc9);
                      auVar193._0_4_ = auVar3._0_4_ * auVar151._0_4_;
                      auVar193._4_4_ = auVar3._4_4_ * auVar151._4_4_;
                      auVar193._8_4_ = auVar3._8_4_ * auVar151._8_4_;
                      auVar193._12_4_ = auVar3._12_4_ * auVar151._12_4_;
                      auVar151 = vshufps_avx(auVar4,auVar4,0xd2);
                      auVar109._0_4_ = auVar108._0_4_ * auVar151._0_4_;
                      auVar109._4_4_ = auVar108._4_4_ * auVar151._4_4_;
                      auVar109._8_4_ = auVar108._8_4_ * auVar151._8_4_;
                      auVar109._12_4_ = auVar108._12_4_ * auVar151._12_4_;
                      auVar151 = vsubps_avx(auVar193,auVar109);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar226;
                        uVar1 = vextractps_avx(auVar151,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                        uVar1 = vextractps_avx(auVar151,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar151._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar224;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar94;
                        *(uint *)(ray + k * 4 + 0x240) = uVar96;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar9 = context->user;
                        auStack_5b0 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                        auStack_610 = vshufps_avx(auVar151,auVar151,0x55);
                        auStack_5f0 = vshufps_avx(auVar151,auVar151,0xaa);
                        auStack_5d0 = vshufps_avx(auVar151,auVar151,0);
                        local_620 = (RTCHitN  [16])auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = auStack_5d0;
                        local_5c0 = auStack_5b0;
                        local_5a0 = ZEXT832(0) << 0x20;
                        local_580 = local_500._0_8_;
                        uStack_578 = local_500._8_8_;
                        uStack_570 = local_500._16_8_;
                        uStack_568 = local_500._24_8_;
                        local_560 = local_4e0._0_8_;
                        uStack_558 = local_4e0._8_8_;
                        uStack_550 = local_4e0._16_8_;
                        uStack_548 = local_4e0._24_8_;
                        local_a30[1] = local_9a0;
                        *local_a30 = local_9a0;
                        local_540 = pRVar9->instID[0];
                        uStack_53c = local_540;
                        uStack_538 = local_540;
                        uStack_534 = local_540;
                        uStack_530 = local_540;
                        uStack_52c = local_540;
                        uStack_528 = local_540;
                        uStack_524 = local_540;
                        local_520 = pRVar9->instPrimID[0];
                        uStack_51c = local_520;
                        uStack_518 = local_520;
                        uStack_514 = local_520;
                        uStack_510 = local_520;
                        uStack_50c = local_520;
                        uStack_508 = local_520;
                        uStack_504 = local_520;
                        *(float *)(ray + k * 4 + 0x100) = fVar226;
                        local_b40 = *local_a38;
                        uStack_b38 = local_a38[1];
                        local_b30 = *local_a40;
                        uStack_b28 = local_a40[1];
                        local_ad0.valid = (int *)&local_b40;
                        local_ad0.geometryUserPtr = pGVar8->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_620;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->intersectionFilterN)(&local_ad0);
                        }
                        auVar83._8_8_ = uStack_b38;
                        auVar83._0_8_ = local_b40;
                        auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,auVar83);
                        auVar87._8_8_ = uStack_b28;
                        auVar87._0_8_ = local_b30;
                        auVar3 = vpcmpeqd_avx((undefined1  [16])0x0,auVar87);
                        auVar125._16_16_ = auVar3;
                        auVar125._0_16_ = auVar151;
                        auVar114 = local_9a0 & ~auVar125;
                        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar114 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar114 >> 0x7f,0) == '\0')
                              && (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar114 >> 0xbf,0) == '\0') &&
                            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar114[0x1f]) {
                          auVar126._0_4_ = auVar151._0_4_ ^ local_9a0._0_4_;
                          auVar126._4_4_ = auVar151._4_4_ ^ local_9a0._4_4_;
                          auVar126._8_4_ = auVar151._8_4_ ^ local_9a0._8_4_;
                          auVar126._12_4_ = auVar151._12_4_ ^ local_9a0._12_4_;
                          auVar126._16_4_ = auVar3._0_4_ ^ local_9a0._16_4_;
                          auVar126._20_4_ = auVar3._4_4_ ^ local_9a0._20_4_;
                          auVar126._24_4_ = auVar3._8_4_ ^ local_9a0._24_4_;
                          auVar126._28_4_ = auVar3._12_4_ ^ local_9a0._28_4_;
                          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var10 = context->args->filter;
                          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var10)(&local_ad0);
                            auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar84._8_8_ = uStack_b38;
                          auVar84._0_8_ = local_b40;
                          auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,auVar84);
                          auVar88._8_8_ = uStack_b28;
                          auVar88._0_8_ = local_b30;
                          auVar3 = vpcmpeqd_avx((undefined1  [16])0x0,auVar88);
                          auVar173._16_16_ = auVar3;
                          auVar173._0_16_ = auVar151;
                          auVar126._0_4_ = auVar151._0_4_ ^ local_9a0._0_4_;
                          auVar126._4_4_ = auVar151._4_4_ ^ local_9a0._4_4_;
                          auVar126._8_4_ = auVar151._8_4_ ^ local_9a0._8_4_;
                          auVar126._12_4_ = auVar151._12_4_ ^ local_9a0._12_4_;
                          auVar126._16_4_ = auVar3._0_4_ ^ local_9a0._16_4_;
                          auVar126._20_4_ = auVar3._4_4_ ^ local_9a0._20_4_;
                          auVar126._24_4_ = auVar3._8_4_ ^ local_9a0._24_4_;
                          auVar126._28_4_ = auVar3._12_4_ ^ local_9a0._28_4_;
                          auVar114 = local_9a0 & ~auVar173;
                          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar114 >> 0x7f,0) != '\0') ||
                                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar114 >> 0xbf,0) != '\0') ||
                              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar114[0x1f] < '\0') {
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])local_ad0.hit);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x100));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar114;
                          }
                        }
                        auVar395 = ZEXT464((uint)fVar226);
                        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar126 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar126 >> 0x7f,0) == '\0')
                              && (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar126 >> 0xbf,0) == '\0') &&
                            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar126[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar227;
                        }
                      }
                    }
                  }
                }
                bVar100 = lVar98 != 0;
                lVar98 = lVar98 + -1;
              } while ((!bVar73) && (bVar100));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar127._4_4_ = uVar1;
              auVar127._0_4_ = uVar1;
              auVar127._8_4_ = uVar1;
              auVar127._12_4_ = uVar1;
              auVar127._16_4_ = uVar1;
              auVar127._20_4_ = uVar1;
              auVar127._24_4_ = uVar1;
              auVar127._28_4_ = uVar1;
              auVar123 = vcmpps_avx(_local_8a0,auVar127,2);
              auVar114 = vandps_avx(auVar123,local_720);
              auVar123 = local_720 & auVar123;
              uVar95 = local_760;
              auVar350 = local_a20;
              local_720 = auVar114;
            } while ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar123 >> 0x7f,0) != '\0') ||
                       (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar123 >> 0xbf,0) != '\0') ||
                     (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar123[0x1f] < '\0');
          }
          auVar128._0_4_ =
               (float)local_8e0._0_4_ * (float)local_840._0_4_ +
               (float)local_900._0_4_ * (float)local_860._0_4_ +
               (float)local_8c0._0_4_ * (float)local_880._0_4_;
          auVar128._4_4_ =
               (float)local_8e0._4_4_ * (float)local_840._4_4_ +
               (float)local_900._4_4_ * (float)local_860._4_4_ +
               (float)local_8c0._4_4_ * (float)local_880._4_4_;
          auVar128._8_4_ =
               fStack_8d8 * fStack_838 + fStack_8f8 * fStack_858 + fStack_8b8 * fStack_878;
          auVar128._12_4_ =
               fStack_8d4 * fStack_834 + fStack_8f4 * fStack_854 + fStack_8b4 * fStack_874;
          auVar128._16_4_ =
               fStack_8d0 * fStack_830 + fStack_8f0 * fStack_850 + fStack_8b0 * fStack_870;
          auVar128._20_4_ =
               fStack_8cc * fStack_82c + fStack_8ec * fStack_84c + fStack_8ac * fStack_86c;
          auVar128._24_4_ =
               fStack_8c8 * fStack_828 + fStack_8e8 * fStack_848 + fStack_8a8 * fStack_868;
          auVar128._28_4_ = fStack_8c4 + fStack_8e4 + fStack_8a4;
          auVar174._8_4_ = 0x7fffffff;
          auVar174._0_8_ = 0x7fffffff7fffffff;
          auVar174._12_4_ = 0x7fffffff;
          auVar174._16_4_ = 0x7fffffff;
          auVar174._20_4_ = 0x7fffffff;
          auVar174._24_4_ = 0x7fffffff;
          auVar174._28_4_ = 0x7fffffff;
          auVar114 = vandps_avx(auVar128,auVar174);
          auVar175._8_4_ = 0x3e99999a;
          auVar175._0_8_ = 0x3e99999a3e99999a;
          auVar175._12_4_ = 0x3e99999a;
          auVar175._16_4_ = 0x3e99999a;
          auVar175._20_4_ = 0x3e99999a;
          auVar175._24_4_ = 0x3e99999a;
          auVar175._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar175,1);
          auVar123 = vorps_avx(auVar114,local_700);
          auVar176._0_4_ = auVar350._0_4_ + (float)local_a00._0_4_;
          auVar176._4_4_ = auVar350._4_4_ + (float)local_a00._4_4_;
          auVar176._8_4_ = auVar350._8_4_ + fStack_9f8;
          auVar176._12_4_ = auVar350._12_4_ + fStack_9f4;
          auVar176._16_4_ = auVar350._16_4_ + fStack_9f0;
          auVar176._20_4_ = auVar350._20_4_ + fStack_9ec;
          auVar176._24_4_ = auVar350._24_4_ + fStack_9e8;
          auVar176._28_4_ = auVar350._28_4_ + fStack_9e4;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar201._4_4_ = uVar1;
          auVar201._0_4_ = uVar1;
          auVar201._8_4_ = uVar1;
          auVar201._12_4_ = uVar1;
          auVar201._16_4_ = uVar1;
          auVar201._20_4_ = uVar1;
          auVar201._24_4_ = uVar1;
          auVar201._28_4_ = uVar1;
          auVar114 = vcmpps_avx(auVar176,auVar201,2);
          _local_8e0 = vandps_avx(auVar114,local_6c0);
          auVar177._8_4_ = 3;
          auVar177._0_8_ = 0x300000003;
          auVar177._12_4_ = 3;
          auVar177._16_4_ = 3;
          auVar177._20_4_ = 3;
          auVar177._24_4_ = 3;
          auVar177._28_4_ = 3;
          auVar202._8_4_ = 2;
          auVar202._0_8_ = 0x200000002;
          auVar202._12_4_ = 2;
          auVar202._16_4_ = 2;
          auVar202._20_4_ = 2;
          auVar202._24_4_ = 2;
          auVar202._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar202,auVar177,auVar123);
          auVar151 = vpcmpgtd_avx(auVar114._16_16_,local_7a0);
          auVar3 = vpshufd_avx(local_6e0._0_16_,0);
          auVar3 = vpcmpgtd_avx(auVar114._0_16_,auVar3);
          auVar178._16_16_ = auVar151;
          auVar178._0_16_ = auVar3;
          _local_900 = vblendps_avx(ZEXT1632(auVar3),auVar178,0xf0);
          auVar114 = vandnps_avx(_local_900,_local_8e0);
          auVar123 = _local_8e0 & ~_local_900;
          if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar123 >> 0x7f,0) != '\0') ||
                (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar123 >> 0xbf,0) != '\0') ||
              (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar123[0x1f] < '\0') {
            local_820 = _local_440;
            local_8a0._4_4_ = (float)local_440._4_4_ + (float)local_a00._4_4_;
            local_8a0._0_4_ = (float)local_440._0_4_ + (float)local_a00._0_4_;
            fStack_898 = fStack_438 + fStack_9f8;
            fStack_894 = fStack_434 + fStack_9f4;
            fStack_890 = fStack_430 + fStack_9f0;
            fStack_88c = fStack_42c + fStack_9ec;
            fStack_888 = fStack_428 + fStack_9e8;
            fStack_884 = fStack_424 + fStack_9e4;
            do {
              auVar236 = auVar223._0_16_;
              auVar179._8_4_ = 0x7f800000;
              auVar179._0_8_ = 0x7f8000007f800000;
              auVar179._12_4_ = 0x7f800000;
              auVar179._16_4_ = 0x7f800000;
              auVar179._20_4_ = 0x7f800000;
              auVar179._24_4_ = 0x7f800000;
              auVar179._28_4_ = 0x7f800000;
              auVar123 = vblendvps_avx(auVar179,local_820,auVar114);
              auVar350 = vshufps_avx(auVar123,auVar123,0xb1);
              auVar350 = vminps_avx(auVar123,auVar350);
              auVar13 = vshufpd_avx(auVar350,auVar350,5);
              auVar350 = vminps_avx(auVar350,auVar13);
              auVar13 = vperm2f128_avx(auVar350,auVar350,1);
              auVar350 = vminps_avx(auVar350,auVar13);
              auVar350 = vcmpps_avx(auVar123,auVar350,0);
              auVar13 = auVar114 & auVar350;
              auVar123 = auVar114;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar123 = vandps_avx(auVar350,auVar114);
              }
              uVar97 = vmovmskps_avx(auVar123);
              uVar11 = 0;
              if (uVar97 != 0) {
                for (; (uVar97 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar95 = (ulong)uVar11;
              local_740 = auVar114;
              *(undefined4 *)(local_740 + uVar95 * 4) = 0;
              fVar224 = local_660[uVar95];
              uVar11 = *(uint *)(local_420 + uVar95 * 4);
              fVar225 = auVar17._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar225 = sqrtf((float)local_9c0._0_4_);
                auVar236._8_4_ = 0x7fffffff;
                auVar236._0_8_ = 0x7fffffff7fffffff;
                auVar236._12_4_ = 0x7fffffff;
              }
              auVar245 = ZEXT464(uVar11);
              auVar3 = vminps_avx(_local_ae0,_local_b00);
              auVar151 = vmaxps_avx(_local_ae0,_local_b00);
              auVar4 = vminps_avx(_local_af0,_local_b10);
              auVar106 = vminps_avx(auVar3,auVar4);
              auVar3 = vmaxps_avx(_local_af0,_local_b10);
              auVar4 = vmaxps_avx(auVar151,auVar3);
              auVar151 = vandps_avx(auVar106,auVar236);
              auVar3 = vandps_avx(auVar4,auVar236);
              auVar151 = vmaxps_avx(auVar151,auVar3);
              auVar3 = vmovshdup_avx(auVar151);
              auVar3 = vmaxss_avx(auVar3,auVar151);
              auVar151 = vshufpd_avx(auVar151,auVar151,1);
              auVar151 = vmaxss_avx(auVar151,auVar3);
              local_aa0._0_4_ = auVar151._0_4_ * 1.9073486e-06;
              local_a60._0_4_ = fVar225 * 1.9073486e-06;
              local_800._0_16_ = vshufps_avx(auVar4,auVar4,0xff);
              lVar98 = 4;
              do {
                fVar229 = 1.0 - fVar224;
                auVar151 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                fVar225 = auVar151._0_4_;
                fVar226 = auVar151._4_4_;
                fVar227 = auVar151._8_4_;
                fVar228 = auVar151._12_4_;
                auVar151 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                fVar230 = auVar151._0_4_;
                fVar246 = auVar151._4_4_;
                fVar247 = auVar151._8_4_;
                fVar248 = auVar151._12_4_;
                fVar249 = (float)local_af0._0_4_ * fVar225 + (float)local_b00._0_4_ * fVar230;
                fVar252 = (float)local_af0._4_4_ * fVar226 + (float)local_b00._4_4_ * fVar246;
                fVar255 = fStack_ae8 * fVar227 + fStack_af8 * fVar247;
                fVar258 = fStack_ae4 * fVar228 + fStack_af4 * fVar248;
                auVar264._0_4_ =
                     fVar230 * ((float)local_b00._0_4_ * fVar225 + fVar230 * (float)local_ae0._0_4_)
                     + fVar225 * fVar249;
                auVar264._4_4_ =
                     fVar246 * ((float)local_b00._4_4_ * fVar226 + fVar246 * (float)local_ae0._4_4_)
                     + fVar226 * fVar252;
                auVar264._8_4_ =
                     fVar247 * (fStack_af8 * fVar227 + fVar247 * fStack_ad8) + fVar227 * fVar255;
                auVar264._12_4_ =
                     fVar248 * (fStack_af4 * fVar228 + fVar248 * fStack_ad4) + fVar228 * fVar258;
                auVar212._0_4_ =
                     fVar230 * fVar249 +
                     fVar225 * (fVar225 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar230)
                ;
                auVar212._4_4_ =
                     fVar246 * fVar252 +
                     fVar226 * (fVar226 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar246)
                ;
                auVar212._8_4_ =
                     fVar247 * fVar255 + fVar227 * (fVar227 * fStack_b08 + fStack_ae8 * fVar247);
                auVar212._12_4_ =
                     fVar248 * fVar258 + fVar228 * (fVar228 * fStack_b04 + fStack_ae4 * fVar248);
                auVar151 = vshufps_avx(auVar245._0_16_,auVar245._0_16_,0);
                auVar154._0_4_ = auVar151._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar154._4_4_ = auVar151._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar154._8_4_ = auVar151._8_4_ * fStack_9a8 + 0.0;
                auVar154._12_4_ = auVar151._12_4_ * fStack_9a4 + 0.0;
                auVar110._0_4_ = fVar230 * auVar264._0_4_ + fVar225 * auVar212._0_4_;
                auVar110._4_4_ = fVar246 * auVar264._4_4_ + fVar226 * auVar212._4_4_;
                auVar110._8_4_ = fVar247 * auVar264._8_4_ + fVar227 * auVar212._8_4_;
                auVar110._12_4_ = fVar248 * auVar264._12_4_ + fVar228 * auVar212._12_4_;
                local_980._0_16_ = auVar110;
                auVar3 = vsubps_avx(auVar154,auVar110);
                auVar151 = vdpps_avx(auVar3,auVar3,0x7f);
                fVar225 = auVar151._0_4_;
                if (fVar225 < 0.0) {
                  local_a80._0_16_ = auVar212;
                  fVar226 = sqrtf(fVar225);
                  auVar212 = local_a80._0_16_;
                }
                else {
                  auVar4 = vsqrtss_avx(auVar151,auVar151);
                  fVar226 = auVar4._0_4_;
                }
                auVar4 = vsubps_avx(auVar212,auVar264);
                auVar293._0_4_ = auVar4._0_4_ * 3.0;
                auVar293._4_4_ = auVar4._4_4_ * 3.0;
                auVar293._8_4_ = auVar4._8_4_ * 3.0;
                auVar293._12_4_ = auVar4._12_4_ * 3.0;
                auVar4 = vshufps_avx(ZEXT416((uint)(fVar224 * 6.0)),ZEXT416((uint)(fVar224 * 6.0)),0
                                    );
                auVar106 = ZEXT416((uint)((fVar229 - (fVar224 + fVar224)) * 6.0));
                auVar190 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = ZEXT416((uint)((fVar224 - (fVar229 + fVar229)) * 6.0));
                auVar209 = vshufps_avx(auVar106,auVar106,0);
                auVar5 = vshufps_avx(ZEXT416((uint)(fVar229 * 6.0)),ZEXT416((uint)(fVar229 * 6.0)),0
                                    );
                auVar106 = vdpps_avx(auVar293,auVar293,0x7f);
                auVar155._0_4_ =
                     auVar5._0_4_ * (float)local_ae0._0_4_ +
                     auVar209._0_4_ * (float)local_b00._0_4_ +
                     auVar4._0_4_ * (float)local_b10._0_4_ + auVar190._0_4_ * (float)local_af0._0_4_
                ;
                auVar155._4_4_ =
                     auVar5._4_4_ * (float)local_ae0._4_4_ +
                     auVar209._4_4_ * (float)local_b00._4_4_ +
                     auVar4._4_4_ * (float)local_b10._4_4_ + auVar190._4_4_ * (float)local_af0._4_4_
                ;
                auVar155._8_4_ =
                     auVar5._8_4_ * fStack_ad8 +
                     auVar209._8_4_ * fStack_af8 +
                     auVar4._8_4_ * fStack_b08 + auVar190._8_4_ * fStack_ae8;
                auVar155._12_4_ =
                     auVar5._12_4_ * fStack_ad4 +
                     auVar209._12_4_ * fStack_af4 +
                     auVar4._12_4_ * fStack_b04 + auVar190._12_4_ * fStack_ae4;
                auVar4 = vblendps_avx(auVar106,_DAT_01feba10,0xe);
                auVar190 = vrsqrtss_avx(auVar4,auVar4);
                fVar228 = auVar190._0_4_;
                fVar227 = auVar106._0_4_;
                auVar190 = vdpps_avx(auVar293,auVar155,0x7f);
                auVar209 = vshufps_avx(auVar106,auVar106,0);
                auVar156._0_4_ = auVar155._0_4_ * auVar209._0_4_;
                auVar156._4_4_ = auVar155._4_4_ * auVar209._4_4_;
                auVar156._8_4_ = auVar155._8_4_ * auVar209._8_4_;
                auVar156._12_4_ = auVar155._12_4_ * auVar209._12_4_;
                auVar190 = vshufps_avx(auVar190,auVar190,0);
                auVar237._0_4_ = auVar293._0_4_ * auVar190._0_4_;
                auVar237._4_4_ = auVar293._4_4_ * auVar190._4_4_;
                auVar237._8_4_ = auVar293._8_4_ * auVar190._8_4_;
                auVar237._12_4_ = auVar293._12_4_ * auVar190._12_4_;
                auVar5 = vsubps_avx(auVar156,auVar237);
                auVar190 = vrcpss_avx(auVar4,auVar4);
                auVar4 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                    ZEXT416((uint)(auVar245._0_4_ * (float)local_a60._0_4_)));
                auVar190 = ZEXT416((uint)(auVar190._0_4_ * (2.0 - fVar227 * auVar190._0_4_)));
                auVar190 = vshufps_avx(auVar190,auVar190,0);
                uVar95 = CONCAT44(auVar293._4_4_,auVar293._0_4_);
                auVar265._0_8_ = uVar95 ^ 0x8000000080000000;
                auVar265._8_4_ = -auVar293._8_4_;
                auVar265._12_4_ = -auVar293._12_4_;
                auVar209 = ZEXT416((uint)(fVar228 * 1.5 +
                                         fVar227 * -0.5 * fVar228 * fVar228 * fVar228));
                auVar209 = vshufps_avx(auVar209,auVar209,0);
                auVar213._0_4_ = auVar209._0_4_ * auVar5._0_4_ * auVar190._0_4_;
                auVar213._4_4_ = auVar209._4_4_ * auVar5._4_4_ * auVar190._4_4_;
                auVar213._8_4_ = auVar209._8_4_ * auVar5._8_4_ * auVar190._8_4_;
                auVar213._12_4_ = auVar209._12_4_ * auVar5._12_4_ * auVar190._12_4_;
                auVar345._0_4_ = auVar293._0_4_ * auVar209._0_4_;
                auVar345._4_4_ = auVar293._4_4_ * auVar209._4_4_;
                auVar345._8_4_ = auVar293._8_4_ * auVar209._8_4_;
                auVar345._12_4_ = auVar293._12_4_ * auVar209._12_4_;
                if (fVar227 < 0.0) {
                  local_a80._0_4_ = fVar226;
                  local_940._0_16_ = auVar265;
                  local_a20._0_16_ = auVar345;
                  local_9e0._0_16_ = auVar213;
                  fVar227 = sqrtf(fVar227);
                  auVar213 = local_9e0._0_16_;
                  auVar265 = local_940._0_16_;
                  auVar345 = local_a20._0_16_;
                  fVar226 = (float)local_a80._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar227 = auVar106._0_4_;
                }
                auVar106 = vdpps_avx(auVar3,auVar345,0x7f);
                fVar226 = ((float)local_aa0._0_4_ / fVar227) * (fVar226 + 1.0) +
                          auVar4._0_4_ + fVar226 * (float)local_aa0._0_4_;
                auVar190 = vdpps_avx(auVar265,auVar345,0x7f);
                auVar209 = vdpps_avx(auVar3,auVar213,0x7f);
                auVar5 = vdpps_avx(_local_9b0,auVar345,0x7f);
                auVar6 = vdpps_avx(auVar3,auVar265,0x7f);
                fVar227 = auVar190._0_4_ + auVar209._0_4_;
                fVar228 = auVar106._0_4_;
                auVar111._0_4_ = fVar228 * fVar228;
                auVar111._4_4_ = auVar106._4_4_ * auVar106._4_4_;
                auVar111._8_4_ = auVar106._8_4_ * auVar106._8_4_;
                auVar111._12_4_ = auVar106._12_4_ * auVar106._12_4_;
                auVar209 = vsubps_avx(auVar151,auVar111);
                auVar190 = vdpps_avx(auVar3,_local_9b0,0x7f);
                fVar229 = auVar6._0_4_ - fVar228 * fVar227;
                fVar230 = auVar190._0_4_ - fVar228 * auVar5._0_4_;
                auVar190 = vrsqrtss_avx(auVar209,auVar209);
                fVar246 = auVar209._0_4_;
                fVar228 = auVar190._0_4_;
                fVar228 = fVar228 * 1.5 + fVar246 * -0.5 * fVar228 * fVar228 * fVar228;
                if (fVar246 < 0.0) {
                  local_a80._0_16_ = auVar106;
                  local_940._0_4_ = fVar226;
                  local_a20._0_16_ = ZEXT416((uint)fVar227);
                  local_9e0._0_16_ = auVar5;
                  local_960._0_4_ = fVar229;
                  local_7c0._0_4_ = fVar230;
                  local_7e0._0_4_ = fVar228;
                  fVar246 = sqrtf(fVar246);
                  fVar226 = (float)local_940._0_4_;
                  fVar228 = (float)local_7e0._0_4_;
                  fVar229 = (float)local_960._0_4_;
                  fVar230 = (float)local_7c0._0_4_;
                  auVar5 = local_9e0._0_16_;
                  auVar106 = local_a80._0_16_;
                  auVar190 = local_a20._0_16_;
                }
                else {
                  auVar190 = vsqrtss_avx(auVar209,auVar209);
                  fVar246 = auVar190._0_4_;
                  auVar190 = ZEXT416((uint)fVar227);
                }
                auVar395 = ZEXT1664(auVar293);
                auVar103 = vpermilps_avx(local_980._0_16_,0xff);
                auVar150 = vshufps_avx(auVar293,auVar293,0xff);
                fVar227 = fVar229 * fVar228 - auVar150._0_4_;
                auVar238._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                auVar238._8_4_ = auVar5._8_4_ ^ 0x80000000;
                auVar238._12_4_ = auVar5._12_4_ ^ 0x80000000;
                auVar266._0_4_ = -fVar227;
                auVar266._4_4_ = 0x80000000;
                auVar266._8_4_ = 0x80000000;
                auVar266._12_4_ = 0x80000000;
                auVar209 = vinsertps_avx(ZEXT416((uint)(fVar230 * fVar228)),auVar238,0x10);
                auVar6 = vmovsldup_avx(ZEXT416((uint)(auVar190._0_4_ * fVar230 * fVar228 -
                                                     auVar5._0_4_ * fVar227)));
                auVar209 = vdivps_avx(auVar209,auVar6);
                auVar103 = ZEXT416((uint)(fVar246 - auVar103._0_4_));
                auVar5 = vinsertps_avx(auVar106,auVar103,0x10);
                auVar214._0_4_ = auVar5._0_4_ * auVar209._0_4_;
                auVar214._4_4_ = auVar5._4_4_ * auVar209._4_4_;
                auVar214._8_4_ = auVar5._8_4_ * auVar209._8_4_;
                auVar214._12_4_ = auVar5._12_4_ * auVar209._12_4_;
                auVar190 = vinsertps_avx(auVar266,auVar190,0x1c);
                auVar190 = vdivps_avx(auVar190,auVar6);
                auVar194._0_4_ = auVar5._0_4_ * auVar190._0_4_;
                auVar194._4_4_ = auVar5._4_4_ * auVar190._4_4_;
                auVar194._8_4_ = auVar5._8_4_ * auVar190._8_4_;
                auVar194._12_4_ = auVar5._12_4_ * auVar190._12_4_;
                auVar190 = vhaddps_avx(auVar214,auVar214);
                auVar209 = vhaddps_avx(auVar194,auVar194);
                fVar224 = fVar224 - auVar190._0_4_;
                fVar227 = auVar245._0_4_ - auVar209._0_4_;
                auVar245 = ZEXT464((uint)fVar227);
                auVar239._8_4_ = 0x7fffffff;
                auVar239._0_8_ = 0x7fffffff7fffffff;
                auVar239._12_4_ = 0x7fffffff;
                auVar223 = ZEXT1664(auVar239);
                auVar106 = vandps_avx(auVar106,auVar239);
                if (fVar226 <= auVar106._0_4_) {
LAB_010c6a49:
                  bVar73 = false;
                }
                else {
                  auVar106 = vandps_avx(auVar103,auVar239);
                  if ((float)local_800._0_4_ * 1.9073486e-06 + auVar4._0_4_ + fVar226 <=
                      auVar106._0_4_) goto LAB_010c6a49;
                  fVar227 = fVar227 + (float)local_920._0_4_;
                  auVar245 = ZEXT464((uint)fVar227);
                  bVar73 = true;
                  if ((((fVar206 <= fVar227) &&
                       (fVar226 = *(float *)(ray + k * 4 + 0x100), fVar227 <= fVar226)) &&
                      (0.0 <= fVar224)) && (fVar224 <= 1.0)) {
                    auVar151 = vrsqrtss_avx(auVar151,auVar151);
                    fVar228 = auVar151._0_4_;
                    pGVar8 = (context->scene->geometries).items[uVar96].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar151 = ZEXT416((uint)(fVar228 * 1.5 +
                                               fVar225 * -0.5 * fVar228 * fVar228 * fVar228));
                      auVar151 = vshufps_avx(auVar151,auVar151,0);
                      local_b80 = auVar3._0_4_;
                      fStack_b7c = auVar3._4_4_;
                      fStack_b78 = auVar3._8_4_;
                      fStack_b74 = auVar3._12_4_;
                      auVar157._0_4_ = auVar151._0_4_ * local_b80;
                      auVar157._4_4_ = auVar151._4_4_ * fStack_b7c;
                      auVar157._8_4_ = auVar151._8_4_ * fStack_b78;
                      auVar157._12_4_ = auVar151._12_4_ * fStack_b74;
                      auVar112._0_4_ = auVar293._0_4_ + auVar150._0_4_ * auVar157._0_4_;
                      auVar112._4_4_ = auVar293._4_4_ + auVar150._4_4_ * auVar157._4_4_;
                      auVar112._8_4_ = auVar293._8_4_ + auVar150._8_4_ * auVar157._8_4_;
                      auVar112._12_4_ = auVar293._12_4_ + auVar150._12_4_ * auVar157._12_4_;
                      auVar151 = vshufps_avx(auVar157,auVar157,0xc9);
                      auVar3 = vshufps_avx(auVar293,auVar293,0xc9);
                      auVar158._0_4_ = auVar3._0_4_ * auVar157._0_4_;
                      auVar158._4_4_ = auVar3._4_4_ * auVar157._4_4_;
                      auVar158._8_4_ = auVar3._8_4_ * auVar157._8_4_;
                      auVar158._12_4_ = auVar3._12_4_ * auVar157._12_4_;
                      auVar195._0_4_ = auVar293._0_4_ * auVar151._0_4_;
                      auVar195._4_4_ = auVar293._4_4_ * auVar151._4_4_;
                      auVar195._8_4_ = auVar293._8_4_ * auVar151._8_4_;
                      auVar195._12_4_ = auVar293._12_4_ * auVar151._12_4_;
                      auVar4 = vsubps_avx(auVar195,auVar158);
                      auVar151 = vshufps_avx(auVar4,auVar4,0xc9);
                      auVar3 = vshufps_avx(auVar112,auVar112,0xc9);
                      auVar196._0_4_ = auVar3._0_4_ * auVar151._0_4_;
                      auVar196._4_4_ = auVar3._4_4_ * auVar151._4_4_;
                      auVar196._8_4_ = auVar3._8_4_ * auVar151._8_4_;
                      auVar196._12_4_ = auVar3._12_4_ * auVar151._12_4_;
                      auVar151 = vshufps_avx(auVar4,auVar4,0xd2);
                      auVar113._0_4_ = auVar112._0_4_ * auVar151._0_4_;
                      auVar113._4_4_ = auVar112._4_4_ * auVar151._4_4_;
                      auVar113._8_4_ = auVar112._8_4_ * auVar151._8_4_;
                      auVar113._12_4_ = auVar112._12_4_ * auVar151._12_4_;
                      auVar151 = vsubps_avx(auVar196,auVar113);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar227;
                        uVar1 = vextractps_avx(auVar151,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                        uVar1 = vextractps_avx(auVar151,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar151._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar224;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar94;
                        *(uint *)(ray + k * 4 + 0x240) = uVar96;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar9 = context->user;
                        auStack_5b0 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                        auStack_610 = vshufps_avx(auVar151,auVar151,0x55);
                        auStack_5f0 = vshufps_avx(auVar151,auVar151,0xaa);
                        auStack_5d0 = vshufps_avx(auVar151,auVar151,0);
                        local_620 = (RTCHitN  [16])auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = auStack_5d0;
                        local_5c0 = auStack_5b0;
                        local_5a0 = ZEXT832(0) << 0x20;
                        local_580 = local_500._0_8_;
                        uStack_578 = local_500._8_8_;
                        uStack_570 = local_500._16_8_;
                        uStack_568 = local_500._24_8_;
                        local_560 = local_4e0._0_8_;
                        uStack_558 = local_4e0._8_8_;
                        uStack_550 = local_4e0._16_8_;
                        uStack_548 = local_4e0._24_8_;
                        local_a30[1] = local_9a0;
                        *local_a30 = local_9a0;
                        local_540 = pRVar9->instID[0];
                        uStack_53c = local_540;
                        uStack_538 = local_540;
                        uStack_534 = local_540;
                        uStack_530 = local_540;
                        uStack_52c = local_540;
                        uStack_528 = local_540;
                        uStack_524 = local_540;
                        local_520 = pRVar9->instPrimID[0];
                        uStack_51c = local_520;
                        uStack_518 = local_520;
                        uStack_514 = local_520;
                        uStack_510 = local_520;
                        uStack_50c = local_520;
                        uStack_508 = local_520;
                        uStack_504 = local_520;
                        *(float *)(ray + k * 4 + 0x100) = fVar227;
                        local_b40 = *local_a38;
                        uStack_b38 = local_a38[1];
                        local_b30 = *local_a40;
                        uStack_b28 = local_a40[1];
                        local_ad0.valid = (int *)&local_b40;
                        local_ad0.geometryUserPtr = pGVar8->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_620;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar395 = ZEXT1664(auVar293);
                          (*pGVar8->intersectionFilterN)(&local_ad0);
                        }
                        auVar85._8_8_ = uStack_b38;
                        auVar85._0_8_ = local_b40;
                        auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,auVar85);
                        auVar89._8_8_ = uStack_b28;
                        auVar89._0_8_ = local_b30;
                        auVar3 = vpcmpeqd_avx((undefined1  [16])0x0,auVar89);
                        auVar129._16_16_ = auVar3;
                        auVar129._0_16_ = auVar151;
                        auVar114 = local_9a0 & ~auVar129;
                        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar114 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar114 >> 0x7f,0) == '\0')
                              && (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar114 >> 0xbf,0) == '\0') &&
                            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar114[0x1f]) {
                          auVar130._0_4_ = auVar151._0_4_ ^ local_9a0._0_4_;
                          auVar130._4_4_ = auVar151._4_4_ ^ local_9a0._4_4_;
                          auVar130._8_4_ = auVar151._8_4_ ^ local_9a0._8_4_;
                          auVar130._12_4_ = auVar151._12_4_ ^ local_9a0._12_4_;
                          auVar130._16_4_ = auVar3._0_4_ ^ local_9a0._16_4_;
                          auVar130._20_4_ = auVar3._4_4_ ^ local_9a0._20_4_;
                          auVar130._24_4_ = auVar3._8_4_ ^ local_9a0._24_4_;
                          auVar130._28_4_ = auVar3._12_4_ ^ local_9a0._28_4_;
                          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var10 = context->args->filter;
                          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar395 = ZEXT1664(auVar395._0_16_);
                            (*p_Var10)(&local_ad0);
                            auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar86._8_8_ = uStack_b38;
                          auVar86._0_8_ = local_b40;
                          auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,auVar86);
                          auVar90._8_8_ = uStack_b28;
                          auVar90._0_8_ = local_b30;
                          auVar3 = vpcmpeqd_avx((undefined1  [16])0x0,auVar90);
                          auVar180._16_16_ = auVar3;
                          auVar180._0_16_ = auVar151;
                          auVar130._0_4_ = auVar151._0_4_ ^ local_9a0._0_4_;
                          auVar130._4_4_ = auVar151._4_4_ ^ local_9a0._4_4_;
                          auVar130._8_4_ = auVar151._8_4_ ^ local_9a0._8_4_;
                          auVar130._12_4_ = auVar151._12_4_ ^ local_9a0._12_4_;
                          auVar130._16_4_ = auVar3._0_4_ ^ local_9a0._16_4_;
                          auVar130._20_4_ = auVar3._4_4_ ^ local_9a0._20_4_;
                          auVar130._24_4_ = auVar3._8_4_ ^ local_9a0._24_4_;
                          auVar130._28_4_ = auVar3._12_4_ ^ local_9a0._28_4_;
                          auVar114 = local_9a0 & ~auVar180;
                          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar114 >> 0x7f,0) != '\0') ||
                                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar114 >> 0xbf,0) != '\0') ||
                              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar114[0x1f] < '\0') {
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])local_ad0.hit);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar114;
                            auVar114 = vmaskmovps_avx(auVar130,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x100));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar114;
                          }
                        }
                        auVar245 = ZEXT464((uint)fVar227);
                        if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar130 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar130 >> 0x7f,0) == '\0')
                              && (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar130 >> 0xbf,0) == '\0') &&
                            (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar130[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar226;
                        }
                      }
                    }
                  }
                }
                bVar100 = lVar98 != 0;
                lVar98 = lVar98 + -1;
              } while ((!bVar73) && (bVar100));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar131._4_4_ = uVar1;
              auVar131._0_4_ = uVar1;
              auVar131._8_4_ = uVar1;
              auVar131._12_4_ = uVar1;
              auVar131._16_4_ = uVar1;
              auVar131._20_4_ = uVar1;
              auVar131._24_4_ = uVar1;
              auVar131._28_4_ = uVar1;
              auVar123 = vcmpps_avx(_local_8a0,auVar131,2);
              auVar114 = vandps_avx(auVar123,local_740);
              local_740 = local_740 & auVar123;
              uVar95 = local_760;
            } while ((((((((local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_740 >> 0x7f,0) != '\0') ||
                       (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_740 >> 0xbf,0) != '\0') ||
                     (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_740[0x1f] < '\0');
          }
          auVar114 = vandps_avx(local_6a0,local_680);
          auVar123 = vandps_avx(_local_900,_local_8e0);
          auVar302 = ZEXT3264(_local_a00);
          auVar203._0_4_ = local_a00._0_4_ + local_480._0_4_;
          auVar203._4_4_ = local_a00._4_4_ + local_480._4_4_;
          auVar203._8_4_ = local_a00._8_4_ + local_480._8_4_;
          auVar203._12_4_ = local_a00._12_4_ + local_480._12_4_;
          auVar203._16_4_ = local_a00._16_4_ + local_480._16_4_;
          auVar203._20_4_ = local_a00._20_4_ + local_480._20_4_;
          auVar203._24_4_ = local_a00._24_4_ + local_480._24_4_;
          auVar203._28_4_ = local_a00._28_4_ + local_480._28_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar243._4_4_ = uVar1;
          auVar243._0_4_ = uVar1;
          auVar243._8_4_ = uVar1;
          auVar243._12_4_ = uVar1;
          auVar243._16_4_ = uVar1;
          auVar243._20_4_ = uVar1;
          auVar243._24_4_ = uVar1;
          auVar243._28_4_ = uVar1;
          auVar350 = vcmpps_avx(auVar203,auVar243,2);
          auVar114 = vandps_avx(auVar350,auVar114);
          auVar275._0_4_ = local_a00._0_4_ + local_440._0_4_;
          auVar275._4_4_ = local_a00._4_4_ + local_440._4_4_;
          auVar275._8_4_ = local_a00._8_4_ + local_440._8_4_;
          auVar275._12_4_ = local_a00._12_4_ + local_440._12_4_;
          auVar275._16_4_ = local_a00._16_4_ + local_440._16_4_;
          auVar275._20_4_ = local_a00._20_4_ + local_440._20_4_;
          auVar275._24_4_ = local_a00._24_4_ + local_440._24_4_;
          auVar275._28_4_ = local_a00._28_4_ + local_440._28_4_;
          auVar350 = vcmpps_avx(auVar275,auVar243,2);
          auVar123 = vandps_avx(auVar350,auVar123);
          auVar123 = vorps_avx(auVar114,auVar123);
          if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar123 >> 0x7f,0) == '\0') &&
                (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0xbf,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar123[0x1f]) {
            auVar244._8_4_ = 0x3f800000;
            auVar244._0_8_ = &DAT_3f8000003f800000;
            auVar244._12_4_ = 0x3f800000;
            auVar244._16_4_ = 0x3f800000;
            auVar244._20_4_ = 0x3f800000;
            auVar244._24_4_ = 0x3f800000;
            auVar244._28_4_ = 0x3f800000;
            goto LAB_010c5017;
          }
          *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar123;
          auVar114 = vblendvps_avx(_local_440,_local_480,auVar114);
          *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar114;
          uVar2 = vmovlps_avx(auVar316);
          *(undefined8 *)(afStack_140 + uVar93 * 0x18) = uVar2;
          auStack_138[uVar93 * 0x18] = (int)uVar95 + 1;
          uVar93 = (ulong)((int)uVar93 + 1);
        }
        auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    auVar330 = ZEXT1664(auVar316);
    do {
      if ((int)uVar93 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar132._4_4_ = uVar1;
        auVar132._0_4_ = uVar1;
        auVar132._8_4_ = uVar1;
        auVar132._12_4_ = uVar1;
        auVar132._16_4_ = uVar1;
        auVar132._20_4_ = uVar1;
        auVar132._24_4_ = uVar1;
        auVar132._28_4_ = uVar1;
        auVar114 = vcmpps_avx(local_3e0,auVar132,2);
        uVar94 = vmovmskps_avx(auVar114);
        uVar94 = (uint)local_908 & uVar94;
        if (uVar94 == 0) {
          return;
        }
        goto LAB_010c4330;
      }
      uVar99 = (ulong)((int)uVar93 - 1);
      lVar98 = uVar99 * 0x60;
      auVar114 = *(undefined1 (*) [32])(auStack_160 + lVar98);
      auVar122._0_4_ = auVar302._0_4_ + auVar114._0_4_;
      auVar122._4_4_ = auVar302._4_4_ + auVar114._4_4_;
      auVar122._8_4_ = auVar302._8_4_ + auVar114._8_4_;
      auVar122._12_4_ = auVar302._12_4_ + auVar114._12_4_;
      auVar122._16_4_ = auVar302._16_4_ + auVar114._16_4_;
      auVar122._20_4_ = auVar302._20_4_ + auVar114._20_4_;
      auVar122._24_4_ = auVar302._24_4_ + auVar114._24_4_;
      auVar122._28_4_ = auVar302._28_4_ + auVar114._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar222._4_4_ = uVar1;
      auVar222._0_4_ = uVar1;
      auVar222._8_4_ = uVar1;
      auVar222._12_4_ = uVar1;
      auVar222._16_4_ = uVar1;
      auVar222._20_4_ = uVar1;
      auVar222._24_4_ = uVar1;
      auVar222._28_4_ = uVar1;
      auVar350 = vcmpps_avx(auVar122,auVar222,2);
      auVar123 = vandps_avx(auVar350,*(undefined1 (*) [32])(auStack_180 + lVar98));
      _local_620 = auVar123;
      auVar13 = *(undefined1 (*) [32])(auStack_180 + lVar98) & auVar350;
      bVar79 = (auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar80 = (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar77 = SUB321(auVar13 >> 0x7f,0) == '\0';
      bVar76 = (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar75 = SUB321(auVar13 >> 0xbf,0) == '\0';
      bVar100 = (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar73 = -1 < auVar13[0x1f];
      if (((((((!bVar79 || !bVar80) || !bVar78) || !bVar77) || !bVar76) || !bVar75) || !bVar100) ||
          !bVar73) {
        auVar199._8_4_ = 0x7f800000;
        auVar199._0_8_ = 0x7f8000007f800000;
        auVar199._12_4_ = 0x7f800000;
        auVar199._16_4_ = 0x7f800000;
        auVar199._20_4_ = 0x7f800000;
        auVar199._24_4_ = 0x7f800000;
        auVar199._28_4_ = 0x7f800000;
        auVar114 = vblendvps_avx(auVar199,auVar114,auVar123);
        auVar350 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar350 = vminps_avx(auVar114,auVar350);
        auVar13 = vshufpd_avx(auVar350,auVar350,5);
        auVar13 = vminps_avx(auVar350,auVar13);
        auVar350 = vperm2f128_avx(auVar13,auVar13,1);
        auVar13 = vminps_avx(auVar13,auVar350);
        auVar114 = vcmpps_avx(auVar114,auVar13,0);
        auVar13 = auVar123 & auVar114;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar123 = vandps_avx(auVar114,auVar123);
        }
        fVar224 = afStack_140[uVar99 * 0x18 + 1];
        uVar95 = (ulong)auStack_138[uVar99 * 0x18];
        uVar97 = vmovmskps_avx(auVar123);
        uVar11 = 0;
        if (uVar97 != 0) {
          for (; (uVar97 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        fVar225 = afStack_140[uVar99 * 0x18];
        *(undefined4 *)(local_620 + (ulong)uVar11 * 4) = 0;
        if ((((((((_local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_620 >> 0x7f,0) != '\0') ||
              (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_620 >> 0xbf,0) != '\0') ||
            (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_620[0x1f] < '\0') {
          uVar99 = uVar93;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar98) = _local_620;
        auVar151 = vshufps_avx(ZEXT416((uint)(fVar224 - fVar225)),ZEXT416((uint)(fVar224 - fVar225))
                               ,0);
        local_480._4_4_ = fVar225 + auVar151._4_4_ * 0.14285715;
        local_480._0_4_ = fVar225 + auVar151._0_4_ * 0.0;
        fStack_478 = fVar225 + auVar151._8_4_ * 0.2857143;
        fStack_474 = fVar225 + auVar151._12_4_ * 0.42857146;
        fStack_470 = fVar225 + auVar151._0_4_ * 0.5714286;
        fStack_46c = fVar225 + auVar151._4_4_ * 0.71428573;
        fStack_468 = fVar225 + auVar151._8_4_ * 0.8571429;
        fStack_464 = fVar225 + auVar151._12_4_;
        auVar330 = ZEXT864(*(ulong *)(local_480 + (ulong)uVar11 * 4));
      }
      uVar93 = uVar99;
      auVar223 = ZEXT3264(auVar350);
    } while (((((((bVar79 && bVar80) && bVar78) && bVar77) && bVar76) && bVar75) && bVar100) &&
             bVar73);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }